

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLaplacian_sync.cpp
# Opt level: O2

void __thiscall
amrex::MLNodeLaplacian::reflux
          (MLNodeLaplacian *this,int crse_amrlev,MultiFab *res,MultiFab *crse_sol,MultiFab *crse_rhs
          ,MultiFab *a_fine_res,MultiFab *fine_sol,MultiFab *fine_rhs)

{
  BoxArray *ba;
  DistributionMapping *dm;
  long lVar1;
  long lVar2;
  int *piVar3;
  LinOpBCType LVar4;
  LinOpBCType LVar5;
  pointer pVVar6;
  Geometry *this_00;
  Geometry *this_01;
  pointer paVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  FabArray<amrex::IArrayBox> *this_02;
  pointer puVar10;
  undefined8 uVar11;
  int iVar12;
  bool bVar13;
  int i;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  Real *pRVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  MLNodeLaplacian *pMVar25;
  int iVar26;
  uint uVar27;
  ulong uVar28;
  int iVar29;
  int iVar30;
  long lVar31;
  long lVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  pointer puVar46;
  pointer puVar47;
  int iVar48;
  FabArray<amrex::IArrayBox> *pFVar49;
  int iVar50;
  int iVar51;
  long lVar52;
  long lVar53;
  long lVar54;
  long lVar55;
  int iVar56;
  uint uVar57;
  _func_int **pp_Var58;
  int ioff;
  int iVar59;
  int iVar60;
  int iVar61;
  long lVar62;
  ulong uVar63;
  int iVar64;
  long lVar65;
  double *pdVar66;
  long lVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  _func_int *p_Var75;
  double dVar76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  double dVar79;
  double dVar80;
  double dVar81;
  double dVar82;
  double dVar83;
  double dVar84;
  double dVar85;
  double dVar86;
  double dVar87;
  double dVar88;
  double dVar89;
  double dVar90;
  double dVar91;
  double dVar92;
  double dVar93;
  undefined1 auVar94 [16];
  double dVar95;
  double dVar96;
  double dVar97;
  double dVar98;
  double dVar99;
  double dVar100;
  double dVar101;
  double dVar102;
  double dVar103;
  double dVar104;
  double dVar105;
  double dVar106;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  double dVar115;
  double dVar116;
  double dVar117;
  double dVar118;
  double dVar119;
  undefined1 auVar120 [16];
  double dVar121;
  double dVar122;
  double dVar123;
  double dVar124;
  double dVar125;
  double dVar126;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  double dVar130;
  double dVar131;
  double dVar132;
  double dVar133;
  double dVar134;
  double dVar135;
  double dVar136;
  double dVar137;
  double dVar146;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  double dVar147;
  double dVar148;
  double dVar149;
  double dVar150;
  double dVar151;
  double dVar152;
  double dVar155;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  double dVar156;
  double dVar157;
  double dVar158;
  double dVar159;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  double dVar164;
  double dVar165;
  double dVar166;
  double dVar167;
  double dVar168;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  double dVar174;
  double dVar175;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  double dVar180;
  double dVar181;
  double dVar182;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  double dVar183;
  double dVar194;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  double dVar195;
  double dVar196;
  double dVar197;
  undefined1 auVar199 [16];
  double dVar198;
  double dVar203;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  double dVar204;
  double dVar205;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  double dVar212;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  double dVar217;
  double dVar218;
  Periodicity PVar219;
  double *local_c78;
  Real facy_4;
  Real facx;
  double *local_c60;
  Real facz;
  Real facy;
  ulong local_c48;
  long local_c40;
  int local_c28;
  ulong local_c18;
  ulong local_bf8;
  int local_bf0;
  Array4<const_double> local_be8;
  long local_ba8;
  _func_int **local_ba0;
  double *local_b98;
  double local_b90;
  double local_b88;
  long local_b80;
  double *local_b78;
  double *local_b70;
  pointer local_b68;
  FabArray<amrex::IArrayBox> *local_b60;
  double *local_b58;
  double *local_b50;
  Array4<const_double> local_b48;
  int local_b04;
  undefined8 *local_b00;
  double local_af8;
  double dStack_af0;
  double *local_ae8;
  double dStack_ae0;
  double local_ad8;
  double dStack_ad0;
  double local_ac8;
  double dStack_ac0;
  double *local_ab8;
  long local_ab0;
  double *local_aa8;
  long local_aa0;
  long local_a98;
  uint local_a8c;
  double *local_a88;
  undefined8 uStack_a80;
  double *local_a70;
  long local_a68;
  double *local_a60;
  double *local_a58;
  double *local_a50;
  double *local_a48;
  double *local_a40;
  double local_a38;
  undefined8 uStack_a30;
  double *local_a20;
  double *local_a18;
  long local_a10;
  pointer local_a08;
  undefined8 uStack_a00;
  MLNodeLaplacian *local_9f8;
  long local_9f0;
  double *local_9e8;
  anon_class_8_1_ba1d7831 local_9e0;
  Box local_9d8;
  pointer local_9b8;
  undefined8 uStack_9b0;
  Box result;
  int local_988;
  int local_984;
  int local_980;
  Array4<const_double> local_968;
  Box bx_2;
  _func_int **local_8e8;
  FabArray<amrex::FArrayBox> *local_8e0;
  undefined8 local_8d0;
  LinOpBCType local_8c8;
  undefined8 local_8c0;
  LinOpBCType local_8b8;
  MFIter mfi_2;
  anon_class_16_2_98e5bd77 local_848;
  Box bx;
  Array4<const_int> local_818;
  long local_7d8;
  double *local_7d0;
  double *local_7c8;
  double *local_7c0;
  double *local_7b8;
  int local_7ac;
  int local_7a8;
  int local_7a4;
  int local_7a0;
  int local_79c;
  Box bx_1;
  Array4<const_int> local_560;
  Array4<const_double> local_520;
  MultiFab fine_contrib_on_crse;
  Box local_360;
  MFItInfo local_344;
  MultiFab fine_contrib;
  MultiFab fine_res_for_coarse;
  
  local_7d8 = (long)crse_amrlev;
  local_b04 = (this->super_MLNodeLinOp).super_MLLinOp.m_amr_ref_ratio.
              super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
              _M_impl.super__Vector_impl_data._M_start[local_7d8];
  local_9f8 = this;
  if ((local_b04 != 2) && ((this->super_MLNodeLinOp).m_coarsening_strategy != Sigma)) {
    Assert_host("amrrr == 2 || m_coarsening_strategy == CoarseningStrategy::Sigma",
                "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/LinearSolvers/MLMG/AMReX_MLNodeLaplacian_sync.cpp"
                ,0x277,(char *)0x0);
  }
  lVar67 = local_7d8;
  pVVar6 = (local_9f8->super_MLNodeLinOp).super_MLLinOp.m_geom.
           super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
           .
           super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this_00 = *(Geometry **)
             &pVVar6[local_7d8].super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
              super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
  iVar22 = (int)local_7d8 + 1;
  this_01 = *(Geometry **)
             &pVVar6[iVar22].super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
              super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
  dVar105 = (this_00->super_CoordSys).inv_dx[0];
  dVar106 = (this_00->super_CoordSys).inv_dx[1];
  dVar76 = (this_00->super_CoordSys).inv_dx[2];
  dVar91 = (this_01->super_CoordSys).inv_dx[0];
  dVar92 = (this_01->super_CoordSys).inv_dx[1];
  dVar93 = (this_01->super_CoordSys).inv_dx[2];
  Geometry::growPeriodicDomain(this_00,1);
  iVar24 = local_b04;
  bx.smallend.vect._0_8_ = *(undefined8 *)(this_00->domain).smallend.vect;
  uVar8 = *(undefined8 *)((this_00->domain).smallend.vect + 2);
  bx.bigend.vect[1] = (int)((ulong)*(undefined8 *)(this_00->domain).bigend.vect >> 0x20);
  bx._20_8_ = *(undefined8 *)((this_00->domain).bigend.vect + 2);
  bx.smallend.vect[2] = (int)uVar8;
  bx.bigend.vect[0] = (int)((ulong)uVar8 >> 0x20);
  for (lVar18 = 0; lVar18 != 3; lVar18 = lVar18 + 1) {
    if ((bx.btype.itype >> ((uint)lVar18 & 0x1f) & 1) == 0) {
      piVar3 = bx.bigend.vect + lVar18;
      *piVar3 = *piVar3 + 1;
    }
  }
  bx.btype.itype = 7;
  bx_1.smallend.vect._0_8_ = *(undefined8 *)(this_01->domain).smallend.vect;
  uVar8 = *(undefined8 *)((this_01->domain).smallend.vect + 2);
  bx_1.bigend.vect[1] = (int)((ulong)*(undefined8 *)(this_01->domain).bigend.vect >> 0x20);
  bx_1._20_8_ = *(undefined8 *)((this_01->domain).bigend.vect + 2);
  bx_1.smallend.vect[2] = (int)uVar8;
  bx_1.bigend.vect[0] = (int)((ulong)uVar8 >> 0x20);
  for (lVar18 = 0; lVar18 != 3; lVar18 = lVar18 + 1) {
    if ((bx_1.btype.itype >> ((uint)lVar18 & 0x1f) & 1) == 0) {
      piVar3 = bx_1.bigend.vect + lVar18;
      *piVar3 = *piVar3 + 1;
    }
  }
  bx_1.btype.itype = 7;
  paVar7 = (local_9f8->super_MLNodeLinOp).super_MLLinOp.m_lobc.
           super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
           .
           super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar8 = *(undefined8 *)paVar7->_M_elems;
  LVar4 = paVar7->_M_elems[2];
  local_8c0 = uVar8;
  local_8b8 = LVar4;
  paVar7 = (local_9f8->super_MLNodeLinOp).super_MLLinOp.m_hibc.
           super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
           .
           super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar9 = *(undefined8 *)paVar7->_M_elems;
  LVar5 = paVar7->_M_elems[2];
  local_8d0 = uVar9;
  local_8c8 = LVar5;
  if ((local_9f8->super_MLNodeLinOp).m_coarsening_strategy == Sigma) {
    local_a8c = 0;
    pMVar25 = local_9f8;
    for (lVar18 = 0; lVar18 != 3; lVar18 = lVar18 + 1) {
      pMVar25 = (MLNodeLaplacian *)CONCAT71((int7)((ulong)pMVar25 >> 8),1);
      if ((((char)local_a8c == '\0') &&
          (iVar17 = *(int *)((long)&local_8c0 + lVar18 * 4), iVar17 != 0x66)) && (iVar17 != 0x6a)) {
        uVar57 = *(int *)((long)&local_8d0 + lVar18 * 4) - 0x66;
        pMVar25 = (MLNodeLaplacian *)(ulong)CONCAT31((int3)(uVar57 >> 8),(uVar57 & 0xfffffffb) == 0)
        ;
      }
      local_a8c = (uint)pMVar25;
    }
  }
  else {
    local_a8c = 0;
  }
  ba = &(fine_sol->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray;
  dm = &(fine_sol->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap;
  this_02 = (FabArray<amrex::IArrayBox> *)
            **(undefined8 **)
              &(local_9f8->super_MLNodeLinOp).m_dirichlet_mask.
               super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
               .
               super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar22].
               super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
               .
               super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
  ;
  puVar10 = (local_9f8->m_nosigma_stencil).
            super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
            .
            super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  amrex::coarsen((BoxArray *)&fine_contrib,ba,local_b04);
  fine_contrib_on_crse.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase =
       (_func_int **)0x1;
  fine_contrib_on_crse.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat._0_8_ = 0;
  fine_contrib_on_crse.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op._4_8_
       = 0;
  fine_contrib_on_crse.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
  _12_8_ = 0;
  fine_contrib_on_crse.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
  _20_8_ = 0;
  mfi_2.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_4_ = 0x7d2928;
  mfi_2.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_ = 0;
  MultiFab::MultiFab(&fine_res_for_coarse,(BoxArray *)&fine_contrib,dm,1,0,
                     (MFInfo *)&fine_contrib_on_crse,(FabFactory<amrex::FArrayBox> *)&mfi_2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&fine_contrib_on_crse.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.
                m_bat.m_op.m_bndryReg.m_typ);
  BoxArray::~BoxArray((BoxArray *)&fine_contrib);
  if ((iVar24 == 4) &&
     (((uVar11 = *(undefined8 *)
                  (a_fine_res->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect,
       (int)uVar11 < 3 || ((int)((ulong)uVar11 >> 0x20) < 3)) ||
      ((a_fine_res->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[2] < 3)))) {
    fine_contrib_on_crse.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase =
         (_func_int **)
         CONCAT44(fine_contrib_on_crse.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                  _vptr_FabArrayBase._4_4_,1);
    mfi_2.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_4_ = 3;
    std::
    make_unique<amrex::MultiFab,amrex::BoxArray_const&,amrex::DistributionMapping_const&,int,int>
              ((BoxArray *)&fine_contrib,
               (DistributionMapping *)
               &(a_fine_res->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray,
               (int *)&(a_fine_res->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                       distributionMap,(int *)&fine_contrib_on_crse);
    local_8e8 = fine_contrib.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase;
    MultiFab::Copy((MultiFab *)
                   fine_contrib.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                   _vptr_FabArrayBase,a_fine_res,0,0,1,0);
    local_8e0 = (FabArray<amrex::FArrayBox> *)
                fine_contrib.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase;
  }
  else {
    local_8e8 = (_func_int **)0x0;
    local_8e0 = &a_fine_res->super_FabArray<amrex::FArrayBox>;
  }
  fine_contrib.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._0_12_ =
       Geometry::periodicity(this_01);
  FabArray<amrex::FArrayBox>::FillBoundary<double>(local_8e0,(Periodicity *)&fine_contrib,false);
  MFIter::MFIter((MFIter *)&fine_contrib,(FabArrayBase *)&fine_res_for_coarse,true);
  iVar51 = bx_1.bigend.vect[1];
  iVar15 = bx_1.bigend.vect[0];
  iVar61 = bx_1.smallend.vect[2];
  iVar24 = bx_1.smallend.vect[0];
  iVar17 = bx_1.smallend.vect[1];
  iVar16 = bx_1.bigend.vect[2];
  while (fine_contrib.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
         m_bndryReg.m_loshft.vect[0] <
         fine_contrib.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
         m_bndryReg.m_loshft.vect[2]) {
    MFIter::tilebox((Box *)&local_be8,(MFIter *)&fine_contrib);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              ((Array4<double> *)&fine_contrib_on_crse,
               &fine_res_for_coarse.super_FabArray<amrex::FArrayBox>,(MFIter *)&fine_contrib);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              ((Array4<const_double> *)&mfi_2,local_8e0,(MFIter *)&fine_contrib);
    FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
              ((Array4<const_int> *)&local_968,this_02,(MFIter *)&fine_contrib);
    if ((local_9f8->super_MLNodeLinOp).m_coarsening_strategy == Sigma) {
      local_b50 = (double *)(ulong)local_be8.jstride._4_4_;
      iVar23 = local_be8.jstride._4_4_ + 1;
      local_ad8 = (double)CONCAT44(local_ad8._4_4_,iVar23);
      local_b90 = (double)(long)(int)local_be8.p;
      local_b00 = (undefined8 *)(long)local_be8.p._4_4_;
      local_b78 = (double *)(long)(int)local_be8.kstride;
      local_b68 = (pointer)CONCAT44(local_b68._4_4_,local_be8.kstride._4_4_);
      facy_4._0_4_ = (int)uVar8;
      local_bf0 = (int)uVar9;
      local_c60._0_4_ = (int)((ulong)uVar8 >> 0x20);
      local_c28 = (int)((ulong)uVar9 >> 0x20);
      if (local_b04 == 2) {
        local_a08 = (pointer)CONCAT44(local_a08._4_4_,(int)local_be8.p * 2);
        iVar26 = (int)local_be8.p * 2 + 1;
        local_9b8 = (pointer)CONCAT44(local_9b8._4_4_,iVar26);
        for (iVar14 = (int)local_be8.jstride; iVar14 <= local_be8.kstride._4_4_; iVar14 = iVar14 + 1
            ) {
          local_b60 = (FabArray<amrex::IArrayBox> *)CONCAT44(local_b60._4_4_,iVar14);
          local_b70 = (double *)(long)iVar14;
          local_ac8 = (double)((long)local_b70 * 2);
          local_b80 = (long)local_968.begin.x;
          local_a88 = (double *)(long)local_968.begin.y;
          local_a38 = (double)local_968.jstride;
          local_b58 = (double *)
                      (((long)local_ac8 - (long)local_968.begin.z) * local_968.kstride * 4 +
                      (long)local_968.p);
          lVar18 = (long)local_b00;
          while (lVar20 = lVar18, lVar20 <= (long)local_b78) {
            if ((int)local_be8.p <= (int)local_be8.jstride._4_4_) {
              local_ae8 = (double *)
                          ((long)local_b58 + (lVar20 * 2 - (long)local_a88) * local_968.jstride * 4)
              ;
              local_b98 = (double *)
                          (long)fine_contrib_on_crse.super_FabArray<amrex::FArrayBox>.
                                super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_loshft.vect[0];
              local_ba0 = fine_contrib_on_crse.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                          _vptr_FabArrayBase +
                          (lVar20 - fine_contrib_on_crse.super_FabArray<amrex::FArrayBox>.
                                    super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_loshft.vect
                                    [1]) *
                          fine_contrib_on_crse.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                          boxarray.m_bat._0_8_ +
                          ((long)local_b70 -
                          (long)fine_contrib_on_crse.super_FabArray<amrex::FArrayBox>.
                                super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_loshft.vect[2])
                          * fine_contrib_on_crse.super_FabArray<amrex::FArrayBox>.super_FabArrayBase
                            .boxarray.m_bat.m_op._4_8_;
              dVar79 = local_b90;
              iVar48 = (int)local_be8.p * 2;
              iVar36 = iVar26;
              do {
                p_Var75 = (_func_int *)0x0;
                dVar80 = 0.0;
                if (*(int *)((long)local_ae8 + ((long)dVar79 * 2 - local_b80) * 4) == 0) {
                  for (iVar35 = -1; iVar35 != 2; iVar35 = iVar35 + 1) {
                    iVar33 = -iVar35;
                    if (iVar35 < 1) {
                      iVar33 = iVar35;
                    }
                    iVar34 = iVar35 + SUB84(local_ac8,0);
                    iVar40 = SUB84(local_ac8,0) - iVar35;
                    local_af8 = (double)CONCAT44(local_af8._4_4_,iVar40);
                    for (iVar30 = -1; iVar30 != 2; iVar30 = iVar30 + 1) {
                      iVar41 = -iVar30;
                      if (iVar30 < 1) {
                        iVar41 = iVar30;
                      }
                      iVar12 = (int)(lVar20 * 2);
                      iVar50 = iVar30 + iVar12;
                      iVar64 = iVar36;
                      for (iVar59 = -1; iVar59 != 2; iVar59 = iVar59 + 1) {
                        iVar29 = -iVar59;
                        if (iVar59 < 1) {
                          iVar29 = iVar59;
                        }
                        if (((iVar48 + iVar59 < iVar24) &&
                            ((facy_4._0_4_ == 0x66 || (facy_4._0_4_ == 0x6a)))) ||
                           ((iVar60 = (int)((long)dVar79 * 2) + iVar59, iVar15 < iVar48 + iVar59 &&
                            ((local_bf0 == 0x6a || (local_bf0 == 0x66)))))) {
                          iVar60 = iVar64;
                        }
                        if (((iVar50 < iVar17) &&
                            (((int)local_c60 == 0x66 || ((int)local_c60 == 0x6a)))) ||
                           ((iVar56 = iVar50, iVar51 < iVar50 &&
                            ((local_c28 == 0x6a || (local_c28 == 0x66)))))) {
                          iVar56 = iVar12 - iVar30;
                        }
                        if (((iVar34 < iVar61) && ((LVar4 == Neumann || (LVar4 == inflow)))) ||
                           ((iVar42 = iVar34, iVar16 < iVar34 &&
                            ((LVar5 == inflow || (LVar5 == Neumann)))))) {
                          iVar42 = iVar40;
                        }
                        dVar80 = dVar80 + (double)(iVar29 + 2) * (double)(iVar41 + 2) *
                                          (double)(iVar33 + 2) *
                                          *(double *)
                                           (CONCAT44(mfi_2.m_fa._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                                  .
                                                  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>
                                                  ._M_head_impl._4_4_,
                                                  (int)mfi_2.m_fa._M_t.
                                                                                                              
                                                  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                                  .
                                                  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>
                                                  ._M_head_impl) +
                                            ((long)iVar56 - (long)mfi_2.beginIndex) *
                                            CONCAT44(mfi_2.fabArray._4_4_,(int)mfi_2.fabArray) * 8 +
                                            ((long)iVar60 - (long)mfi_2.currentIndex) * 8 +
                                           ((long)iVar42 - (long)mfi_2.endIndex) *
                                           CONCAT44(mfi_2.tile_size.vect[1],mfi_2.tile_size.vect[0])
                                           * 8);
                        iVar64 = iVar64 + -1;
                      }
                    }
                  }
                  p_Var75 = (_func_int *)(dVar80 * 0.015625);
                  local_b88 = dVar79;
                }
                local_ba0[(long)dVar79 - (long)local_b98] = p_Var75;
                dVar79 = (double)((long)dVar79 + 1);
                iVar36 = iVar36 + 2;
                iVar48 = iVar48 + 2;
              } while (iVar23 != SUB84(dVar79,0));
            }
            local_ba8 = lVar20;
            lVar18 = lVar20 + 1;
          }
        }
      }
      else {
        local_a08 = (pointer)CONCAT44(local_a08._4_4_,(int)local_be8.p * 4);
        iVar26 = (int)local_be8.p * 4 + 3;
        local_9b8 = (pointer)CONCAT44(local_9b8._4_4_,iVar26);
        for (iVar14 = (int)local_be8.jstride; iVar14 <= local_be8.kstride._4_4_; iVar14 = iVar14 + 1
            ) {
          local_b60 = (FabArray<amrex::IArrayBox> *)CONCAT44(local_b60._4_4_,iVar14);
          local_b70 = (double *)(long)iVar14;
          local_ac8 = (double)((long)local_b70 * 4);
          local_b80 = (long)local_968.begin.x;
          local_a88 = (double *)(long)local_968.begin.y;
          local_a38 = (double)local_968.jstride;
          local_b58 = (double *)
                      (((long)local_ac8 - (long)local_968.begin.z) * local_968.kstride * 4 +
                      (long)local_968.p);
          lVar18 = (long)local_b00;
          while (lVar20 = lVar18, lVar20 <= (long)local_b78) {
            if ((int)local_be8.p <= (int)local_be8.jstride._4_4_) {
              local_ae8 = (double *)
                          ((long)local_b58 + (lVar20 * 4 - (long)local_a88) * local_968.jstride * 4)
              ;
              local_b98 = (double *)
                          (long)fine_contrib_on_crse.super_FabArray<amrex::FArrayBox>.
                                super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_loshft.vect[0];
              local_ba0 = fine_contrib_on_crse.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                          _vptr_FabArrayBase +
                          (lVar20 - fine_contrib_on_crse.super_FabArray<amrex::FArrayBox>.
                                    super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_loshft.vect
                                    [1]) *
                          fine_contrib_on_crse.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                          boxarray.m_bat._0_8_ +
                          ((long)local_b70 -
                          (long)fine_contrib_on_crse.super_FabArray<amrex::FArrayBox>.
                                super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_loshft.vect[2])
                          * fine_contrib_on_crse.super_FabArray<amrex::FArrayBox>.super_FabArrayBase
                            .boxarray.m_bat.m_op._4_8_;
              dVar79 = local_b90;
              iVar48 = (int)local_be8.p * 4;
              iVar36 = iVar26;
              do {
                p_Var75 = (_func_int *)0x0;
                if (*(int *)((long)local_ae8 + ((long)dVar79 * 4 - local_b80) * 4) == 0) {
                  for (iVar35 = -3; iVar35 != 4; iVar35 = iVar35 + 1) {
                    iVar33 = -iVar35;
                    if (iVar35 < 1) {
                      iVar33 = iVar35;
                    }
                    iVar34 = iVar35 + SUB84(local_ac8,0);
                    iVar40 = SUB84(local_ac8,0) - iVar35;
                    local_af8 = (double)CONCAT44(local_af8._4_4_,iVar40);
                    for (iVar30 = -3; iVar30 != 4; iVar30 = iVar30 + 1) {
                      iVar41 = -iVar30;
                      if (iVar30 < 1) {
                        iVar41 = iVar30;
                      }
                      iVar12 = (int)(lVar20 * 4);
                      iVar50 = iVar30 + iVar12;
                      iVar64 = iVar36;
                      for (iVar59 = -3; iVar59 != 4; iVar59 = iVar59 + 1) {
                        iVar29 = -iVar59;
                        if (iVar59 < 1) {
                          iVar29 = iVar59;
                        }
                        if (((iVar48 + iVar59 < iVar24) &&
                            ((facy_4._0_4_ == 0x66 || (facy_4._0_4_ == 0x6a)))) ||
                           ((iVar60 = (int)((long)dVar79 * 4) + iVar59, iVar15 < iVar48 + iVar59 &&
                            ((local_bf0 == 0x6a || (local_bf0 == 0x66)))))) {
                          iVar60 = iVar64;
                        }
                        if (((iVar50 < iVar17) &&
                            (((int)local_c60 == 0x66 || ((int)local_c60 == 0x6a)))) ||
                           ((iVar56 = iVar50, iVar51 < iVar50 &&
                            ((local_c28 == 0x6a || (local_c28 == 0x66)))))) {
                          iVar56 = iVar12 - iVar30;
                        }
                        if (((iVar34 < iVar61) && ((LVar4 == Neumann || (LVar4 == inflow)))) ||
                           ((iVar42 = iVar34, iVar16 < iVar34 &&
                            ((LVar5 == inflow || (LVar5 == Neumann)))))) {
                          iVar42 = iVar40;
                        }
                        p_Var75 = (_func_int *)
                                  ((double)p_Var75 +
                                  (double)(iVar29 + 4) * (double)(iVar41 + 4) * (double)(iVar33 + 4)
                                  * *(double *)
                                     (CONCAT44(mfi_2.m_fa._M_t.
                                               super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                               .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>.
                                               _M_head_impl._4_4_,
                                               (int)mfi_2.m_fa._M_t.
                                                                                                        
                                                  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                                  .
                                                  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>
                                                  ._M_head_impl) +
                                      ((long)iVar56 - (long)mfi_2.beginIndex) *
                                      CONCAT44(mfi_2.fabArray._4_4_,(int)mfi_2.fabArray) * 8 +
                                      ((long)iVar60 - (long)mfi_2.currentIndex) * 8 +
                                     ((long)iVar42 - (long)mfi_2.endIndex) *
                                     CONCAT44(mfi_2.tile_size.vect[1],mfi_2.tile_size.vect[0]) * 8))
                        ;
                        iVar64 = iVar64 + -1;
                      }
                    }
                  }
                  p_Var75 = (_func_int *)((double)p_Var75 * 0.000244140625);
                  local_b88 = dVar79;
                }
                local_ba0[(long)dVar79 - (long)local_b98] = p_Var75;
                dVar79 = (double)((long)dVar79 + 1);
                iVar36 = iVar36 + 4;
                iVar48 = iVar48 + 4;
              } while (iVar23 != SUB84(dVar79,0));
            }
            local_ba8 = lVar20;
            lVar18 = lVar20 + 1;
          }
        }
      }
    }
    else {
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_b48,
                 (FabArray<amrex::FArrayBox> *)
                 puVar10[iVar22]._M_t.
                 super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,
                 (MFIter *)&fine_contrib);
      local_7ac = local_be8.kstride._4_4_;
      local_b00 = (undefined8 *)CONCAT44(local_b00._4_4_,local_be8.jstride._4_4_ + 1);
      iVar23 = (int)local_be8.jstride;
      while (iVar14 = iVar23, iVar14 <= local_be8.kstride._4_4_) {
        lVar18 = (long)iVar14 * 2;
        iVar23 = (int)lVar18;
        local_79c = iVar23 + -2;
        local_7a0 = iVar23 + -1;
        local_7a4 = iVar23 + 1;
        for (lVar20 = (long)local_be8.p._4_4_; lVar20 <= (int)local_be8.kstride; lVar20 = lVar20 + 1
            ) {
          if ((int)local_be8.p <= (int)local_be8.jstride._4_4_) {
            lVar54 = lVar20 * 2;
            lVar37 = (long)mfi_2.beginIndex;
            lVar32 = CONCAT44(mfi_2.m_fa._M_t.
                              super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                              .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl.
                              _4_4_,(int)mfi_2.m_fa._M_t.
                                         super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                         .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>.
                                         _M_head_impl);
            lVar19 = CONCAT44(mfi_2.fabArray._4_4_,(int)mfi_2.fabArray);
            local_af8 = (double)CONCAT44(local_af8._4_4_,mfi_2.endIndex);
            local_a98 = lVar32 + (lVar54 - lVar37) * lVar19 * 8;
            lVar55 = (long)local_b48.begin.y;
            lVar39 = lVar20 * 2 + -1;
            lVar53 = lVar20 * 2 + 1;
            local_b98 = local_b48.p + (lVar54 - lVar55) * local_b48.jstride;
            local_a40 = local_b48.p + (((int)lVar54 - local_b48.begin.y) + -2) * local_b48.jstride;
            local_a48 = local_b48.p + (lVar39 - lVar55) * local_b48.jstride;
            local_a50 = local_b48.p + (lVar53 - lVar55) * local_b48.jstride;
            local_a58 = (double *)(lVar32 + (lVar39 - lVar37) * lVar19 * 8);
            lVar32 = lVar32 + (lVar53 - lVar37) * lVar19 * 8;
            lVar62 = (iVar23 - local_b48.begin.z) * local_b48.kstride;
            lVar37 = (local_79c - local_b48.begin.z) * local_b48.kstride;
            local_ba0 = (_func_int **)((local_7a0 - local_b48.begin.z) * local_b48.kstride);
            lVar55 = (local_7a4 - local_b48.begin.z) * local_b48.kstride;
            lVar39 = CONCAT44(mfi_2.tile_size.vect[1],mfi_2.tile_size.vect[0]);
            local_a60 = (double *)((iVar23 - mfi_2.endIndex) * lVar39);
            local_b80 = (local_7a0 - mfi_2.endIndex) * lVar39;
            local_b88 = (double)((local_7a4 - mfi_2.endIndex) * lVar39);
            lVar19 = (long)mfi_2.currentIndex;
            local_b90 = (double)(long)local_b48.begin.x;
            local_ab0 = local_a98 + (long)local_a60 * 8;
            local_a68 = local_b48.nstride * 2;
            lVar39 = lVar32 + (long)local_a60 * 8;
            local_ba8 = local_b48.nstride * 4;
            lVar53 = (long)(int)local_be8.p;
            do {
              uVar28 = lVar53 * 2;
              p_Var75 = (_func_int *)0x0;
              if (*(int *)((long)local_968.p +
                          (uVar28 - (long)local_968.begin.x) * 4 +
                          (lVar54 - local_968.begin.y) * local_968.jstride * 4 +
                          (lVar18 - local_968.begin.z) * local_968.kstride * 4) == 0) {
                lVar43 = uVar28 - lVar19;
                lVar1 = local_a98 + lVar43 * 8;
                lVar38 = (long)(((int)uVar28 - local_b48.begin.x) + -2);
                local_b58 = local_b98 + lVar38 + lVar62;
                lVar65 = uVar28 - 1;
                lVar52 = lVar65 - (long)local_b90;
                dVar79 = local_b98[lVar52 + lVar62 + local_b48.nstride];
                if (((local_b58[local_b48.nstride] != 0.0) || (dVar79 != 0.0)) || (NAN(dVar79))) {
                  dVar79 = (*(double *)(local_ab0 + (lVar65 - lVar19) * 8) * ABS(dVar79)) /
                           (ABS(local_b58[local_b48.nstride]) + ABS(dVar79));
                }
                else {
                  dVar79 = *(double *)(local_ab0 + (lVar65 - lVar19) * 8) * 0.5;
                }
                lVar44 = uVar28 - (long)local_b90;
                uVar28 = uVar28 | 1;
                dVar80 = local_b98[lVar44 + lVar62 + local_b48.nstride];
                dVar81 = (local_b98 + lVar44 + lVar62 + local_b48.nstride)[1];
                if (((dVar80 != 0.0) || (NAN(dVar80))) || ((dVar81 != 0.0 || (NAN(dVar81))))) {
                  dVar80 = (*(double *)(local_ab0 + (uVar28 - lVar19) * 8) * ABS(dVar80)) /
                           (ABS(dVar81) + ABS(dVar80));
                }
                else {
                  dVar80 = *(double *)(local_ab0 + (uVar28 - lVar19) * 8) * 0.5;
                }
                dVar81 = local_a40[lVar44 + lVar62 + local_b48.nstride * 2];
                dVar82 = local_a48[lVar44 + lVar62 + local_b48.nstride * 2];
                if (((dVar81 != 0.0) || (NAN(dVar81))) || ((dVar82 != 0.0 || (NAN(dVar82))))) {
                  dVar81 = (local_a58[(long)local_a60 + lVar43] * ABS(dVar82)) /
                           (ABS(dVar81) + ABS(dVar82));
                }
                else {
                  dVar81 = local_a58[(long)local_a60 + lVar43] * 0.5;
                }
                dVar82 = local_b98[lVar44 + lVar62 + local_b48.nstride * 2];
                dVar83 = local_a50[lVar44 + lVar62 + local_b48.nstride * 2];
                if ((((dVar82 != 0.0) || (NAN(dVar82))) || (dVar83 != 0.0)) || (NAN(dVar83))) {
                  dVar82 = (*(double *)(lVar39 + lVar43 * 8) * ABS(dVar82)) /
                           (ABS(dVar82) + ABS(dVar83));
                }
                else {
                  dVar82 = *(double *)(lVar39 + lVar43 * 8) * 0.5;
                }
                dVar83 = local_b98[lVar44 + lVar37 + local_b48.nstride * 3];
                dVar84 = local_b98[(long)local_ba0 + lVar44 + local_b48.nstride * 3];
                if (((dVar83 != 0.0) || (NAN(dVar83))) || ((dVar84 != 0.0 || (NAN(dVar84))))) {
                  dVar83 = (*(double *)(lVar1 + local_b80 * 8) * ABS(dVar84)) /
                           (ABS(dVar83) + ABS(dVar84));
                }
                else {
                  dVar83 = *(double *)(lVar1 + local_b80 * 8) * 0.5;
                }
                lVar45 = uVar28 - (long)local_b90;
                dVar84 = local_b98[lVar44 + lVar62 + local_b48.nstride * 3];
                dVar68 = local_b98[lVar44 + lVar55 + local_b48.nstride * 3];
                if (((dVar84 != 0.0) || (NAN(dVar84))) || ((dVar68 != 0.0 || (NAN(dVar68))))) {
                  dVar84 = (*(double *)(lVar1 + (long)local_b88 * 8) * ABS(dVar84)) /
                           (ABS(dVar84) + ABS(dVar68));
                }
                else {
                  dVar84 = *(double *)(lVar1 + (long)local_b88 * 8) * 0.5;
                }
                local_b78 = local_a48 + lVar38;
                local_7b8 = local_b78 + lVar62;
                local_a18 = local_a40 + lVar38;
                dVar121 = ABS(local_a18[lVar62 + local_b48.nstride * 4]);
                dVar85 = ABS(local_7b8[local_b48.nstride * 4]);
                local_b70 = local_a48 + lVar52;
                local_b50 = local_a40 + lVar52;
                dVar147 = ABS(local_b50[lVar62 + local_b48.nstride * 4]);
                dVar130 = ABS(local_b70[lVar62 + local_b48.nstride * 4]);
                dVar156 = ABS(local_b50[lVar62 + local_b48.nstride * 2]) /
                          (dVar121 + dVar147 + 1e-100);
                dVar164 = ABS(local_b70[lVar62 + local_b48.nstride * 2]) /
                          (dVar85 + dVar130 + 1e-100);
                dVar95 = ABS(local_7b8[local_b48.nstride]) / (dVar121 + dVar85 + 1e-100) + 1.0;
                dVar115 = ABS(local_b70[lVar62 + local_b48.nstride]) / (dVar147 + dVar130 + 1e-100)
                          + 1.0;
                dVar130 = (dVar115 + dVar164) * dVar130;
                lVar65 = lVar65 - lVar19;
                local_9e8 = local_a58 + lVar65;
                dVar122 = ABS(local_a40[lVar44 + lVar62 + local_b48.nstride * 4]);
                dVar68 = ABS(local_a48[lVar44 + lVar62 + local_b48.nstride * 4]);
                local_a20 = local_a40 + lVar45;
                dVar157 = ABS(local_a20[lVar62 + local_b48.nstride * 4]);
                dVar131 = ABS(local_a48[lVar45 + lVar62 + local_b48.nstride * 4]);
                dVar148 = ABS(local_a20[lVar62 + local_b48.nstride * 2]) /
                          (dVar122 + dVar157 + 1e-100);
                dVar165 = ABS(local_a48[lVar45 + lVar62 + local_b48.nstride * 2]) /
                          (dVar68 + dVar131 + 1e-100);
                dVar96 = ABS(local_a48[lVar44 + lVar62 + local_b48.nstride]) /
                         (dVar122 + dVar68 + 1e-100) + 1.0;
                dVar116 = ABS(local_a48[lVar45 + lVar62 + local_b48.nstride]) /
                          (dVar157 + dVar131 + 1e-100) + 1.0;
                dVar68 = (dVar96 + dVar165) * dVar68;
                lVar31 = uVar28 - lVar19;
                local_ab8 = local_a58 + lVar31;
                local_a70 = local_a50 + lVar38;
                dVar132 = ABS(local_b58[local_b48.nstride * 4]);
                dVar123 = ABS(local_a70[lVar62 + local_b48.nstride * 4]);
                local_b60 = (FabArray<amrex::IArrayBox> *)(local_a50 + lVar52);
                dVar158 = ABS(local_b98[lVar52 + lVar62 + local_b48.nstride * 4]);
                dVar149 = ABS(*(double *)((long)local_b60 + (lVar62 + local_b48.nstride * 4) * 8));
                dVar86 = ABS(local_b98[lVar52 + lVar62 + local_b48.nstride * 2]) /
                         (dVar132 + dVar158 + 1e-100);
                dVar166 = ABS(*(double *)((long)local_b60 + (lVar62 + local_b48.nstride * 2) * 8)) /
                          (dVar123 + dVar149 + 1e-100);
                dVar97 = ABS(local_a70[lVar62 + local_b48.nstride]) / (dVar132 + dVar123 + 1e-100) +
                         1.0;
                dVar117 = ABS(*(double *)((long)local_b60 + (lVar62 + local_b48.nstride) * 8)) /
                          (dVar158 + dVar149 + 1e-100) + 1.0;
                dVar158 = (dVar86 + dVar117) * dVar158;
                local_aa0 = lVar32 + lVar65 * 8;
                dVar69 = ABS(local_a50[lVar44 + lVar62 + local_b48.nstride * 4]);
                dVar133 = ABS(local_b98[lVar44 + lVar62 + local_b48.nstride * 4]);
                local_aa8 = local_a50 + lVar45;
                dVar150 = ABS(local_aa8[lVar62 + local_b48.nstride * 4]);
                dVar159 = ABS(local_b98[lVar45 + lVar62 + local_b48.nstride * 4]);
                dVar124 = ABS(local_b98[lVar45 + lVar62 + local_b48.nstride * 2]) /
                          (dVar133 + dVar159 + 1e-100);
                dVar167 = ABS(local_aa8[lVar62 + local_b48.nstride * 2]) /
                          (dVar69 + dVar150 + 1e-100);
                dVar98 = ABS(local_a50[lVar44 + lVar62 + local_b48.nstride]) /
                         (dVar69 + dVar133 + 1e-100) + 1.0;
                dVar133 = (dVar98 + dVar124) * dVar133;
                dVar118 = ABS(local_aa8[lVar62 + local_b48.nstride]) / (dVar150 + dVar159 + 1e-100)
                          + 1.0;
                local_9f0 = lVar32 + lVar31 * 8;
                dVar87 = ABS(local_b98[lVar38 + lVar37 + local_b48.nstride * 5]);
                dVar99 = ABS(local_b98[(long)local_ba0 + lVar38 + local_b48.nstride * 5]);
                dVar204 = ABS(local_b98[lVar52 + lVar37 + local_b48.nstride * 5]);
                dVar195 = ABS(local_b98[(long)local_ba0 + lVar52 + local_b48.nstride * 5]);
                dVar212 = ABS(local_b98[lVar52 + lVar37 + local_b48.nstride * 3]) /
                          (dVar87 + dVar204 + 1e-100);
                dVar217 = ABS(local_b98[(long)local_ba0 + lVar52 + local_b48.nstride * 3]) /
                          (dVar99 + dVar195 + 1e-100);
                dVar119 = ABS(local_b98[(long)local_ba0 + lVar38 + local_b48.nstride]) /
                          (dVar87 + dVar99 + 1e-100) + 1.0;
                dVar70 = ABS(local_b98[lVar38 + lVar55 + local_b48.nstride * 5]);
                dVar180 = ABS(local_b58[local_b48.nstride * 5]);
                local_b68 = (pointer)(local_b98 + lVar52 + lVar55);
                dVar88 = ABS(((double *)local_b68)[local_b48.nstride * 5]);
                dVar71 = ABS(local_b98[lVar52 + lVar62 + local_b48.nstride * 5]);
                dVar89 = ABS(local_b98[lVar52 + lVar62 + local_b48.nstride * 3]) /
                         (dVar180 + dVar71 + 1e-100);
                dVar125 = ABS(local_b98[lVar38 + lVar55 + local_b48.nstride]) /
                          (dVar70 + dVar180 + 1e-100) + 1.0;
                lVar65 = local_a98 + lVar65 * 8;
                dVar100 = ABS(((double *)local_b68)[local_b48.nstride]) / (dVar88 + dVar71 + 1e-100)
                          + 1.0;
                dVar71 = (dVar89 + dVar100) * dVar71;
                dVar174 = ABS(local_b98[(long)local_ba0 + lVar52 + local_b48.nstride]) /
                          (dVar204 + dVar195 + 1e-100) + 1.0;
                dVar195 = (dVar174 + dVar217) * dVar195;
                dVar134 = ABS(local_b98[lVar44 + lVar37 + local_b48.nstride * 5]);
                dVar72 = ABS(local_b98[(long)local_ba0 + lVar44 + local_b48.nstride * 5]);
                local_7c0 = local_b98 + lVar45 + (long)local_ba0;
                dVar175 = ABS(local_b98[lVar45 + lVar37 + local_b48.nstride * 5]);
                dVar101 = ABS(local_7c0[local_b48.nstride * 5]);
                dVar218 = ABS(local_b98[lVar45 + lVar37 + local_b48.nstride * 3]) /
                          (dVar134 + dVar175 + 1e-100);
                dVar102 = ABS(local_7c0[local_b48.nstride * 3]) / (dVar72 + dVar101 + 1e-100);
                dVar196 = ABS(local_b98[(long)local_ba0 + lVar44 + local_b48.nstride]) /
                          (dVar134 + dVar72 + 1e-100) + 1.0;
                dVar205 = ABS(local_7c0[local_b48.nstride]) / (dVar175 + dVar101 + 1e-100) + 1.0;
                lVar31 = local_a98 + lVar31 * 8;
                dVar72 = (dVar196 + dVar102) * dVar72;
                lVar2 = lVar32 + lVar43 * 8;
                dVar135 = ABS(((double *)local_b68)[local_b48.nstride * 3]) /
                          (dVar70 + dVar88 + 1e-100);
                dVar126 = ABS(local_b98[lVar44 + lVar55 + local_b48.nstride * 5]);
                dVar73 = ABS(local_b98[lVar44 + lVar62 + local_b48.nstride * 5]);
                dVar151 = ABS(local_b98[lVar45 + lVar55 + local_b48.nstride * 5]);
                dVar168 = ABS(local_b98[lVar45 + lVar62 + local_b48.nstride * 5]);
                dVar181 = ABS(local_b98[lVar45 + lVar62 + local_b48.nstride * 3]) /
                          (dVar73 + dVar168 + 1e-100);
                dVar197 = ABS(local_b98[lVar45 + lVar55 + local_b48.nstride * 3]) /
                          (dVar126 + dVar151 + 1e-100);
                dVar103 = ABS(local_b98[lVar44 + lVar55 + local_b48.nstride]) /
                          (dVar126 + dVar73 + 1e-100) + 1.0;
                dVar73 = (dVar103 + dVar181) * dVar73;
                dVar136 = ABS(local_b98[lVar45 + lVar55 + local_b48.nstride]) /
                          (dVar151 + dVar168 + 1e-100) + 1.0;
                dVar182 = ABS(local_a40[(long)local_ba0 + lVar44 + local_b48.nstride * 6]);
                dVar104 = ABS(local_a50[(long)local_ba0 + lVar44 + local_b48.nstride * 6]);
                local_7c8 = local_a40 + lVar44 + lVar37;
                dVar137 = ABS(local_7c8[local_b48.nstride * 6]);
                dVar146 = ABS(local_b98[lVar44 + lVar37 + local_b48.nstride * 6]);
                dVar74 = ABS(local_a40[(long)local_ba0 + lVar44 + local_b48.nstride * 2]) /
                         (dVar137 + dVar182 + 1e-100) + 1.0;
                local_7d0 = local_a48 + lVar44 + (long)local_ba0;
                dVar152 = ABS(local_7d0[local_b48.nstride * 6]);
                dVar155 = ABS(local_b98[(long)local_ba0 + lVar44 + local_b48.nstride * 6]);
                auVar127._0_8_ = ABS(local_7d0[local_b48.nstride * 3]);
                auVar127._8_8_ = ABS(local_a50[(long)local_ba0 + lVar44 + local_b48.nstride * 3]);
                auVar199._0_8_ = dVar152 + dVar182 + 1e-100;
                auVar199._8_8_ = dVar104 + dVar155 + 1e-100;
                auVar128 = divpd(auVar127,auVar199);
                auVar184._0_8_ = ABS(local_7d0[local_b48.nstride * 2]);
                auVar184._8_8_ = ABS(local_b98[(long)local_ba0 + lVar44 + local_b48.nstride * 2]);
                dVar198 = ABS(local_a48[lVar44 + lVar37 + local_b48.nstride * 6]);
                dVar203 = ABS(local_a50[lVar44 + lVar37 + local_b48.nstride * 6]);
                auVar213._0_8_ = dVar198 + dVar152 + 1e-100;
                auVar213._8_8_ = dVar155 + dVar146 + 1e-100;
                auVar185 = divpd(auVar184,auVar213);
                auVar206._0_8_ = ABS(local_a48[lVar44 + lVar37 + local_b48.nstride * 3]);
                auVar206._8_8_ = ABS(local_a50[lVar44 + lVar37 + local_b48.nstride * 3]);
                auVar214._0_8_ = dVar137 + dVar198 + 1e-100;
                auVar214._8_8_ = dVar146 + dVar203 + 1e-100;
                auVar207 = divpd(auVar206,auVar214);
                dVar183 = auVar185._0_8_ + 1.0;
                dVar194 = auVar185._8_8_ + 1.0;
                dVar90 = ABS(local_a50[(long)local_ba0 + lVar44 + local_b48.nstride * 2]) /
                         (dVar203 + dVar104 + 1e-100) + 1.0;
                dVar152 = (auVar128._0_8_ + dVar183) * dVar152;
                dVar155 = (auVar128._8_8_ + dVar194) * dVar155;
                auVar185._0_8_ = local_a58[lVar43 + local_b80] * dVar152;
                auVar185._8_8_ = *(double *)(lVar2 + local_b80 * 8) * dVar155;
                auVar138._0_8_ =
                     dVar152 + (dVar74 + auVar128._0_8_) * dVar182 +
                               (dVar183 + auVar207._0_8_) * dVar198 +
                               (dVar74 + auVar207._0_8_) * dVar137 + 1e-100;
                auVar138._8_8_ =
                     (auVar128._8_8_ + dVar90) * dVar104 +
                     dVar155 + (dVar90 + auVar207._8_8_) * dVar203 +
                               (dVar194 + auVar207._8_8_) * dVar146 + 1e-100;
                auVar128 = divpd(auVar185,auVar138);
                dStack_ae0 = auVar128._8_8_;
                dVar74 = ABS(local_a40[lVar44 + lVar62 + local_b48.nstride * 6]);
                dVar146 = ABS(local_a50[lVar44 + lVar62 + local_b48.nstride * 6]);
                dVar137 = ABS(local_a40[lVar44 + lVar55 + local_b48.nstride * 6]);
                dVar152 = ABS(local_b98[lVar44 + lVar55 + local_b48.nstride * 6]);
                dVar203 = ABS(local_a40[lVar44 + lVar55 + local_b48.nstride * 2]) /
                          (dVar137 + dVar74 + 1e-100) + 1.0;
                dVar90 = ABS(local_a48[lVar44 + lVar62 + local_b48.nstride * 6]);
                dVar104 = ABS(local_b98[lVar44 + lVar62 + local_b48.nstride * 6]);
                auVar186._0_8_ = ABS(local_a48[lVar44 + lVar62 + local_b48.nstride * 3]);
                auVar186._8_8_ = ABS(local_a50[lVar44 + lVar62 + local_b48.nstride * 3]);
                auVar139._0_8_ = dVar90 + dVar74 + 1e-100;
                auVar139._8_8_ = dVar146 + dVar104 + 1e-100;
                auVar187 = divpd(auVar186,auVar139);
                auVar153._0_8_ = ABS(local_a48[lVar44 + lVar55 + local_b48.nstride * 2]);
                auVar153._8_8_ = ABS(local_b98[lVar44 + lVar55 + local_b48.nstride * 2]);
                dVar183 = ABS(local_a48[lVar44 + lVar55 + local_b48.nstride * 6]);
                dVar194 = ABS(local_a50[lVar44 + lVar55 + local_b48.nstride * 6]);
                auVar161._0_8_ = dVar183 + dVar90 + 1e-100;
                auVar161._8_8_ = dVar104 + dVar152 + 1e-100;
                auVar207 = divpd(auVar153,auVar161);
                auVar163._0_8_ = ABS(local_a48[lVar44 + lVar55 + local_b48.nstride * 3]);
                auVar163._8_8_ = ABS(local_a50[lVar44 + lVar55 + local_b48.nstride * 3]);
                auVar200._0_8_ = dVar137 + dVar183 + 1e-100;
                auVar200._8_8_ = dVar194 + dVar152 + 1e-100;
                auVar185 = divpd(auVar163,auVar200);
                dVar155 = auVar207._0_8_ + 1.0;
                dVar182 = auVar207._8_8_ + 1.0;
                dVar90 = (auVar187._0_8_ + dVar155) * dVar90;
                dVar104 = (auVar187._8_8_ + dVar182) * dVar104;
                dVar198 = ABS(local_a50[lVar44 + lVar55 + local_b48.nstride * 2]) /
                          (dVar194 + dVar146 + 1e-100) + 1.0;
                local_a08 = (pointer)local_a70[lVar62 + local_b48.nstride * 7];
                uStack_a00 = 0;
                auVar207._0_8_ =
                     dVar90 + (dVar203 + auVar187._0_8_) * dVar74 +
                     (dVar203 + auVar185._0_8_) * dVar137 + (dVar155 + auVar185._0_8_) * dVar183 +
                     1e-100;
                auVar207._8_8_ =
                     (auVar187._8_8_ + dVar198) * dVar146 + dVar104 +
                     (dVar182 + auVar185._8_8_) * dVar152 + (dVar198 + auVar185._8_8_) * dVar194 +
                     1e-100;
                auVar209._8_8_ = *(double *)(lVar2 + (long)local_b88 * 8) * dVar104;
                auVar209._0_8_ = local_a58[lVar43 + (long)local_b88] * dVar90;
                auVar185 = divpd(auVar209,auVar207);
                dStack_ad0 = auVar185._8_8_;
                local_ad8 = dStack_ad0 +
                            dStack_ae0 +
                            (*(double *)(lVar31 + (long)local_b88 * 8) * dVar73) /
                            ((dVar181 + dVar136) * dVar168 + dVar73 + (dVar103 + dVar197) * dVar126
                             + (dVar136 + dVar197) * dVar151 + 1e-100) +
                            (dVar71 * *(double *)(lVar65 + (long)local_b88 * 8)) /
                            ((dVar125 + dVar89) * dVar180 + dVar71 + (dVar125 + dVar135) * dVar70 +
                             (dVar100 + dVar135) * dVar88 + 1e-100) +
                            (*(double *)(lVar31 + local_b80 * 8) * dVar72) /
                            (dVar72 + (dVar218 + dVar205) * dVar175 + (dVar196 + dVar218) * dVar134
                             + (dVar205 + dVar102) * dVar101 + 1e-100) +
                            (*(double *)(lVar65 + local_b80 * 8) * dVar195) /
                            (dVar195 + (dVar119 + dVar217) * dVar99 +
                                       (dVar212 + dVar174) * dVar204 + (dVar119 + dVar212) * dVar87
                            + 1e-100) +
                            (*(double *)(local_9f0 + (long)local_a60 * 8) * dVar133) /
                            ((dVar124 + dVar118) * dVar159 + dVar133 + (dVar98 + dVar167) * dVar69 +
                             (dVar118 + dVar167) * dVar150 + 1e-100) +
                            (dVar158 * *(double *)(local_aa0 + (long)local_a60 * 8)) /
                            ((dVar97 + dVar86) * dVar132 + dVar158 + (dVar97 + dVar166) * dVar123 +
                             (dVar117 + dVar166) * dVar149 + 1e-100) +
                            (local_ab8[(long)local_a60] * dVar68) /
                            (dVar68 + (dVar148 + dVar116) * dVar157 + (dVar96 + dVar148) * dVar122 +
                             (dVar116 + dVar165) * dVar131 + 1e-100) +
                            (local_9e8[(long)local_a60] * dVar130) /
                            (dVar130 + (dVar95 + dVar164) * dVar85 +
                                       (dVar156 + dVar115) * dVar147 + (dVar95 + dVar156) * dVar121
                            + 1e-100) +
                            *(double *)(lVar1 + (long)local_a60 * 8) + dVar79 + dVar80 + dVar81 +
                            dVar82 + dVar83 + dVar84 + auVar128._0_8_ + auVar185._0_8_;
                local_af8 = ABS(local_b98[lVar44 + lVar62 + local_b48.nstride * 7]);
                dVar81 = ABS(local_b98[lVar44 + lVar55 + local_b48.nstride * 7]);
                auVar187._8_4_ = SUB84(local_af8,0);
                auVar187._0_8_ = local_af8;
                auVar187._12_4_ = (int)((ulong)local_af8 >> 0x20);
                dVar79 = local_af8 + ABS(local_b98[lVar45 + lVar62 + local_b48.nstride * 7]);
                dVar80 = auVar187._8_8_ + ABS(local_a50[lVar44 + lVar62 + local_b48.nstride * 7]);
                local_9b8 = (pointer)((double *)local_b68)[local_b48.nstride * 4];
                uStack_9b0 = 0;
                uStack_a80 = 0;
                auVar188._0_8_ = ABS(local_b98[lVar45 + lVar62 + local_b48.nstride * 6]);
                auVar188._8_8_ = ABS(local_a50[lVar44 + lVar62 + local_b48.nstride * 5]);
                auVar112._0_8_ = dVar79 + 1e-100;
                auVar112._8_8_ = dVar80 + 1e-100;
                auVar128 = divpd(auVar188,auVar112);
                dStack_af0 = auVar128._8_8_;
                local_af8 = (dStack_af0 +
                             ABS(local_aa8[lVar62 + local_b48.nstride * 3]) /
                             (ABS(local_a50[lVar44 + lVar62 + local_b48.nstride * 7]) + dVar79 +
                              ABS(local_aa8[lVar62 + local_b48.nstride * 7]) + 1e-100) +
                             ABS(local_b98[lVar45 + lVar55 + local_b48.nstride * 2]) /
                             (dVar81 + dVar79 +
                              ABS(local_b98[lVar45 + lVar55 + local_b48.nstride * 7]) + 1e-100) +
                             ABS(local_a50[lVar44 + lVar55 + local_b48.nstride]) /
                             (dVar80 + dVar81 +
                              ABS(local_a50[lVar44 + lVar55 + local_b48.nstride * 7]) + 1e-100) +
                             1.0 + ABS(local_b98[lVar44 + lVar55 + local_b48.nstride * 4]) /
                                   (local_af8 + dVar81 + 1e-100) + auVar128._0_8_) * local_af8;
                local_ac8 = ABS(local_b98[lVar52 + lVar62 + local_b48.nstride * 7]);
                dVar81 = ABS(((double *)local_b68)[local_b48.nstride * 7]);
                local_ae8 = (double *)((long)local_b60 + lVar55 * 8);
                auVar178._8_4_ = SUB84(local_ac8,0);
                auVar178._0_8_ = local_ac8;
                auVar178._12_4_ = (int)((ulong)local_ac8 >> 0x20);
                dVar79 = local_ac8 + ABS(local_b58[local_b48.nstride * 7]);
                dVar80 = auVar178._8_8_ +
                         ABS(*(double *)((long)local_b60 + (lVar62 + local_b48.nstride * 7) * 8));
                local_a38 = local_b50[lVar55 + local_b48.nstride * 7];
                uStack_a30 = 0;
                auVar176._0_8_ = ABS(local_b98[lVar52 + lVar62 + local_b48.nstride * 6]);
                auVar176._8_8_ =
                     ABS(*(double *)((long)local_b60 + (lVar62 + local_b48.nstride * 5) * 8));
                auVar190._0_8_ = dVar79 + 1e-100;
                auVar190._8_8_ = dVar80 + 1e-100;
                auVar128 = divpd(auVar176,auVar190);
                dStack_ac0 = auVar128._8_8_;
                local_ac8 = (dStack_ac0 +
                             ABS(*(double *)((long)local_b60 + (lVar62 + local_b48.nstride * 3) * 8)
                                ) / (ABS(*(double *)
                                          ((long)local_b60 + (lVar62 + local_b48.nstride * 7) * 8))
                                     + ABS((double)local_a08) + dVar79 + 1e-100) +
                             ABS(((double *)local_b68)[local_b48.nstride * 2]) /
                             (ABS(local_b98[lVar38 + lVar55 + local_b48.nstride * 7]) + dVar79 +
                              dVar81 + 1e-100) +
                             ABS(local_ae8[local_b48.nstride]) /
                             (dVar80 + dVar81 + ABS(local_ae8[local_b48.nstride * 7]) + 1e-100) +
                             1.0 + ABS((double)local_9b8) / (local_ac8 + dVar81 + 1e-100) +
                            auVar128._0_8_) * local_ac8;
                dVar74 = ABS(local_a48[lVar44 + lVar62 + local_b48.nstride * 7]);
                dVar73 = ABS(local_a48[lVar44 + lVar55 + local_b48.nstride * 7]);
                dVar82 = ABS(local_a48[lVar45 + lVar62 + local_b48.nstride * 7]) + dVar74;
                dVar83 = dVar74 + ABS(local_a40[lVar44 + lVar62 + local_b48.nstride * 7]);
                local_a88 = local_a48 + lVar45 + lVar55;
                auVar160._0_8_ = ABS(local_a48[lVar44 + lVar55 + local_b48.nstride * 4]);
                auVar160._8_8_ = ABS(local_a48[lVar45 + lVar62 + local_b48.nstride * 3]);
                auVar140._0_8_ = dVar74 + dVar73 + 1e-100;
                auVar140._8_8_ =
                     ABS(local_a40[lVar44 + lVar62 + local_b48.nstride * 7]) +
                     ABS(local_a20[lVar62 + local_b48.nstride * 7]) + dVar74 +
                     ABS(local_a48[lVar45 + lVar62 + local_b48.nstride * 7]) + 1e-100;
                auVar161 = divpd(auVar160,auVar140);
                auVar189._0_8_ = ABS(local_a48[lVar45 + lVar62 + local_b48.nstride * 6]);
                auVar189._8_8_ = ABS(local_a48[lVar44 + lVar62 + local_b48.nstride * 5]);
                auVar120._0_8_ = dVar82 + 1e-100;
                auVar120._8_8_ = dVar83 + 1e-100;
                auVar190 = divpd(auVar189,auVar120);
                dVar80 = ABS(local_b70[lVar62 + local_b48.nstride * 7]);
                dVar90 = ABS(local_7b8[local_b48.nstride * 7]) + dVar80;
                dVar104 = dVar80 + ABS(local_b50[lVar62 + local_b48.nstride * 7]);
                dVar84 = ABS(local_b70[lVar55 + local_b48.nstride * 7]);
                auVar114._8_4_ = SUB84(dVar80,0);
                auVar114._0_8_ = dVar80;
                auVar114._12_4_ = (int)((ulong)dVar80 >> 0x20);
                auVar208._0_8_ = ABS(local_b70[lVar55 + local_b48.nstride * 4]);
                auVar208._8_8_ = ABS(local_b70[lVar62 + local_b48.nstride * 3]);
                auVar141._0_8_ = dVar84 + dVar80 + 1e-100;
                auVar141._8_8_ =
                     ABS(local_b50[lVar62 + local_b48.nstride * 7]) +
                     ABS(local_a18[lVar62 + local_b48.nstride * 7]) +
                     ABS(local_7b8[local_b48.nstride * 7]) + auVar114._8_8_ + 1e-100;
                auVar209 = divpd(auVar208,auVar141);
                auVar177._0_8_ = ABS(local_b70[lVar62 + local_b48.nstride * 6]);
                auVar177._8_8_ = ABS(local_b70[lVar62 + local_b48.nstride * 5]);
                auVar128._8_8_ = dVar104 + 1e-100;
                auVar128._0_8_ = dVar90 + 1e-100;
                auVar178 = divpd(auVar177,auVar128);
                dVar68 = ABS(local_b98[lVar44 + lVar37 + local_b48.nstride * 7]);
                dVar79 = ABS(local_a50[(long)local_ba0 + lVar44 + local_b48.nstride * 7]);
                dVar69 = ABS(local_b98[(long)local_ba0 + lVar44 + local_b48.nstride * 7]);
                auVar143._0_8_ = ABS(local_7c0[local_b48.nstride * 2]);
                auVar143._8_8_ = ABS(local_a50[(long)local_ba0 + lVar44 + local_b48.nstride]);
                auVar210._8_4_ = SUB84(dVar68,0);
                auVar210._0_8_ = dVar68;
                auVar210._12_4_ = (int)((ulong)dVar68 >> 0x20);
                auVar107._8_4_ = SUB84(dVar69,0);
                auVar107._0_8_ = dVar69;
                auVar107._12_4_ = (int)((ulong)dVar69 >> 0x20);
                auVar211._0_8_ =
                     dVar68 + ABS(local_b98[lVar45 + lVar37 + local_b48.nstride * 7]) + dVar69 +
                     ABS(local_7c0[local_b48.nstride * 7]) + 1e-100;
                auVar211._8_8_ =
                     auVar210._8_8_ + ABS(local_a50[lVar44 + lVar37 + local_b48.nstride * 7]) +
                     auVar107._8_8_ + dVar79 + 1e-100;
                auVar128 = divpd(auVar143,auVar211);
                auVar162._0_8_ = ABS(local_b98[(long)local_ba0 + lVar44 + local_b48.nstride * 4]);
                auVar162._8_8_ = ABS(local_aa8[(long)local_ba0 + local_b48.nstride * 3]);
                dVar81 = dVar69 + ABS(local_7c0[local_b48.nstride * 7]);
                auVar169._0_8_ = dVar68 + dVar69 + 1e-100;
                auVar169._8_8_ =
                     dVar79 + dVar81 + ABS(local_aa8[(long)local_ba0 + local_b48.nstride * 7]) +
                     1e-100;
                auVar163 = divpd(auVar162,auVar169);
                auVar142._0_8_ = ABS(local_7c0[local_b48.nstride * 6]);
                auVar142._8_8_ = ABS(local_a50[(long)local_ba0 + lVar44 + local_b48.nstride * 5]);
                auVar108._0_8_ = dVar81 + 1e-100;
                auVar108._8_8_ = auVar107._8_8_ + dVar79 + 1e-100;
                auVar143 = divpd(auVar142,auVar108);
                dVar68 = ABS(local_b98[lVar52 + lVar37 + local_b48.nstride * 7]);
                dVar72 = ABS(local_b98[(long)local_ba0 + lVar52 + local_b48.nstride * 7]);
                dVar81 = ABS(*(double *)
                              ((long)local_b60 + ((long)local_ba0 + local_b48.nstride * 7) * 8));
                auVar171._8_4_ = SUB84(dVar68,0);
                auVar171._0_8_ = dVar68;
                auVar171._12_4_ = (int)((ulong)dVar68 >> 0x20);
                auVar216._0_8_ =
                     ABS(*(double *)((long)local_b60 + ((long)local_ba0 + local_b48.nstride) * 8));
                auVar216._8_8_ = ABS(local_b98[(long)local_ba0 + lVar52 + local_b48.nstride * 2]);
                auVar193._0_8_ =
                     dVar81 + dVar72 + dVar68 + ABS(*(double *)
                                                     ((long)local_b60 +
                                                     (lVar37 + local_b48.nstride * 7) * 8)) + 1e-100
                ;
                auVar193._8_8_ =
                     dVar72 + ABS(local_b98[(long)local_ba0 + lVar38 + local_b48.nstride * 7]) +
                              auVar171._8_8_ +
                              ABS(local_b98[lVar38 + lVar37 + local_b48.nstride * 7]) + 1e-100;
                auVar207 = divpd(auVar216,auVar193);
                auVar202._8_4_ = SUB84(dVar72,0);
                auVar202._0_8_ = dVar72;
                auVar202._12_4_ = (int)((ulong)dVar72 >> 0x20);
                dVar79 = dVar72 + ABS(local_b98[(long)local_ba0 + lVar38 + local_b48.nstride * 7]);
                auVar215._0_8_ = ABS(local_b98[(long)local_ba0 + lVar52 + local_b48.nstride * 4]);
                auVar215._8_8_ =
                     ABS(*(double *)
                          ((long)local_b60 + ((long)local_ba0 + local_b48.nstride * 3) * 8));
                auVar191._0_8_ = dVar72 + dVar68 + 1e-100;
                auVar191._8_8_ =
                     ABS(local_a70[(long)local_ba0 + local_b48.nstride * 7]) + dVar79 + dVar81 +
                     1e-100;
                auVar216 = divpd(auVar215,auVar191);
                auVar170._0_8_ = ABS(local_b98[(long)local_ba0 + lVar52 + local_b48.nstride * 6]);
                auVar170._8_8_ =
                     ABS(*(double *)
                          ((long)local_b60 + ((long)local_ba0 + local_b48.nstride * 5) * 8));
                auVar77._0_8_ = dVar79 + 1e-100;
                auVar77._8_8_ = auVar202._8_8_ + dVar81 + 1e-100;
                auVar171 = divpd(auVar170,auVar77);
                dVar70 = ABS(local_7d0[local_b48.nstride * 7]);
                dVar68 = ABS(local_a40[(long)local_ba0 + lVar44 + local_b48.nstride * 7]);
                dVar79 = ABS(local_a48[lVar44 + lVar37 + local_b48.nstride * 7]);
                dVar81 = ABS(local_a48[(long)local_ba0 + lVar45 + local_b48.nstride * 7]);
                auVar172._8_4_ = SUB84(dVar79,0);
                auVar172._0_8_ = dVar79;
                auVar172._12_4_ = (int)((ulong)dVar79 >> 0x20);
                auVar192._0_8_ = ABS(local_a48[(long)local_ba0 + lVar45 + local_b48.nstride * 2]);
                auVar192._8_8_ = ABS(local_7d0[local_b48.nstride]);
                auVar173._0_8_ =
                     dVar79 + ABS(local_a48[lVar45 + lVar37 + local_b48.nstride * 7]) + dVar70 +
                     dVar81 + 1e-100;
                auVar173._8_8_ =
                     auVar172._8_8_ + ABS(local_7c8[local_b48.nstride * 7]) + dVar68 + dVar70 +
                     1e-100;
                auVar193 = divpd(auVar192,auVar173);
                auVar94._0_8_ = ABS(local_7d0[local_b48.nstride * 4]);
                auVar94._8_8_ = ABS(local_a48[(long)local_ba0 + lVar45 + local_b48.nstride * 3]);
                auVar179._0_8_ = dVar70 + dVar79 + 1e-100;
                auVar179._8_8_ =
                     dVar68 + ABS(local_a20[(long)local_ba0 + local_b48.nstride * 7]) + dVar70 +
                     dVar81 + 1e-100;
                auVar187 = divpd(auVar94,auVar179);
                auVar201._0_8_ = ABS(local_a48[(long)local_ba0 + lVar45 + local_b48.nstride * 6]);
                auVar201._8_8_ = ABS(local_7d0[local_b48.nstride * 5]);
                auVar144._0_8_ = dVar81 + dVar70 + 1e-100;
                auVar144._8_8_ = dVar70 + dVar68 + 1e-100;
                auVar202 = divpd(auVar201,auVar144);
                dVar71 = ABS(local_b70[lVar37 + local_b48.nstride * 7]);
                dVar68 = ABS(local_b78[(long)local_ba0 + local_b48.nstride * 7]);
                dVar79 = ABS(local_b70[(long)local_ba0 + local_b48.nstride * 7]);
                dVar81 = ABS(local_b50[(long)local_ba0 + local_b48.nstride * 7]);
                auVar78._0_8_ = ABS(local_b70[(long)local_ba0 + local_b48.nstride]);
                auVar78._8_8_ = ABS(local_b70[(long)local_ba0 + local_b48.nstride * 2]);
                auVar109._8_4_ = SUB84(dVar71,0);
                auVar109._0_8_ = dVar71;
                auVar109._12_4_ = (int)((ulong)dVar71 >> 0x20);
                auVar110._8_4_ = SUB84(dVar79,0);
                auVar110._0_8_ = dVar79;
                auVar110._12_4_ = (int)((ulong)dVar79 >> 0x20);
                auVar129._0_8_ =
                     dVar81 + dVar71 + ABS(local_b50[lVar37 + local_b48.nstride * 7]) + dVar79 +
                     1e-100;
                auVar129._8_8_ =
                     dVar68 + auVar109._8_8_ + ABS(local_b78[lVar37 + local_b48.nstride * 7]) +
                     auVar110._8_8_ + 1e-100;
                auVar185 = divpd(auVar78,auVar129);
                auVar111._0_8_ = ABS(local_b70[(long)local_ba0 + local_b48.nstride * 4]);
                auVar111._8_8_ = ABS(local_b70[(long)local_ba0 + local_b48.nstride * 3]);
                auVar154._0_8_ = dVar71 + dVar79 + 1e-100;
                auVar154._8_8_ =
                     dVar81 + ABS(local_a18[(long)local_ba0 + local_b48.nstride * 7]) + dVar68 +
                     auVar110._8_8_ + 1e-100;
                auVar112 = divpd(auVar111,auVar154);
                auVar113._0_8_ = ABS(local_b70[(long)local_ba0 + local_b48.nstride * 6]);
                auVar113._8_8_ = ABS(local_b70[(long)local_ba0 + local_b48.nstride * 5]);
                auVar145._0_8_ = dVar68 + dVar79 + 1e-100;
                auVar145._8_8_ = dVar79 + dVar81 + 1e-100;
                auVar114 = divpd(auVar113,auVar145);
                p_Var75 = (_func_int *)
                          (((auVar114._8_8_ +
                             auVar112._8_8_ + auVar185._8_8_ + auVar185._0_8_ + 1.0 + auVar112._0_8_
                            + auVar114._0_8_) * dVar79 * local_9e8[local_b80] *
                            local_b70[(long)(local_ba0 + local_b48.nstride)] +
                           (auVar202._8_8_ +
                            auVar187._8_8_ + auVar193._8_8_ + 1.0 + auVar193._0_8_ + auVar187._0_8_
                           + auVar202._0_8_) * dVar70 * local_ab8[local_b80] *
                           local_a48[(long)local_ba0 + lVar45 + local_b48.nstride * 8] +
                           (auVar171._8_8_ +
                            auVar216._8_8_ + auVar207._8_8_ + auVar207._0_8_ + 1.0 + auVar216._0_8_
                           + auVar171._0_8_) * dVar72 * *(double *)(local_aa0 + local_b80 * 8) *
                           *(double *)((long)local_b60 + (local_ba0 + local_b48.nstride) * 8) +
                           (auVar143._8_8_ +
                            auVar163._8_8_ + auVar128._8_8_ + 1.0 + auVar128._0_8_ + auVar163._0_8_
                           + auVar143._0_8_) * dVar69 * *(double *)(local_9f0 + local_b80 * 8) *
                           local_aa8[(long)(local_ba0 + local_b48.nstride)] +
                           (auVar178._8_8_ +
                            auVar209._8_8_ +
                            ABS(local_b70[lVar55 + local_b48.nstride * 2]) /
                            (ABS(local_b78[lVar55 + local_b48.nstride * 7]) + dVar90 + dVar84 +
                            1e-100) + ABS(local_b70[lVar55 + local_b48.nstride]) /
                                      (dVar104 + ABS(local_a38) + dVar84 + 1e-100) + 1.0 +
                            auVar209._0_8_ + auVar178._0_8_) * dVar80 * local_9e8[(long)local_b88] *
                           local_b70[lVar55 + local_b48.nstride * 8] +
                           (auVar190._8_8_ +
                            auVar161._8_8_ +
                            ABS(local_a88[local_b48.nstride * 2]) /
                            (dVar73 + dVar82 + ABS(local_a88[local_b48.nstride * 7]) + 1e-100) +
                            ABS(local_a48[lVar44 + lVar55 + local_b48.nstride]) /
                            (dVar83 + ABS(local_a40[lVar44 + lVar55 + local_b48.nstride * 7]) +
                             dVar73 + 1e-100) + 1.0 + auVar161._0_8_ + auVar190._0_8_) * dVar74 *
                           local_ab8[(long)local_b88] * local_a88[local_b48.nstride * 8] +
                           local_ac8 * *(double *)(local_aa0 + (long)local_b88 * 8) *
                           local_ae8[local_b48.nstride * 8] +
                           local_af8 * *(double *)(local_9f0 + (long)local_b88 * 8) *
                           local_aa8[lVar55 + local_b48.nstride * 8] + local_ad8) * 0.125);
                local_a10 = lVar53;
              }
              fine_contrib_on_crse.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
              _vptr_FabArrayBase
              [(lVar20 - fine_contrib_on_crse.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                         boxarray.m_bat.m_op.m_bndryReg.m_loshft.vect[1]) *
               fine_contrib_on_crse.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.
               m_bat._0_8_ +
               ((long)iVar14 -
               (long)fine_contrib_on_crse.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                     boxarray.m_bat.m_op.m_bndryReg.m_loshft.vect[2]) *
               fine_contrib_on_crse.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.
               m_bat.m_op._4_8_ +
               (lVar53 - fine_contrib_on_crse.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                         boxarray.m_bat.m_op.m_bndryReg.m_loshft.vect[0])] = p_Var75;
              lVar53 = lVar53 + 1;
            } while (local_be8.jstride._4_4_ + 1 != (int)lVar53);
          }
        }
        local_7a8 = iVar14;
        iVar23 = iVar14 + 1;
      }
    }
    MFIter::operator++((MFIter *)&fine_contrib);
  }
  MFIter::~MFIter((MFIter *)&fine_contrib);
  fine_contrib.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._0_12_ =
       Geometry::periodicity(this_00);
  FabArray<amrex::FArrayBox>::ParallelCopy
            (&res->super_FabArray<amrex::FArrayBox>,
             &fine_res_for_coarse.super_FabArray<amrex::FArrayBox>,(Periodicity *)&fine_contrib,COPY
            );
  amrex::coarsen((BoxArray *)&fine_contrib_on_crse,ba,local_b04);
  mfi_2.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_ = 0;
  mfi_2.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_4_ = 1;
  mfi_2.fabArray._0_4_ = 0;
  mfi_2.fabArray._4_4_ = 0;
  mfi_2.tile_size.vect[0] = 0;
  mfi_2.tile_size.vect[1] = 0;
  mfi_2.tile_size.vect[2] = 0;
  mfi_2.flags = '\0';
  mfi_2._29_3_ = 0;
  mfi_2.currentIndex = 0;
  mfi_2.beginIndex = 0;
  local_968.p = (double *)&PTR__FabFactory_007d2928;
  MultiFab::MultiFab(&fine_contrib,(BoxArray *)&fine_contrib_on_crse,dm,1,0,(MFInfo *)&mfi_2,
                     (FabFactory<amrex::FArrayBox> *)&local_968);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&mfi_2.tile_size);
  BoxArray::~BoxArray((BoxArray *)&fine_contrib_on_crse);
  local_7b8 = *(double **)
               &(local_9f8->m_sigma).
                super_vector<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
                .
                super__Vector_base<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar22].
                super_vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
                .
                super__Vector_base<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
  ;
  local_344.num_streams = Gpu::Device::max_gpu_streams;
  local_344.do_tiling = true;
  local_344.tilesize.vect[0] = (int)FabArrayBase::mfiter_tile_size;
  local_344.tilesize.vect[1] = FabArrayBase::mfiter_tile_size._4_4_;
  local_344.tilesize.vect[2] = DAT_007d7ef0;
  local_344.dynamic = true;
  local_344.device_sync = true;
  MFIter::MFIter((MFIter *)&fine_contrib_on_crse,(FabArrayBase *)&fine_contrib,&local_344);
  dVar91 = dVar91 * 0.027777777777777776 * dVar91;
  dVar92 = dVar92 * 0.027777777777777776 * dVar92;
  dVar93 = dVar93 * 0.027777777777777776 * dVar93;
  while( true ) {
    if (fine_contrib_on_crse.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op
        .m_bndryReg.m_loshft.vect[2] <=
        fine_contrib_on_crse.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op
        .m_bndryReg.m_loshft.vect[0]) break;
    MFIter::tilebox((Box *)&local_560,(MFIter *)&fine_contrib_on_crse);
    MFIter::validbox((Box *)&mfi_2,(MFIter *)&fine_contrib_on_crse);
    result.smallend.vect[1] =
         mfi_2.m_fa._M_t.
         super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
         super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
         super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_;
    result.smallend.vect[0] =
         (int)mfi_2.m_fa._M_t.
              super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>.
              _M_t.
              super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
              .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl;
    result.bigend.vect[1] = mfi_2.tile_size.vect[0];
    result.bigend.vect[2] = mfi_2.tile_size.vect[1];
    result.btype.itype = mfi_2.tile_size.vect[2];
    result.smallend.vect[2] = (int)mfi_2.fabArray;
    result.bigend.vect[0] = mfi_2.fabArray._4_4_;
    if (local_b04 != 1) {
      result.smallend.vect[1] =
           mfi_2.m_fa._M_t.
           super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>.
           _M_t.
           super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
           super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_ * local_b04;
      result.smallend.vect[0] =
           (int)mfi_2.m_fa._M_t.
                super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                ._M_t.
                super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl * local_b04;
      result.smallend.vect[2] = (int)mfi_2.fabArray * local_b04;
      uVar57 = (uint)((mfi_2.tile_size.vect[2] & 2U) == 0);
      uVar27 = (uint)((mfi_2.tile_size.vect[2] & 4U) == 0);
      result.bigend.vect[0] =
           (mfi_2.fabArray._4_4_ + (~mfi_2.tile_size.vect[2] & 1U)) * local_b04 -
           (~mfi_2.tile_size.vect[2] & 1U);
      result.bigend.vect[1] = (mfi_2.tile_size.vect[0] + uVar57) * local_b04 - uVar57;
      result.bigend.vect[2] = (mfi_2.tile_size.vect[1] + uVar27) * local_b04 - uVar27;
    }
    bx_2.bigend.vect[1] = result.bigend.vect[1];
    bx_2.bigend.vect[2] = result.bigend.vect[2];
    bx_2.smallend.vect[0] = result.smallend.vect[0];
    bx_2.smallend.vect[1] = result.smallend.vect[1];
    bx_2.bigend.vect[0] = result.bigend.vect[0];
    bx_2.smallend.vect[2] = result.smallend.vect[2];
    for (lVar18 = 0; lVar18 != 3; lVar18 = lVar18 + 1) {
      if (((uint)mfi_2.tile_size.vect[2] >> ((uint)lVar18 & 0x1f) & 1) != 0) {
        piVar3 = bx_2.bigend.vect + lVar18;
        *piVar3 = *piVar3 + -1;
      }
    }
    bx_2.btype.itype = 0;
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              ((Array4<double> *)&mfi_2,&fine_contrib.super_FabArray<amrex::FArrayBox>,
               (MFIter *)&fine_contrib_on_crse);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_968,local_8e0,(MFIter *)&fine_contrib_on_crse);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_b48,&fine_rhs->super_FabArray<amrex::FArrayBox>,
               (MFIter *)&fine_contrib_on_crse);
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_be8,&fine_sol->super_FabArray<amrex::FArrayBox>,
               (MFIter *)&fine_contrib_on_crse);
    FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
              (&local_818,this_02,(MFIter *)&fine_contrib_on_crse);
    if ((FabArray<amrex::FArrayBox> *)*local_7b8 == (FabArray<amrex::FArrayBox> *)0x0) {
      dVar79 = local_9f8->m_const_sigma;
      puVar47 = (pointer)(ulong)(uint)local_560.p;
      pFVar49 = (FabArray<amrex::IArrayBox> *)(ulong)local_560.p._4_4_;
      puVar46 = (pointer)(ulong)(uint)local_560.jstride;
      local_b58 = (double *)CONCAT44(local_b58._4_4_,local_560.jstride._4_4_);
      local_ab8 = (double *)CONCAT44(local_ab8._4_4_,(undefined4)local_560.kstride);
      local_a70 = (double *)CONCAT44(local_a70._4_4_,local_560.kstride._4_4_);
      local_b60 = pFVar49;
      local_9b8 = puVar47;
      if (local_b04 == 2) {
        local_a20 = (double *)CONCAT44(local_a20._4_4_,(uint)local_560.p * 2);
        local_9f0 = CONCAT44(local_9f0._4_4_,(uint)local_560.p * 2 + -1);
        local_aa8 = (double *)CONCAT44(local_aa8._4_4_,(uint)local_560.jstride * 2 + -1);
        iVar24 = local_560.p._4_4_ * 2;
        while( true ) {
          if ((int)local_a70 < (int)puVar46) break;
          local_a10 = (long)(int)local_aa8;
          local_a50 = (double *)(long)(int)puVar46;
          local_b78 = (double *)((long)local_a50 * 2);
          local_a18 = (double *)CONCAT44(local_a18._4_4_,(int)local_b78 + -1);
          local_9e8 = (double *)CONCAT44(local_9e8._4_4_,(int)local_b78 + 1);
          local_aa0 = CONCAT44(local_aa0._4_4_,iVar24 + -1);
          uVar28 = (ulong)pFVar49 & 0xffffffff;
          local_a08 = puVar46;
          while( true ) {
            iVar22 = (int)uVar28;
            if ((int)local_ab8 < iVar22) break;
            local_a60 = (double *)(long)(int)local_aa0;
            local_a48 = (double *)(long)iVar22;
            local_ba0 = (_func_int **)((long)local_a48 * 2);
            local_ab0 = CONCAT44(local_ab0._4_4_,(int)local_ba0 + -1);
            local_a68 = CONCAT44(local_a68._4_4_,(int)local_ba0 + 1);
            uVar63 = (ulong)puVar47 & 0xffffffff;
            local_a58 = (double *)CONCAT44(local_a58._4_4_,iVar22);
            iVar17 = (int)local_a20;
            iVar22 = (int)local_9f0;
            while( true ) {
              iVar61 = (int)uVar63;
              if ((int)local_b58 < iVar61) break;
              pdVar66 = (double *)(long)iVar61;
              if (local_818.p
                  [((long)local_ba0 - (long)local_818.begin.y) * local_818.jstride +
                   ((long)pdVar66 * 2 - (long)local_818.begin.x) +
                   ((long)local_b78 - (long)local_818.begin.z) * local_818.kstride] == 0) {
                dVar80 = 0.0;
              }
              else {
                local_a98 = CONCAT44(local_a98._4_4_,iVar61);
                local_b00 = (undefined8 *)CONCAT44(local_b00._4_4_,iVar22);
                uVar57 = (uint)((long)pdVar66 * 2) | 1;
                if (result.bigend.vect[0] < (int)uVar57) {
                  uVar57 = result.bigend.vect[0];
                }
                dVar81 = (double)(ulong)uVar57;
                iVar61 = result.smallend.vect[1];
                if (result.smallend.vect[1] < (int)local_ab0) {
                  iVar61 = (int)local_ab0;
                }
                local_b70 = (double *)CONCAT44(local_b70._4_4_,iVar61);
                iVar61 = result.bigend.vect[1];
                if ((int)local_a68 <= result.bigend.vect[1]) {
                  iVar61 = (int)local_a68;
                }
                local_ae8 = (double *)CONCAT44(local_ae8._4_4_,iVar61);
                iVar61 = result.smallend.vect[2];
                if (result.smallend.vect[2] < (int)local_a18) {
                  iVar61 = (int)local_a18;
                }
                iVar15 = result.bigend.vect[2];
                if ((int)local_9e8 <= result.bigend.vect[2]) {
                  iVar15 = (int)local_9e8;
                }
                local_ba8 = CONCAT44(local_ba8._4_4_,iVar15);
                local_b80 = (long)result.smallend.vect[0];
                if ((long)result.smallend.vect[0] <= (long)iVar22) {
                  local_b80 = (long)iVar22;
                }
                iVar15 = (int)local_a10;
                if ((int)local_a10 < result.smallend.vect[2]) {
                  iVar15 = result.smallend.vect[2];
                }
                iVar16 = iVar15 + -1;
                iVar51 = (int)local_a60;
                if ((int)local_a60 < result.smallend.vect[1]) {
                  iVar51 = result.smallend.vect[1];
                }
                local_a38 = (double)CONCAT44(local_a38._4_4_,iVar51 + -1);
                local_c40 = (long)result.smallend.vect[2];
                if (result.smallend.vect[2] <= local_a10) {
                  local_c40 = local_a10;
                }
                local_b50 = (double *)(long)result.smallend.vect[1];
                if ((long)result.smallend.vect[1] <= (long)local_a60) {
                  local_b50 = local_a60;
                }
                local_a88 = (double *)(ulong)(iVar51 + 1);
                if (iVar22 < result.smallend.vect[0]) {
                  iVar22 = result.smallend.vect[0];
                }
                local_b68 = (pointer)CONCAT44(local_b68._4_4_,iVar17);
                local_b88 = (double)CONCAT44(local_b88._4_4_,iVar17 - iVar22);
                dVar80 = 0.0;
                local_ac8 = dVar81;
                local_a40 = pdVar66;
                while( true ) {
                  iVar15 = iVar15 + 1;
                  if ((int)local_ba8 < iVar61) break;
                  iVar17 = (int)local_b78 - iVar61;
                  iVar22 = -iVar17;
                  if (iVar17 < 1) {
                    iVar22 = iVar17;
                  }
                  local_b90 = (double)CONCAT44(local_b90._4_4_,iVar16);
                  lVar18 = (long)iVar16;
                  local_b98 = (double *)CONCAT44(local_b98._4_4_,iVar22 + 2);
                  iVar16 = iVar61 + -1;
                  iVar51 = iVar61 + 1;
                  local_c48 = (ulong)local_a88 & 0xffffffff;
                  local_c60 = local_b50;
                  iVar22 = local_a38._0_4_;
                  iVar17 = (int)local_b70;
                  while (iVar17 <= (int)local_ae8) {
                    local_ad8 = (double)CONCAT44(local_ad8._4_4_,iVar22);
                    lVar20 = (long)iVar22;
                    iVar23 = (int)local_ba0 - iVar17;
                    iVar22 = -iVar23;
                    if (iVar23 < 1) {
                      iVar22 = iVar23;
                    }
                    local_af8 = (double)CONCAT44(local_af8._4_4_,(iVar22 + 2) * (int)local_b98);
                    iVar22 = iVar17 + -1;
                    iVar23 = iVar17 + 1;
                    lVar32 = local_b80;
                    iVar14 = local_b88._0_4_;
                    while( true ) {
                      iVar26 = (int)lVar32;
                      if (SUB84(dVar81,0) < iVar26) break;
                      iVar36 = -iVar14;
                      if (iVar14 < 1) {
                        iVar36 = iVar14;
                      }
                      bVar13 = Box::strictly_contains(&result,iVar26,iVar17,iVar61);
                      if (bVar13) {
                        local_c78 = (double *)
                                    (local_b48.p
                                     [((local_c40 - local_b48.begin.z) * local_b48.kstride +
                                      ((long)local_c60 - (long)local_b48.begin.y) *
                                      local_b48.jstride + lVar32) - (long)local_b48.begin.x] -
                                    (double)local_968.p
                                            [((local_c40 - local_968.begin.z) * local_968.kstride +
                                             ((long)local_c60 - (long)local_968.begin.y) *
                                             local_968.jstride + lVar32) - (long)local_968.begin.x])
                        ;
                      }
                      else {
                        iVar48 = iVar26 + -1;
                        bVar13 = Box::contains(&bx_2,iVar48,iVar22,iVar16);
                        local_c78 = (double *)0x0;
                        if (bVar13) {
                          lVar55 = (long)local_be8.begin.x;
                          lVar54 = CONCAT44(local_be8.p._4_4_,(int)local_be8.p);
                          lVar19 = CONCAT44(local_be8.jstride._4_4_,(int)local_be8.jstride);
                          lVar39 = lVar54 + (iVar17 - local_be8.begin.y) * lVar19 * 8 +
                                   (long)(~local_be8.begin.x + iVar26) * 8;
                          lVar53 = lVar54 + (iVar22 - local_be8.begin.y) * lVar19 * 8 +
                                   (long)(~local_be8.begin.x + iVar26) * 8;
                          lVar37 = CONCAT44(local_be8.kstride._4_4_,(int)local_be8.kstride);
                          lVar62 = (iVar61 - local_be8.begin.z) * lVar37;
                          dVar81 = *(double *)(lVar39 + lVar62 * 8);
                          dVar82 = *(double *)(lVar53 + lVar62 * 8);
                          lVar62 = (iVar16 - local_be8.begin.z) * lVar37;
                          dVar83 = *(double *)(lVar39 + lVar62 * 8);
                          lVar39 = (local_c40 - local_be8.begin.z) * lVar37 * 8;
                          dVar84 = *(double *)(lVar53 + lVar62 * 8);
                          lVar53 = ((long)local_c60 - (long)local_be8.begin.y) * lVar19 * 8;
                          dVar68 = *(double *)(lVar39 + lVar53 + lVar55 * -8 + lVar54 + lVar32 * 8);
                          lVar19 = (lVar20 - local_be8.begin.y) * lVar19 * 8;
                          dVar69 = *(double *)(lVar39 + lVar19 + lVar55 * -8 + lVar54 + lVar32 * 8);
                          lVar39 = (lVar18 - local_be8.begin.z) * lVar37 * 8;
                          dVar70 = *(double *)(lVar53 + lVar39 + lVar55 * -8 + lVar54 + lVar32 * 8);
                          dVar71 = *(double *)(lVar39 + lVar19 + lVar55 * -8 + lVar54 + lVar32 * 8);
                          local_c78 = (double *)
                                      ((((dVar84 - dVar82) +
                                        (dVar71 - dVar69) + (dVar71 - dVar69) +
                                        (dVar70 - dVar68) * 4.0 +
                                        (dVar83 - dVar81) + (dVar83 - dVar81)) * dVar93 +
                                       ((dVar84 - dVar71) +
                                       (dVar83 - dVar70) + (dVar83 - dVar70) +
                                       (dVar81 - dVar68) * 4.0 +
                                       (dVar82 - dVar69) + (dVar82 - dVar69)) * dVar91 +
                                       ((dVar84 - dVar83) +
                                       (dVar71 - dVar70) + (dVar71 - dVar70) +
                                       (dVar69 - dVar68) * 4.0 +
                                       (dVar82 - dVar81) + (dVar82 - dVar81)) * dVar92) * dVar79 +
                                      0.0);
                        }
                        bVar13 = Box::contains(&bx_2,iVar26,iVar22,iVar16);
                        if (bVar13) {
                          lVar55 = (long)local_be8.begin.x;
                          lVar53 = (long)((iVar26 - local_be8.begin.x) + 1);
                          lVar54 = CONCAT44(local_be8.p._4_4_,(int)local_be8.p);
                          lVar19 = CONCAT44(local_be8.jstride._4_4_,(int)local_be8.jstride);
                          lVar39 = lVar54 + (iVar17 - local_be8.begin.y) * lVar19 * 8 + lVar53 * 8;
                          lVar53 = lVar54 + (iVar22 - local_be8.begin.y) * lVar19 * 8 + lVar53 * 8;
                          lVar37 = CONCAT44(local_be8.kstride._4_4_,(int)local_be8.kstride);
                          lVar62 = (iVar61 - local_be8.begin.z) * lVar37;
                          dVar81 = *(double *)(lVar39 + lVar62 * 8);
                          dVar82 = *(double *)(lVar53 + lVar62 * 8);
                          lVar62 = (iVar16 - local_be8.begin.z) * lVar37;
                          dVar83 = *(double *)(lVar39 + lVar62 * 8);
                          lVar39 = (local_c40 - local_be8.begin.z) * lVar37 * 8;
                          dVar84 = *(double *)(lVar53 + lVar62 * 8);
                          lVar53 = ((long)local_c60 - (long)local_be8.begin.y) * lVar19 * 8;
                          dVar68 = *(double *)(lVar39 + lVar53 + lVar55 * -8 + lVar54 + lVar32 * 8);
                          lVar19 = (lVar20 - local_be8.begin.y) * lVar19 * 8;
                          dVar69 = *(double *)(lVar39 + lVar19 + lVar55 * -8 + lVar54 + lVar32 * 8);
                          lVar39 = (lVar18 - local_be8.begin.z) * lVar37 * 8;
                          dVar70 = *(double *)(lVar53 + lVar39 + lVar55 * -8 + lVar54 + lVar32 * 8);
                          dVar71 = *(double *)(lVar39 + lVar19 + lVar55 * -8 + lVar54 + lVar32 * 8);
                          local_c78 = (double *)
                                      ((double)local_c78 +
                                      (((dVar84 - dVar82) +
                                       (dVar71 - dVar69) + (dVar71 - dVar69) +
                                       (dVar70 - dVar68) * 4.0 +
                                       (dVar83 - dVar81) + (dVar83 - dVar81)) * dVar93 +
                                      ((dVar84 - dVar71) +
                                      (dVar83 - dVar70) + (dVar83 - dVar70) +
                                      (dVar81 - dVar68) * 4.0 +
                                      (dVar82 - dVar69) + (dVar82 - dVar69)) * dVar91 +
                                      ((dVar84 - dVar83) +
                                      (dVar71 - dVar70) + (dVar71 - dVar70) +
                                      (dVar69 - dVar68) * 4.0 +
                                      (dVar82 - dVar81) + (dVar82 - dVar81)) * dVar92) * dVar79);
                        }
                        bVar13 = Box::contains(&bx_2,iVar48,iVar17,iVar16);
                        if (bVar13) {
                          lVar55 = (long)local_be8.begin.x;
                          lVar54 = CONCAT44(local_be8.p._4_4_,(int)local_be8.p);
                          lVar19 = CONCAT44(local_be8.jstride._4_4_,(int)local_be8.jstride);
                          lVar39 = lVar54 + (iVar17 - local_be8.begin.y) * lVar19 * 8 +
                                   (long)(~local_be8.begin.x + iVar26) * 8;
                          lVar53 = lVar54 + (iVar23 - local_be8.begin.y) * lVar19 * 8 +
                                   (long)(~local_be8.begin.x + iVar26) * 8;
                          lVar37 = CONCAT44(local_be8.kstride._4_4_,(int)local_be8.kstride);
                          lVar62 = (iVar61 - local_be8.begin.z) * lVar37;
                          dVar81 = *(double *)(lVar39 + lVar62 * 8);
                          dVar82 = *(double *)(lVar53 + lVar62 * 8);
                          lVar65 = (iVar16 - local_be8.begin.z) * lVar37;
                          dVar83 = *(double *)(lVar39 + lVar65 * 8);
                          lVar62 = (local_c40 - local_be8.begin.z) * lVar37 * 8;
                          dVar84 = *(double *)(lVar53 + lVar65 * 8);
                          lVar53 = ((long)local_c60 - (long)local_be8.begin.y) * lVar19 * 8;
                          dVar68 = *(double *)(lVar62 + lVar53 + lVar55 * -8 + lVar54 + lVar32 * 8);
                          lVar39 = (long)((int)local_c48 - local_be8.begin.y) * lVar19 * 8;
                          dVar69 = *(double *)(lVar62 + lVar39 + lVar55 * -8 + lVar54 + lVar32 * 8);
                          lVar19 = (lVar18 - local_be8.begin.z) * lVar37 * 8;
                          dVar70 = *(double *)(lVar53 + lVar19 + lVar55 * -8 + lVar54 + lVar32 * 8);
                          dVar71 = *(double *)(lVar19 + lVar39 + lVar55 * -8 + lVar54 + lVar32 * 8);
                          local_c78 = (double *)
                                      ((double)local_c78 +
                                      (((dVar84 - dVar82) +
                                       (dVar71 - dVar69) + (dVar71 - dVar69) +
                                       (dVar70 - dVar68) * 4.0 +
                                       (dVar83 - dVar81) + (dVar83 - dVar81)) * dVar93 +
                                      ((dVar84 - dVar71) +
                                      (dVar83 - dVar70) + (dVar83 - dVar70) +
                                      (dVar81 - dVar68) * 4.0 +
                                      (dVar82 - dVar69) + (dVar82 - dVar69)) * dVar91 +
                                      ((dVar84 - dVar83) +
                                      (dVar71 - dVar70) + (dVar71 - dVar70) +
                                      (dVar69 - dVar68) * 4.0 +
                                      (dVar82 - dVar81) + (dVar82 - dVar81)) * dVar92) * dVar79);
                        }
                        bVar13 = Box::contains(&bx_2,iVar26,iVar17,iVar16);
                        if (bVar13) {
                          lVar55 = (long)local_be8.begin.x;
                          lVar53 = (long)((iVar26 - local_be8.begin.x) + 1);
                          lVar54 = CONCAT44(local_be8.p._4_4_,(int)local_be8.p);
                          lVar19 = CONCAT44(local_be8.jstride._4_4_,(int)local_be8.jstride);
                          lVar39 = lVar54 + (iVar17 - local_be8.begin.y) * lVar19 * 8 + lVar53 * 8;
                          lVar53 = lVar54 + (iVar23 - local_be8.begin.y) * lVar19 * 8 + lVar53 * 8;
                          lVar37 = CONCAT44(local_be8.kstride._4_4_,(int)local_be8.kstride);
                          lVar62 = (iVar61 - local_be8.begin.z) * lVar37;
                          dVar81 = *(double *)(lVar39 + lVar62 * 8);
                          dVar82 = *(double *)(lVar53 + lVar62 * 8);
                          lVar65 = (iVar16 - local_be8.begin.z) * lVar37;
                          dVar83 = *(double *)(lVar39 + lVar65 * 8);
                          lVar62 = (local_c40 - local_be8.begin.z) * lVar37 * 8;
                          dVar84 = *(double *)(lVar53 + lVar65 * 8);
                          lVar53 = ((long)local_c60 - (long)local_be8.begin.y) * lVar19 * 8;
                          dVar68 = *(double *)(lVar62 + lVar53 + lVar55 * -8 + lVar54 + lVar32 * 8);
                          lVar39 = (long)((int)local_c48 - local_be8.begin.y) * lVar19 * 8;
                          dVar69 = *(double *)(lVar62 + lVar39 + lVar55 * -8 + lVar54 + lVar32 * 8);
                          lVar19 = (lVar18 - local_be8.begin.z) * lVar37 * 8;
                          dVar70 = *(double *)(lVar53 + lVar19 + lVar55 * -8 + lVar54 + lVar32 * 8);
                          dVar71 = *(double *)(lVar19 + lVar39 + lVar55 * -8 + lVar54 + lVar32 * 8);
                          local_c78 = (double *)
                                      ((double)local_c78 +
                                      (((dVar84 - dVar82) +
                                       (dVar71 - dVar69) + (dVar71 - dVar69) +
                                       (dVar70 - dVar68) * 4.0 +
                                       (dVar83 - dVar81) + (dVar83 - dVar81)) * dVar93 +
                                      ((dVar84 - dVar71) +
                                      (dVar83 - dVar70) + (dVar83 - dVar70) +
                                      (dVar81 - dVar68) * 4.0 +
                                      (dVar82 - dVar69) + (dVar82 - dVar69)) * dVar91 +
                                      ((dVar84 - dVar83) +
                                      (dVar71 - dVar70) + (dVar71 - dVar70) +
                                      (dVar69 - dVar68) * 4.0 +
                                      (dVar82 - dVar81) + (dVar82 - dVar81)) * dVar92) * dVar79);
                        }
                        bVar13 = Box::contains(&bx_2,iVar48,iVar22,iVar61);
                        if (bVar13) {
                          lVar55 = (long)local_be8.begin.x;
                          lVar54 = CONCAT44(local_be8.p._4_4_,(int)local_be8.p);
                          lVar19 = CONCAT44(local_be8.jstride._4_4_,(int)local_be8.jstride);
                          lVar39 = lVar54 + (iVar17 - local_be8.begin.y) * lVar19 * 8 +
                                   (long)(~local_be8.begin.x + iVar26) * 8;
                          lVar53 = lVar54 + (iVar22 - local_be8.begin.y) * lVar19 * 8 +
                                   (long)(~local_be8.begin.x + iVar26) * 8;
                          lVar37 = CONCAT44(local_be8.kstride._4_4_,(int)local_be8.kstride);
                          lVar62 = (iVar61 - local_be8.begin.z) * lVar37;
                          dVar81 = *(double *)(lVar39 + lVar62 * 8);
                          dVar82 = *(double *)(lVar53 + lVar62 * 8);
                          lVar62 = (iVar51 - local_be8.begin.z) * lVar37;
                          dVar83 = *(double *)(lVar39 + lVar62 * 8);
                          lVar39 = (local_c40 - local_be8.begin.z) * lVar37 * 8;
                          dVar84 = *(double *)(lVar53 + lVar62 * 8);
                          lVar53 = ((long)local_c60 - (long)local_be8.begin.y) * lVar19 * 8;
                          dVar68 = *(double *)(lVar39 + lVar53 + lVar55 * -8 + lVar54 + lVar32 * 8);
                          lVar19 = (lVar20 - local_be8.begin.y) * lVar19 * 8;
                          dVar69 = *(double *)(lVar39 + lVar19 + lVar55 * -8 + lVar54 + lVar32 * 8);
                          lVar39 = (long)(iVar15 - local_be8.begin.z) * lVar37 * 8;
                          dVar70 = *(double *)(lVar53 + lVar39 + lVar55 * -8 + lVar54 + lVar32 * 8);
                          dVar71 = *(double *)(lVar39 + lVar19 + lVar55 * -8 + lVar54 + lVar32 * 8);
                          local_c78 = (double *)
                                      ((double)local_c78 +
                                      (((dVar84 - dVar82) +
                                       (dVar71 - dVar69) + (dVar71 - dVar69) +
                                       (dVar70 - dVar68) * 4.0 +
                                       (dVar83 - dVar81) + (dVar83 - dVar81)) * dVar93 +
                                      ((dVar84 - dVar71) +
                                      (dVar83 - dVar70) + (dVar83 - dVar70) +
                                      (dVar81 - dVar68) * 4.0 +
                                      (dVar82 - dVar69) + (dVar82 - dVar69)) * dVar91 +
                                      ((dVar84 - dVar83) +
                                      (dVar71 - dVar70) + (dVar71 - dVar70) +
                                      (dVar69 - dVar68) * 4.0 +
                                      (dVar82 - dVar81) + (dVar82 - dVar81)) * dVar92) * dVar79);
                        }
                        bVar13 = Box::contains(&bx_2,iVar26,iVar22,iVar61);
                        if (bVar13) {
                          lVar55 = (long)local_be8.begin.x;
                          lVar53 = (long)((iVar26 - local_be8.begin.x) + 1);
                          lVar54 = CONCAT44(local_be8.p._4_4_,(int)local_be8.p);
                          lVar19 = CONCAT44(local_be8.jstride._4_4_,(int)local_be8.jstride);
                          lVar39 = lVar54 + (iVar17 - local_be8.begin.y) * lVar19 * 8 + lVar53 * 8;
                          lVar53 = lVar54 + (iVar22 - local_be8.begin.y) * lVar19 * 8 + lVar53 * 8;
                          lVar37 = CONCAT44(local_be8.kstride._4_4_,(int)local_be8.kstride);
                          lVar62 = (iVar61 - local_be8.begin.z) * lVar37;
                          dVar81 = *(double *)(lVar39 + lVar62 * 8);
                          dVar82 = *(double *)(lVar53 + lVar62 * 8);
                          lVar62 = (iVar51 - local_be8.begin.z) * lVar37;
                          dVar83 = *(double *)(lVar39 + lVar62 * 8);
                          lVar39 = (local_c40 - local_be8.begin.z) * lVar37 * 8;
                          dVar84 = *(double *)(lVar53 + lVar62 * 8);
                          lVar53 = ((long)local_c60 - (long)local_be8.begin.y) * lVar19 * 8;
                          dVar68 = *(double *)(lVar39 + lVar53 + lVar55 * -8 + lVar54 + lVar32 * 8);
                          lVar19 = (lVar20 - local_be8.begin.y) * lVar19 * 8;
                          dVar69 = *(double *)(lVar39 + lVar19 + lVar55 * -8 + lVar54 + lVar32 * 8);
                          lVar39 = (long)(iVar15 - local_be8.begin.z) * lVar37 * 8;
                          dVar70 = *(double *)(lVar53 + lVar39 + lVar55 * -8 + lVar54 + lVar32 * 8);
                          dVar71 = *(double *)(lVar39 + lVar19 + lVar55 * -8 + lVar54 + lVar32 * 8);
                          local_c78 = (double *)
                                      ((double)local_c78 +
                                      (((dVar84 - dVar82) +
                                       (dVar71 - dVar69) + (dVar71 - dVar69) +
                                       (dVar70 - dVar68) * 4.0 +
                                       (dVar83 - dVar81) + (dVar83 - dVar81)) * dVar93 +
                                      ((dVar84 - dVar71) +
                                      (dVar83 - dVar70) + (dVar83 - dVar70) +
                                      (dVar81 - dVar68) * 4.0 +
                                      (dVar82 - dVar69) + (dVar82 - dVar69)) * dVar91 +
                                      ((dVar84 - dVar83) +
                                      (dVar71 - dVar70) + (dVar71 - dVar70) +
                                      (dVar69 - dVar68) * 4.0 +
                                      (dVar82 - dVar81) + (dVar82 - dVar81)) * dVar92) * dVar79);
                        }
                        bVar13 = Box::contains(&bx_2,iVar48,iVar17,iVar61);
                        if (bVar13) {
                          lVar55 = (long)local_be8.begin.x;
                          lVar54 = CONCAT44(local_be8.p._4_4_,(int)local_be8.p);
                          lVar19 = CONCAT44(local_be8.jstride._4_4_,(int)local_be8.jstride);
                          lVar39 = lVar54 + (iVar17 - local_be8.begin.y) * lVar19 * 8 +
                                   (long)(~local_be8.begin.x + iVar26) * 8;
                          lVar53 = lVar54 + (iVar23 - local_be8.begin.y) * lVar19 * 8 +
                                   (long)(~local_be8.begin.x + iVar26) * 8;
                          lVar37 = CONCAT44(local_be8.kstride._4_4_,(int)local_be8.kstride);
                          lVar62 = (iVar61 - local_be8.begin.z) * lVar37;
                          dVar81 = *(double *)(lVar39 + lVar62 * 8);
                          dVar82 = *(double *)(lVar53 + lVar62 * 8);
                          lVar62 = (iVar51 - local_be8.begin.z) * lVar37;
                          dVar83 = *(double *)(lVar39 + lVar62 * 8);
                          lVar65 = (local_c40 - local_be8.begin.z) * lVar37 * 8;
                          dVar84 = *(double *)(lVar53 + lVar62 * 8);
                          lVar62 = ((long)local_c60 - (long)local_be8.begin.y) * lVar19 * 8;
                          dVar68 = *(double *)(lVar65 + lVar62 + lVar55 * -8 + lVar54 + lVar32 * 8);
                          lVar39 = (long)((int)local_c48 - local_be8.begin.y) * lVar19 * 8;
                          dVar69 = *(double *)(lVar65 + lVar39 + lVar55 * -8 + lVar54 + lVar32 * 8);
                          lVar53 = (long)(iVar15 - local_be8.begin.z) * lVar37 * 8;
                          dVar70 = *(double *)(lVar62 + lVar53 + lVar55 * -8 + lVar54 + lVar32 * 8);
                          dVar71 = *(double *)(lVar53 + lVar39 + lVar55 * -8 + lVar54 + lVar32 * 8);
                          local_c78 = (double *)
                                      ((double)local_c78 +
                                      (((dVar84 - dVar82) +
                                       (dVar71 - dVar69) + (dVar71 - dVar69) +
                                       (dVar70 - dVar68) * 4.0 +
                                       (dVar83 - dVar81) + (dVar83 - dVar81)) * dVar93 +
                                      ((dVar84 - dVar71) +
                                      (dVar83 - dVar70) + (dVar83 - dVar70) +
                                      (dVar81 - dVar68) * 4.0 +
                                      (dVar82 - dVar69) + (dVar82 - dVar69)) * dVar91 +
                                      ((dVar84 - dVar83) +
                                      (dVar71 - dVar70) + (dVar71 - dVar70) +
                                      (dVar69 - dVar68) * 4.0 +
                                      (dVar82 - dVar81) + (dVar82 - dVar81)) * dVar92) * dVar79);
                        }
                        bVar13 = Box::contains(&bx_2,iVar26,iVar17,iVar61);
                        dVar81 = local_ac8;
                        if (bVar13) {
                          lVar55 = (long)local_be8.begin.x;
                          lVar53 = (long)((iVar26 - local_be8.begin.x) + 1);
                          lVar54 = CONCAT44(local_be8.p._4_4_,(int)local_be8.p);
                          lVar19 = CONCAT44(local_be8.jstride._4_4_,(int)local_be8.jstride);
                          lVar39 = lVar54 + (iVar17 - local_be8.begin.y) * lVar19 * 8 + lVar53 * 8;
                          lVar53 = lVar54 + (iVar23 - local_be8.begin.y) * lVar19 * 8 + lVar53 * 8;
                          lVar37 = CONCAT44(local_be8.kstride._4_4_,(int)local_be8.kstride);
                          lVar62 = (iVar61 - local_be8.begin.z) * lVar37;
                          dVar82 = *(double *)(lVar39 + lVar62 * 8);
                          dVar83 = *(double *)(lVar53 + lVar62 * 8);
                          lVar62 = (iVar51 - local_be8.begin.z) * lVar37;
                          dVar84 = *(double *)(lVar39 + lVar62 * 8);
                          lVar65 = (local_c40 - local_be8.begin.z) * lVar37 * 8;
                          dVar68 = *(double *)(lVar53 + lVar62 * 8);
                          lVar62 = ((long)local_c60 - (long)local_be8.begin.y) * lVar19 * 8;
                          dVar69 = *(double *)(lVar65 + lVar62 + lVar55 * -8 + lVar54 + lVar32 * 8);
                          lVar39 = (long)((int)local_c48 - local_be8.begin.y) * lVar19 * 8;
                          dVar70 = *(double *)(lVar65 + lVar39 + lVar55 * -8 + lVar54 + lVar32 * 8);
                          lVar53 = (long)(iVar15 - local_be8.begin.z) * lVar37 * 8;
                          dVar71 = *(double *)(lVar62 + lVar53 + lVar55 * -8 + lVar54 + lVar32 * 8);
                          dVar72 = *(double *)(lVar53 + lVar39 + lVar55 * -8 + lVar54 + lVar32 * 8);
                          local_c78 = (double *)
                                      ((double)local_c78 +
                                      (((dVar68 - dVar83) +
                                       (dVar72 - dVar70) + (dVar72 - dVar70) +
                                       (dVar71 - dVar69) * 4.0 +
                                       (dVar84 - dVar82) + (dVar84 - dVar82)) * dVar93 +
                                      ((dVar68 - dVar72) +
                                      (dVar84 - dVar71) + (dVar84 - dVar71) +
                                      (dVar82 - dVar69) * 4.0 +
                                      (dVar83 - dVar70) + (dVar83 - dVar70)) * dVar91 +
                                      ((dVar68 - dVar84) +
                                      (dVar72 - dVar71) + (dVar72 - dVar71) +
                                      (dVar70 - dVar69) * 4.0 +
                                      (dVar83 - dVar82) + (dVar83 - dVar82)) * dVar92) * dVar79);
                        }
                      }
                      dVar80 = dVar80 + (double)((iVar36 + 2) * local_af8._0_4_) * (double)local_c78
                      ;
                      lVar32 = lVar32 + 1;
                      iVar14 = iVar14 + -1;
                    }
                    iVar22 = local_ad8._0_4_ + 1;
                    local_c60 = (double *)((long)local_c60 + 1);
                    local_c48 = (ulong)((int)local_c48 + 1);
                    iVar17 = iVar23;
                  }
                  iVar16 = local_b90._0_4_ + 1;
                  local_c40 = local_c40 + 1;
                  iVar61 = iVar51;
                }
                dVar80 = dVar80 * 0.015625;
                uVar28 = (ulong)local_a58 & 0xffffffff;
                puVar47 = local_9b8;
                pFVar49 = local_b60;
                puVar46 = local_a08;
                pdVar66 = local_a40;
                iVar17 = (int)local_b68;
                iVar22 = (int)local_b00;
                iVar61 = (int)local_a98;
              }
              *(double *)
               (((long)local_a48 - (long)mfi_2.beginIndex) *
                CONCAT44(mfi_2.fabArray._4_4_,(int)mfi_2.fabArray) * 8 +
                CONCAT44(mfi_2.m_fa._M_t.
                         super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                         .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_,
                         (int)mfi_2.m_fa._M_t.
                              super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                              .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl) +
                ((long)pdVar66 - (long)mfi_2.currentIndex) * 8 +
               ((long)local_a50 - (long)mfi_2.endIndex) *
               CONCAT44(mfi_2.tile_size.vect[1],mfi_2.tile_size.vect[0]) * 8) = dVar80;
              uVar63 = (ulong)(iVar61 + 1);
              iVar22 = iVar22 + 2;
              iVar17 = iVar17 + 2;
            }
            uVar28 = (ulong)((int)uVar28 + 1);
            local_aa0 = CONCAT44(local_aa0._4_4_,(int)local_aa0 + 2);
          }
          puVar46 = (pointer)(ulong)((int)puVar46 + 1);
          local_aa8 = (double *)CONCAT44(local_aa8._4_4_,(int)local_aa8 + 2);
        }
      }
      else {
        local_a20 = (double *)CONCAT44(local_a20._4_4_,(uint)local_560.p * 4);
        local_9f0 = CONCAT44(local_9f0._4_4_,(uint)local_560.p * 4 + -3);
        local_aa8 = (double *)CONCAT44(local_aa8._4_4_,(uint)local_560.jstride * 4 + -3);
        iVar24 = local_560.p._4_4_ * 4;
        while( true ) {
          if ((int)local_a70 < (int)puVar46) break;
          local_a10 = (long)(int)local_aa8;
          local_a50 = (double *)(long)(int)puVar46;
          local_b78 = (double *)((long)local_a50 * 4);
          local_a18 = (double *)CONCAT44(local_a18._4_4_,(int)local_b78 + -3);
          local_9e8 = (double *)CONCAT44(local_9e8._4_4_,(int)local_b78 + 3);
          local_aa0 = CONCAT44(local_aa0._4_4_,iVar24 + -3);
          uVar28 = (ulong)pFVar49 & 0xffffffff;
          local_a08 = puVar46;
          while( true ) {
            iVar22 = (int)uVar28;
            if ((int)local_ab8 < iVar22) break;
            local_a60 = (double *)(long)(int)local_aa0;
            local_a48 = (double *)(long)iVar22;
            local_ba0 = (_func_int **)((long)local_a48 * 4);
            local_ab0 = CONCAT44(local_ab0._4_4_,(int)local_ba0 + -3);
            local_a68 = CONCAT44(local_a68._4_4_,(int)local_ba0 + 3);
            uVar63 = (ulong)puVar47 & 0xffffffff;
            local_a58 = (double *)CONCAT44(local_a58._4_4_,iVar22);
            iVar17 = (int)local_a20;
            iVar22 = (int)local_9f0;
            while( true ) {
              iVar61 = (int)uVar63;
              if ((int)local_b58 < iVar61) break;
              pdVar66 = (double *)(long)iVar61;
              if (local_818.p
                  [((long)local_ba0 - (long)local_818.begin.y) * local_818.jstride +
                   ((long)pdVar66 * 4 - (long)local_818.begin.x) +
                   ((long)local_b78 - (long)local_818.begin.z) * local_818.kstride] == 0) {
                dVar80 = 0.0;
              }
              else {
                local_a98 = CONCAT44(local_a98._4_4_,iVar61);
                local_b00 = (undefined8 *)CONCAT44(local_b00._4_4_,iVar22);
                uVar57 = (uint)((long)pdVar66 * 4) | 3;
                if (result.bigend.vect[0] < (int)uVar57) {
                  uVar57 = result.bigend.vect[0];
                }
                dVar81 = (double)(ulong)uVar57;
                iVar61 = result.smallend.vect[1];
                if (result.smallend.vect[1] < (int)local_ab0) {
                  iVar61 = (int)local_ab0;
                }
                local_b70 = (double *)CONCAT44(local_b70._4_4_,iVar61);
                iVar61 = result.bigend.vect[1];
                if ((int)local_a68 <= result.bigend.vect[1]) {
                  iVar61 = (int)local_a68;
                }
                local_ae8 = (double *)CONCAT44(local_ae8._4_4_,iVar61);
                iVar61 = result.smallend.vect[2];
                if (result.smallend.vect[2] < (int)local_a18) {
                  iVar61 = (int)local_a18;
                }
                iVar15 = result.bigend.vect[2];
                if ((int)local_9e8 <= result.bigend.vect[2]) {
                  iVar15 = (int)local_9e8;
                }
                local_ba8 = CONCAT44(local_ba8._4_4_,iVar15);
                local_b80 = (long)result.smallend.vect[0];
                if ((long)result.smallend.vect[0] <= (long)iVar22) {
                  local_b80 = (long)iVar22;
                }
                iVar15 = (int)local_a10;
                if ((int)local_a10 < result.smallend.vect[2]) {
                  iVar15 = result.smallend.vect[2];
                }
                iVar16 = iVar15 + -1;
                iVar51 = (int)local_a60;
                if ((int)local_a60 < result.smallend.vect[1]) {
                  iVar51 = result.smallend.vect[1];
                }
                local_a38 = (double)CONCAT44(local_a38._4_4_,iVar51 + -1);
                local_c40 = (long)result.smallend.vect[2];
                if (result.smallend.vect[2] <= local_a10) {
                  local_c40 = local_a10;
                }
                local_b50 = (double *)(long)result.smallend.vect[1];
                if ((long)result.smallend.vect[1] <= (long)local_a60) {
                  local_b50 = local_a60;
                }
                local_a88 = (double *)(ulong)(iVar51 + 1);
                if (iVar22 < result.smallend.vect[0]) {
                  iVar22 = result.smallend.vect[0];
                }
                local_b68 = (pointer)CONCAT44(local_b68._4_4_,iVar17);
                local_b88 = (double)CONCAT44(local_b88._4_4_,iVar17 - iVar22);
                dVar80 = 0.0;
                local_ac8 = dVar81;
                local_a40 = pdVar66;
                while( true ) {
                  iVar15 = iVar15 + 1;
                  if ((int)local_ba8 < iVar61) break;
                  iVar17 = (int)local_b78 - iVar61;
                  iVar22 = -iVar17;
                  if (iVar17 < 1) {
                    iVar22 = iVar17;
                  }
                  local_b90 = (double)CONCAT44(local_b90._4_4_,iVar16);
                  lVar18 = (long)iVar16;
                  local_b98 = (double *)CONCAT44(local_b98._4_4_,iVar22 + 4);
                  iVar16 = iVar61 + -1;
                  iVar51 = iVar61 + 1;
                  local_c48 = (ulong)local_a88 & 0xffffffff;
                  local_c60 = local_b50;
                  iVar22 = local_a38._0_4_;
                  iVar17 = (int)local_b70;
                  while (iVar17 <= (int)local_ae8) {
                    local_ad8 = (double)CONCAT44(local_ad8._4_4_,iVar22);
                    lVar20 = (long)iVar22;
                    iVar23 = (int)local_ba0 - iVar17;
                    iVar22 = -iVar23;
                    if (iVar23 < 1) {
                      iVar22 = iVar23;
                    }
                    local_af8 = (double)CONCAT44(local_af8._4_4_,(iVar22 + 4) * (int)local_b98);
                    iVar22 = iVar17 + -1;
                    iVar23 = iVar17 + 1;
                    lVar32 = local_b80;
                    iVar14 = local_b88._0_4_;
                    while( true ) {
                      iVar26 = (int)lVar32;
                      if (SUB84(dVar81,0) < iVar26) break;
                      iVar36 = -iVar14;
                      if (iVar14 < 1) {
                        iVar36 = iVar14;
                      }
                      bVar13 = Box::strictly_contains(&result,iVar26,iVar17,iVar61);
                      if (bVar13) {
                        local_c78 = (double *)
                                    (local_b48.p
                                     [((local_c40 - local_b48.begin.z) * local_b48.kstride +
                                      ((long)local_c60 - (long)local_b48.begin.y) *
                                      local_b48.jstride + lVar32) - (long)local_b48.begin.x] -
                                    (double)local_968.p
                                            [((local_c40 - local_968.begin.z) * local_968.kstride +
                                             ((long)local_c60 - (long)local_968.begin.y) *
                                             local_968.jstride + lVar32) - (long)local_968.begin.x])
                        ;
                      }
                      else {
                        iVar48 = iVar26 + -1;
                        bVar13 = Box::contains(&bx_2,iVar48,iVar22,iVar16);
                        local_c78 = (double *)0x0;
                        if (bVar13) {
                          lVar55 = (long)local_be8.begin.x;
                          lVar54 = CONCAT44(local_be8.p._4_4_,(int)local_be8.p);
                          lVar19 = CONCAT44(local_be8.jstride._4_4_,(int)local_be8.jstride);
                          lVar39 = lVar54 + (iVar17 - local_be8.begin.y) * lVar19 * 8 +
                                   (long)(~local_be8.begin.x + iVar26) * 8;
                          lVar53 = lVar54 + (iVar22 - local_be8.begin.y) * lVar19 * 8 +
                                   (long)(~local_be8.begin.x + iVar26) * 8;
                          lVar37 = CONCAT44(local_be8.kstride._4_4_,(int)local_be8.kstride);
                          lVar62 = (iVar61 - local_be8.begin.z) * lVar37;
                          dVar81 = *(double *)(lVar39 + lVar62 * 8);
                          dVar82 = *(double *)(lVar53 + lVar62 * 8);
                          lVar62 = (iVar16 - local_be8.begin.z) * lVar37;
                          dVar83 = *(double *)(lVar39 + lVar62 * 8);
                          lVar39 = (local_c40 - local_be8.begin.z) * lVar37 * 8;
                          dVar84 = *(double *)(lVar53 + lVar62 * 8);
                          lVar53 = ((long)local_c60 - (long)local_be8.begin.y) * lVar19 * 8;
                          dVar68 = *(double *)(lVar39 + lVar53 + lVar55 * -8 + lVar54 + lVar32 * 8);
                          lVar19 = (lVar20 - local_be8.begin.y) * lVar19 * 8;
                          dVar69 = *(double *)(lVar39 + lVar19 + lVar55 * -8 + lVar54 + lVar32 * 8);
                          lVar39 = (lVar18 - local_be8.begin.z) * lVar37 * 8;
                          dVar70 = *(double *)(lVar53 + lVar39 + lVar55 * -8 + lVar54 + lVar32 * 8);
                          dVar71 = *(double *)(lVar39 + lVar19 + lVar55 * -8 + lVar54 + lVar32 * 8);
                          local_c78 = (double *)
                                      ((((dVar84 - dVar82) +
                                        (dVar71 - dVar69) + (dVar71 - dVar69) +
                                        (dVar70 - dVar68) * 4.0 +
                                        (dVar83 - dVar81) + (dVar83 - dVar81)) * dVar93 +
                                       ((dVar84 - dVar71) +
                                       (dVar83 - dVar70) + (dVar83 - dVar70) +
                                       (dVar81 - dVar68) * 4.0 +
                                       (dVar82 - dVar69) + (dVar82 - dVar69)) * dVar91 +
                                       ((dVar84 - dVar83) +
                                       (dVar71 - dVar70) + (dVar71 - dVar70) +
                                       (dVar69 - dVar68) * 4.0 +
                                       (dVar82 - dVar81) + (dVar82 - dVar81)) * dVar92) * dVar79 +
                                      0.0);
                        }
                        bVar13 = Box::contains(&bx_2,iVar26,iVar22,iVar16);
                        if (bVar13) {
                          lVar55 = (long)local_be8.begin.x;
                          lVar53 = (long)((iVar26 - local_be8.begin.x) + 1);
                          lVar54 = CONCAT44(local_be8.p._4_4_,(int)local_be8.p);
                          lVar19 = CONCAT44(local_be8.jstride._4_4_,(int)local_be8.jstride);
                          lVar39 = lVar54 + (iVar17 - local_be8.begin.y) * lVar19 * 8 + lVar53 * 8;
                          lVar53 = lVar54 + (iVar22 - local_be8.begin.y) * lVar19 * 8 + lVar53 * 8;
                          lVar37 = CONCAT44(local_be8.kstride._4_4_,(int)local_be8.kstride);
                          lVar62 = (iVar61 - local_be8.begin.z) * lVar37;
                          dVar81 = *(double *)(lVar39 + lVar62 * 8);
                          dVar82 = *(double *)(lVar53 + lVar62 * 8);
                          lVar62 = (iVar16 - local_be8.begin.z) * lVar37;
                          dVar83 = *(double *)(lVar39 + lVar62 * 8);
                          lVar39 = (local_c40 - local_be8.begin.z) * lVar37 * 8;
                          dVar84 = *(double *)(lVar53 + lVar62 * 8);
                          lVar53 = ((long)local_c60 - (long)local_be8.begin.y) * lVar19 * 8;
                          dVar68 = *(double *)(lVar39 + lVar53 + lVar55 * -8 + lVar54 + lVar32 * 8);
                          lVar19 = (lVar20 - local_be8.begin.y) * lVar19 * 8;
                          dVar69 = *(double *)(lVar39 + lVar19 + lVar55 * -8 + lVar54 + lVar32 * 8);
                          lVar39 = (lVar18 - local_be8.begin.z) * lVar37 * 8;
                          dVar70 = *(double *)(lVar53 + lVar39 + lVar55 * -8 + lVar54 + lVar32 * 8);
                          dVar71 = *(double *)(lVar39 + lVar19 + lVar55 * -8 + lVar54 + lVar32 * 8);
                          local_c78 = (double *)
                                      ((double)local_c78 +
                                      (((dVar84 - dVar82) +
                                       (dVar71 - dVar69) + (dVar71 - dVar69) +
                                       (dVar70 - dVar68) * 4.0 +
                                       (dVar83 - dVar81) + (dVar83 - dVar81)) * dVar93 +
                                      ((dVar84 - dVar71) +
                                      (dVar83 - dVar70) + (dVar83 - dVar70) +
                                      (dVar81 - dVar68) * 4.0 +
                                      (dVar82 - dVar69) + (dVar82 - dVar69)) * dVar91 +
                                      ((dVar84 - dVar83) +
                                      (dVar71 - dVar70) + (dVar71 - dVar70) +
                                      (dVar69 - dVar68) * 4.0 +
                                      (dVar82 - dVar81) + (dVar82 - dVar81)) * dVar92) * dVar79);
                        }
                        bVar13 = Box::contains(&bx_2,iVar48,iVar17,iVar16);
                        if (bVar13) {
                          lVar55 = (long)local_be8.begin.x;
                          lVar54 = CONCAT44(local_be8.p._4_4_,(int)local_be8.p);
                          lVar19 = CONCAT44(local_be8.jstride._4_4_,(int)local_be8.jstride);
                          lVar39 = lVar54 + (iVar17 - local_be8.begin.y) * lVar19 * 8 +
                                   (long)(~local_be8.begin.x + iVar26) * 8;
                          lVar53 = lVar54 + (iVar23 - local_be8.begin.y) * lVar19 * 8 +
                                   (long)(~local_be8.begin.x + iVar26) * 8;
                          lVar37 = CONCAT44(local_be8.kstride._4_4_,(int)local_be8.kstride);
                          lVar62 = (iVar61 - local_be8.begin.z) * lVar37;
                          dVar81 = *(double *)(lVar39 + lVar62 * 8);
                          dVar82 = *(double *)(lVar53 + lVar62 * 8);
                          lVar65 = (iVar16 - local_be8.begin.z) * lVar37;
                          dVar83 = *(double *)(lVar39 + lVar65 * 8);
                          lVar62 = (local_c40 - local_be8.begin.z) * lVar37 * 8;
                          dVar84 = *(double *)(lVar53 + lVar65 * 8);
                          lVar53 = ((long)local_c60 - (long)local_be8.begin.y) * lVar19 * 8;
                          dVar68 = *(double *)(lVar62 + lVar53 + lVar55 * -8 + lVar54 + lVar32 * 8);
                          lVar39 = (long)((int)local_c48 - local_be8.begin.y) * lVar19 * 8;
                          dVar69 = *(double *)(lVar62 + lVar39 + lVar55 * -8 + lVar54 + lVar32 * 8);
                          lVar19 = (lVar18 - local_be8.begin.z) * lVar37 * 8;
                          dVar70 = *(double *)(lVar53 + lVar19 + lVar55 * -8 + lVar54 + lVar32 * 8);
                          dVar71 = *(double *)(lVar19 + lVar39 + lVar55 * -8 + lVar54 + lVar32 * 8);
                          local_c78 = (double *)
                                      ((double)local_c78 +
                                      (((dVar84 - dVar82) +
                                       (dVar71 - dVar69) + (dVar71 - dVar69) +
                                       (dVar70 - dVar68) * 4.0 +
                                       (dVar83 - dVar81) + (dVar83 - dVar81)) * dVar93 +
                                      ((dVar84 - dVar71) +
                                      (dVar83 - dVar70) + (dVar83 - dVar70) +
                                      (dVar81 - dVar68) * 4.0 +
                                      (dVar82 - dVar69) + (dVar82 - dVar69)) * dVar91 +
                                      ((dVar84 - dVar83) +
                                      (dVar71 - dVar70) + (dVar71 - dVar70) +
                                      (dVar69 - dVar68) * 4.0 +
                                      (dVar82 - dVar81) + (dVar82 - dVar81)) * dVar92) * dVar79);
                        }
                        bVar13 = Box::contains(&bx_2,iVar26,iVar17,iVar16);
                        if (bVar13) {
                          lVar55 = (long)local_be8.begin.x;
                          lVar53 = (long)((iVar26 - local_be8.begin.x) + 1);
                          lVar54 = CONCAT44(local_be8.p._4_4_,(int)local_be8.p);
                          lVar19 = CONCAT44(local_be8.jstride._4_4_,(int)local_be8.jstride);
                          lVar39 = lVar54 + (iVar17 - local_be8.begin.y) * lVar19 * 8 + lVar53 * 8;
                          lVar53 = lVar54 + (iVar23 - local_be8.begin.y) * lVar19 * 8 + lVar53 * 8;
                          lVar37 = CONCAT44(local_be8.kstride._4_4_,(int)local_be8.kstride);
                          lVar62 = (iVar61 - local_be8.begin.z) * lVar37;
                          dVar81 = *(double *)(lVar39 + lVar62 * 8);
                          dVar82 = *(double *)(lVar53 + lVar62 * 8);
                          lVar65 = (iVar16 - local_be8.begin.z) * lVar37;
                          dVar83 = *(double *)(lVar39 + lVar65 * 8);
                          lVar62 = (local_c40 - local_be8.begin.z) * lVar37 * 8;
                          dVar84 = *(double *)(lVar53 + lVar65 * 8);
                          lVar53 = ((long)local_c60 - (long)local_be8.begin.y) * lVar19 * 8;
                          dVar68 = *(double *)(lVar62 + lVar53 + lVar55 * -8 + lVar54 + lVar32 * 8);
                          lVar39 = (long)((int)local_c48 - local_be8.begin.y) * lVar19 * 8;
                          dVar69 = *(double *)(lVar62 + lVar39 + lVar55 * -8 + lVar54 + lVar32 * 8);
                          lVar19 = (lVar18 - local_be8.begin.z) * lVar37 * 8;
                          dVar70 = *(double *)(lVar53 + lVar19 + lVar55 * -8 + lVar54 + lVar32 * 8);
                          dVar71 = *(double *)(lVar19 + lVar39 + lVar55 * -8 + lVar54 + lVar32 * 8);
                          local_c78 = (double *)
                                      ((double)local_c78 +
                                      (((dVar84 - dVar82) +
                                       (dVar71 - dVar69) + (dVar71 - dVar69) +
                                       (dVar70 - dVar68) * 4.0 +
                                       (dVar83 - dVar81) + (dVar83 - dVar81)) * dVar93 +
                                      ((dVar84 - dVar71) +
                                      (dVar83 - dVar70) + (dVar83 - dVar70) +
                                      (dVar81 - dVar68) * 4.0 +
                                      (dVar82 - dVar69) + (dVar82 - dVar69)) * dVar91 +
                                      ((dVar84 - dVar83) +
                                      (dVar71 - dVar70) + (dVar71 - dVar70) +
                                      (dVar69 - dVar68) * 4.0 +
                                      (dVar82 - dVar81) + (dVar82 - dVar81)) * dVar92) * dVar79);
                        }
                        bVar13 = Box::contains(&bx_2,iVar48,iVar22,iVar61);
                        if (bVar13) {
                          lVar55 = (long)local_be8.begin.x;
                          lVar54 = CONCAT44(local_be8.p._4_4_,(int)local_be8.p);
                          lVar19 = CONCAT44(local_be8.jstride._4_4_,(int)local_be8.jstride);
                          lVar39 = lVar54 + (iVar17 - local_be8.begin.y) * lVar19 * 8 +
                                   (long)(~local_be8.begin.x + iVar26) * 8;
                          lVar53 = lVar54 + (iVar22 - local_be8.begin.y) * lVar19 * 8 +
                                   (long)(~local_be8.begin.x + iVar26) * 8;
                          lVar37 = CONCAT44(local_be8.kstride._4_4_,(int)local_be8.kstride);
                          lVar62 = (iVar61 - local_be8.begin.z) * lVar37;
                          dVar81 = *(double *)(lVar39 + lVar62 * 8);
                          dVar82 = *(double *)(lVar53 + lVar62 * 8);
                          lVar62 = (iVar51 - local_be8.begin.z) * lVar37;
                          dVar83 = *(double *)(lVar39 + lVar62 * 8);
                          lVar39 = (local_c40 - local_be8.begin.z) * lVar37 * 8;
                          dVar84 = *(double *)(lVar53 + lVar62 * 8);
                          lVar53 = ((long)local_c60 - (long)local_be8.begin.y) * lVar19 * 8;
                          dVar68 = *(double *)(lVar39 + lVar53 + lVar55 * -8 + lVar54 + lVar32 * 8);
                          lVar19 = (lVar20 - local_be8.begin.y) * lVar19 * 8;
                          dVar69 = *(double *)(lVar39 + lVar19 + lVar55 * -8 + lVar54 + lVar32 * 8);
                          lVar39 = (long)(iVar15 - local_be8.begin.z) * lVar37 * 8;
                          dVar70 = *(double *)(lVar53 + lVar39 + lVar55 * -8 + lVar54 + lVar32 * 8);
                          dVar71 = *(double *)(lVar39 + lVar19 + lVar55 * -8 + lVar54 + lVar32 * 8);
                          local_c78 = (double *)
                                      ((double)local_c78 +
                                      (((dVar84 - dVar82) +
                                       (dVar71 - dVar69) + (dVar71 - dVar69) +
                                       (dVar70 - dVar68) * 4.0 +
                                       (dVar83 - dVar81) + (dVar83 - dVar81)) * dVar93 +
                                      ((dVar84 - dVar71) +
                                      (dVar83 - dVar70) + (dVar83 - dVar70) +
                                      (dVar81 - dVar68) * 4.0 +
                                      (dVar82 - dVar69) + (dVar82 - dVar69)) * dVar91 +
                                      ((dVar84 - dVar83) +
                                      (dVar71 - dVar70) + (dVar71 - dVar70) +
                                      (dVar69 - dVar68) * 4.0 +
                                      (dVar82 - dVar81) + (dVar82 - dVar81)) * dVar92) * dVar79);
                        }
                        bVar13 = Box::contains(&bx_2,iVar26,iVar22,iVar61);
                        if (bVar13) {
                          lVar55 = (long)local_be8.begin.x;
                          lVar53 = (long)((iVar26 - local_be8.begin.x) + 1);
                          lVar54 = CONCAT44(local_be8.p._4_4_,(int)local_be8.p);
                          lVar19 = CONCAT44(local_be8.jstride._4_4_,(int)local_be8.jstride);
                          lVar39 = lVar54 + (iVar17 - local_be8.begin.y) * lVar19 * 8 + lVar53 * 8;
                          lVar53 = lVar54 + (iVar22 - local_be8.begin.y) * lVar19 * 8 + lVar53 * 8;
                          lVar37 = CONCAT44(local_be8.kstride._4_4_,(int)local_be8.kstride);
                          lVar62 = (iVar61 - local_be8.begin.z) * lVar37;
                          dVar81 = *(double *)(lVar39 + lVar62 * 8);
                          dVar82 = *(double *)(lVar53 + lVar62 * 8);
                          lVar62 = (iVar51 - local_be8.begin.z) * lVar37;
                          dVar83 = *(double *)(lVar39 + lVar62 * 8);
                          lVar39 = (local_c40 - local_be8.begin.z) * lVar37 * 8;
                          dVar84 = *(double *)(lVar53 + lVar62 * 8);
                          lVar53 = ((long)local_c60 - (long)local_be8.begin.y) * lVar19 * 8;
                          dVar68 = *(double *)(lVar39 + lVar53 + lVar55 * -8 + lVar54 + lVar32 * 8);
                          lVar19 = (lVar20 - local_be8.begin.y) * lVar19 * 8;
                          dVar69 = *(double *)(lVar39 + lVar19 + lVar55 * -8 + lVar54 + lVar32 * 8);
                          lVar39 = (long)(iVar15 - local_be8.begin.z) * lVar37 * 8;
                          dVar70 = *(double *)(lVar53 + lVar39 + lVar55 * -8 + lVar54 + lVar32 * 8);
                          dVar71 = *(double *)(lVar39 + lVar19 + lVar55 * -8 + lVar54 + lVar32 * 8);
                          local_c78 = (double *)
                                      ((double)local_c78 +
                                      (((dVar84 - dVar82) +
                                       (dVar71 - dVar69) + (dVar71 - dVar69) +
                                       (dVar70 - dVar68) * 4.0 +
                                       (dVar83 - dVar81) + (dVar83 - dVar81)) * dVar93 +
                                      ((dVar84 - dVar71) +
                                      (dVar83 - dVar70) + (dVar83 - dVar70) +
                                      (dVar81 - dVar68) * 4.0 +
                                      (dVar82 - dVar69) + (dVar82 - dVar69)) * dVar91 +
                                      ((dVar84 - dVar83) +
                                      (dVar71 - dVar70) + (dVar71 - dVar70) +
                                      (dVar69 - dVar68) * 4.0 +
                                      (dVar82 - dVar81) + (dVar82 - dVar81)) * dVar92) * dVar79);
                        }
                        bVar13 = Box::contains(&bx_2,iVar48,iVar17,iVar61);
                        if (bVar13) {
                          lVar55 = (long)local_be8.begin.x;
                          lVar54 = CONCAT44(local_be8.p._4_4_,(int)local_be8.p);
                          lVar19 = CONCAT44(local_be8.jstride._4_4_,(int)local_be8.jstride);
                          lVar39 = lVar54 + (iVar17 - local_be8.begin.y) * lVar19 * 8 +
                                   (long)(~local_be8.begin.x + iVar26) * 8;
                          lVar53 = lVar54 + (iVar23 - local_be8.begin.y) * lVar19 * 8 +
                                   (long)(~local_be8.begin.x + iVar26) * 8;
                          lVar37 = CONCAT44(local_be8.kstride._4_4_,(int)local_be8.kstride);
                          lVar62 = (iVar61 - local_be8.begin.z) * lVar37;
                          dVar81 = *(double *)(lVar39 + lVar62 * 8);
                          dVar82 = *(double *)(lVar53 + lVar62 * 8);
                          lVar62 = (iVar51 - local_be8.begin.z) * lVar37;
                          dVar83 = *(double *)(lVar39 + lVar62 * 8);
                          lVar65 = (local_c40 - local_be8.begin.z) * lVar37 * 8;
                          dVar84 = *(double *)(lVar53 + lVar62 * 8);
                          lVar62 = ((long)local_c60 - (long)local_be8.begin.y) * lVar19 * 8;
                          dVar68 = *(double *)(lVar65 + lVar62 + lVar55 * -8 + lVar54 + lVar32 * 8);
                          lVar39 = (long)((int)local_c48 - local_be8.begin.y) * lVar19 * 8;
                          dVar69 = *(double *)(lVar65 + lVar39 + lVar55 * -8 + lVar54 + lVar32 * 8);
                          lVar53 = (long)(iVar15 - local_be8.begin.z) * lVar37 * 8;
                          dVar70 = *(double *)(lVar62 + lVar53 + lVar55 * -8 + lVar54 + lVar32 * 8);
                          dVar71 = *(double *)(lVar53 + lVar39 + lVar55 * -8 + lVar54 + lVar32 * 8);
                          local_c78 = (double *)
                                      ((double)local_c78 +
                                      (((dVar84 - dVar82) +
                                       (dVar71 - dVar69) + (dVar71 - dVar69) +
                                       (dVar70 - dVar68) * 4.0 +
                                       (dVar83 - dVar81) + (dVar83 - dVar81)) * dVar93 +
                                      ((dVar84 - dVar71) +
                                      (dVar83 - dVar70) + (dVar83 - dVar70) +
                                      (dVar81 - dVar68) * 4.0 +
                                      (dVar82 - dVar69) + (dVar82 - dVar69)) * dVar91 +
                                      ((dVar84 - dVar83) +
                                      (dVar71 - dVar70) + (dVar71 - dVar70) +
                                      (dVar69 - dVar68) * 4.0 +
                                      (dVar82 - dVar81) + (dVar82 - dVar81)) * dVar92) * dVar79);
                        }
                        bVar13 = Box::contains(&bx_2,iVar26,iVar17,iVar61);
                        dVar81 = local_ac8;
                        if (bVar13) {
                          lVar55 = (long)local_be8.begin.x;
                          lVar53 = (long)((iVar26 - local_be8.begin.x) + 1);
                          lVar54 = CONCAT44(local_be8.p._4_4_,(int)local_be8.p);
                          lVar19 = CONCAT44(local_be8.jstride._4_4_,(int)local_be8.jstride);
                          lVar39 = lVar54 + (iVar17 - local_be8.begin.y) * lVar19 * 8 + lVar53 * 8;
                          lVar53 = lVar54 + (iVar23 - local_be8.begin.y) * lVar19 * 8 + lVar53 * 8;
                          lVar37 = CONCAT44(local_be8.kstride._4_4_,(int)local_be8.kstride);
                          lVar62 = (iVar61 - local_be8.begin.z) * lVar37;
                          dVar82 = *(double *)(lVar39 + lVar62 * 8);
                          dVar83 = *(double *)(lVar53 + lVar62 * 8);
                          lVar62 = (iVar51 - local_be8.begin.z) * lVar37;
                          dVar84 = *(double *)(lVar39 + lVar62 * 8);
                          lVar65 = (local_c40 - local_be8.begin.z) * lVar37 * 8;
                          dVar68 = *(double *)(lVar53 + lVar62 * 8);
                          lVar62 = ((long)local_c60 - (long)local_be8.begin.y) * lVar19 * 8;
                          dVar69 = *(double *)(lVar65 + lVar62 + lVar55 * -8 + lVar54 + lVar32 * 8);
                          lVar39 = (long)((int)local_c48 - local_be8.begin.y) * lVar19 * 8;
                          dVar70 = *(double *)(lVar65 + lVar39 + lVar55 * -8 + lVar54 + lVar32 * 8);
                          lVar53 = (long)(iVar15 - local_be8.begin.z) * lVar37 * 8;
                          dVar71 = *(double *)(lVar62 + lVar53 + lVar55 * -8 + lVar54 + lVar32 * 8);
                          dVar72 = *(double *)(lVar53 + lVar39 + lVar55 * -8 + lVar54 + lVar32 * 8);
                          local_c78 = (double *)
                                      ((double)local_c78 +
                                      (((dVar68 - dVar83) +
                                       (dVar72 - dVar70) + (dVar72 - dVar70) +
                                       (dVar71 - dVar69) * 4.0 +
                                       (dVar84 - dVar82) + (dVar84 - dVar82)) * dVar93 +
                                      ((dVar68 - dVar72) +
                                      (dVar84 - dVar71) + (dVar84 - dVar71) +
                                      (dVar82 - dVar69) * 4.0 +
                                      (dVar83 - dVar70) + (dVar83 - dVar70)) * dVar91 +
                                      ((dVar68 - dVar84) +
                                      (dVar72 - dVar71) + (dVar72 - dVar71) +
                                      (dVar70 - dVar69) * 4.0 +
                                      (dVar83 - dVar82) + (dVar83 - dVar82)) * dVar92) * dVar79);
                        }
                      }
                      dVar80 = dVar80 + (double)((iVar36 + 4) * local_af8._0_4_) * (double)local_c78
                      ;
                      lVar32 = lVar32 + 1;
                      iVar14 = iVar14 + -1;
                    }
                    iVar22 = local_ad8._0_4_ + 1;
                    local_c60 = (double *)((long)local_c60 + 1);
                    local_c48 = (ulong)((int)local_c48 + 1);
                    iVar17 = iVar23;
                  }
                  iVar16 = local_b90._0_4_ + 1;
                  local_c40 = local_c40 + 1;
                  iVar61 = iVar51;
                }
                dVar80 = dVar80 * 0.000244140625;
                uVar28 = (ulong)local_a58 & 0xffffffff;
                puVar47 = local_9b8;
                pFVar49 = local_b60;
                puVar46 = local_a08;
                pdVar66 = local_a40;
                iVar17 = (int)local_b68;
                iVar22 = (int)local_b00;
                iVar61 = (int)local_a98;
              }
              *(double *)
               (((long)local_a48 - (long)mfi_2.beginIndex) *
                CONCAT44(mfi_2.fabArray._4_4_,(int)mfi_2.fabArray) * 8 +
                CONCAT44(mfi_2.m_fa._M_t.
                         super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                         .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_,
                         (int)mfi_2.m_fa._M_t.
                              super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                              .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl) +
                ((long)pdVar66 - (long)mfi_2.currentIndex) * 8 +
               ((long)local_a50 - (long)mfi_2.endIndex) *
               CONCAT44(mfi_2.tile_size.vect[1],mfi_2.tile_size.vect[0]) * 8) = dVar80;
              uVar63 = (ulong)(iVar61 + 1);
              iVar22 = iVar22 + 4;
              iVar17 = iVar17 + 4;
            }
            uVar28 = (ulong)((int)uVar28 + 1);
            local_aa0 = CONCAT44(local_aa0._4_4_,(int)local_aa0 + 4);
          }
          puVar46 = (pointer)(ulong)((int)puVar46 + 1);
          local_aa8 = (double *)CONCAT44(local_aa8._4_4_,(int)local_aa8 + 4);
        }
      }
    }
    else {
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_520,(FabArray<amrex::FArrayBox> *)*local_7b8,(MFIter *)&fine_contrib_on_crse
                );
      puVar46 = (pointer)(ulong)(uint)local_560.p;
      puVar47 = (pointer)(ulong)local_560.p._4_4_;
      pdVar66 = (double *)(ulong)(uint)local_560.jstride;
      local_a38 = (double)CONCAT44(local_a38._4_4_,local_560.jstride._4_4_);
      local_9e8 = (double *)CONCAT44(local_9e8._4_4_,(undefined4)local_560.kstride);
      local_9f0 = CONCAT44(local_9f0._4_4_,local_560.kstride._4_4_);
      local_a08 = puVar46;
      local_9b8 = puVar47;
      if (local_b04 == 2) {
        local_aa0 = CONCAT44(local_aa0._4_4_,(uint)local_560.p * 2);
        local_a20 = (double *)CONCAT44(local_a20._4_4_,(uint)local_560.p * 2 + -1);
        local_a70 = (double *)CONCAT44(local_a70._4_4_,(uint)local_560.jstride * 2 + -1);
        local_aa8 = (double *)CONCAT44(local_aa8._4_4_,local_560.p._4_4_ * 2 + -1);
        while( true ) {
          if ((int)local_9f0 < (int)pdVar66) break;
          local_a68 = (long)(int)local_a70;
          local_a48 = (double *)(long)(int)pdVar66;
          local_ba8 = (long)local_a48 * 2;
          local_a10 = CONCAT44(local_a10._4_4_,(int)local_ba8 + -1);
          local_a18 = (double *)CONCAT44(local_a18._4_4_,(int)local_ba8 + 1);
          local_ab8 = (double *)CONCAT44(local_ab8._4_4_,(int)local_aa8);
          uVar28 = (ulong)puVar47 & 0xffffffff;
          local_b58 = pdVar66;
          while( true ) {
            iVar24 = (int)uVar28;
            if ((int)local_9e8 < iVar24) break;
            local_a58 = (double *)(long)(int)local_ab8;
            local_a40 = (double *)(long)iVar24;
            local_b98 = (double *)((long)local_a40 * 2);
            local_a60 = (double *)CONCAT44(local_a60._4_4_,(int)local_b98 + -1);
            local_ab0 = CONCAT44(local_ab0._4_4_,(int)local_b98 + 1);
            uVar63 = (ulong)puVar46 & 0xffffffff;
            local_a50 = (double *)CONCAT44(local_a50._4_4_,iVar24);
            iVar22 = (int)local_aa0;
            iVar24 = (int)local_a20;
            while( true ) {
              iVar17 = (int)uVar63;
              if (local_a38._0_4_ < iVar17) break;
              local_9d8.smallend.vect._0_8_ = &local_520;
              lVar18 = (long)iVar17;
              if (local_818.p
                  [((long)local_b98 - (long)local_818.begin.y) * local_818.jstride +
                   (lVar18 * 2 - (long)local_818.begin.x) +
                   (local_ba8 - local_818.begin.z) * local_818.kstride] == 0) {
                dVar79 = 0.0;
              }
              else {
                local_b00 = (undefined8 *)CONCAT44(local_b00._4_4_,iVar17);
                local_b68 = (pointer)CONCAT44(local_b68._4_4_,iVar24);
                uVar57 = (uint)(lVar18 * 2) | 1;
                if (result.bigend.vect[0] < (int)uVar57) {
                  uVar57 = result.bigend.vect[0];
                }
                iVar17 = result.smallend.vect[1];
                if (result.smallend.vect[1] < (int)local_a60) {
                  iVar17 = (int)local_a60;
                }
                local_b50 = (double *)CONCAT44(local_b50._4_4_,iVar17);
                iVar17 = result.bigend.vect[1];
                if ((int)local_ab0 <= result.bigend.vect[1]) {
                  iVar17 = (int)local_ab0;
                }
                local_ad8 = (double)CONCAT44(local_ad8._4_4_,iVar17);
                iVar17 = result.smallend.vect[2];
                if (result.smallend.vect[2] < (int)local_a10) {
                  iVar17 = (int)local_a10;
                }
                iVar61 = result.bigend.vect[2];
                if ((int)local_a18 <= result.bigend.vect[2]) {
                  iVar61 = (int)local_a18;
                }
                local_b90 = (double)CONCAT44(local_b90._4_4_,iVar61);
                local_ba0 = (_func_int **)(long)result.smallend.vect[0];
                if ((long)result.smallend.vect[0] <= (long)iVar24) {
                  local_ba0 = (_func_int **)(long)iVar24;
                }
                iVar61 = (int)local_a68;
                if ((int)local_a68 < result.smallend.vect[2]) {
                  iVar61 = result.smallend.vect[2];
                }
                iVar51 = iVar61 + -1;
                iVar15 = (int)local_a58;
                if ((int)local_a58 < result.smallend.vect[1]) {
                  iVar15 = result.smallend.vect[1];
                }
                local_a88 = (double *)CONCAT44(local_a88._4_4_,iVar15 + -1);
                local_c60 = (double *)(long)result.smallend.vect[2];
                if (result.smallend.vect[2] <= local_a68) {
                  local_c60 = (double *)local_a68;
                }
                local_b78 = (double *)(long)result.smallend.vect[1];
                if ((long)result.smallend.vect[1] <= (long)local_a58) {
                  local_b78 = local_a58;
                }
                local_b70 = (double *)(ulong)(iVar15 + 1);
                if (iVar24 < result.smallend.vect[0]) {
                  iVar24 = result.smallend.vect[0];
                }
                local_b60 = (FabArray<amrex::IArrayBox> *)CONCAT44(local_b60._4_4_,iVar22);
                local_b80 = CONCAT44(local_b80._4_4_,iVar22 - iVar24);
                dVar79 = 0.0;
                local_a98 = lVar18;
                while( true ) {
                  iVar61 = iVar61 + 1;
                  if (local_b90._0_4_ < iVar17) break;
                  iVar22 = (int)local_ba8 - iVar17;
                  iVar24 = -iVar22;
                  if (iVar22 < 1) {
                    iVar24 = iVar22;
                  }
                  local_b88 = (double)CONCAT44(local_b88._4_4_,iVar51);
                  lVar18 = (long)iVar51;
                  local_ae8 = (double *)CONCAT44(local_ae8._4_4_,iVar24 + 2);
                  iVar51 = iVar17 + -1;
                  iVar15 = iVar17 + 1;
                  local_c48 = (ulong)local_b70 & 0xffffffff;
                  local_c78 = local_b78;
                  iVar24 = (int)local_a88;
                  iVar22 = (int)local_b50;
                  while (iVar22 <= local_ad8._0_4_) {
                    local_ac8 = (double)CONCAT44(local_ac8._4_4_,iVar24);
                    lVar20 = (long)iVar24;
                    iVar16 = (int)local_b98 - iVar22;
                    iVar24 = -iVar16;
                    if (iVar16 < 1) {
                      iVar24 = iVar16;
                    }
                    local_af8 = (double)CONCAT44(local_af8._4_4_,(iVar24 + 2) * (int)local_ae8);
                    iVar24 = iVar22 + -1;
                    iVar16 = iVar22 + 1;
                    pp_Var58 = local_ba0;
                    iVar23 = (int)local_b80;
                    while( true ) {
                      iVar14 = (int)pp_Var58;
                      if ((int)uVar57 < iVar14) break;
                      iVar26 = -iVar23;
                      if (iVar23 < 1) {
                        iVar26 = iVar23;
                      }
                      bVar13 = Box::strictly_contains(&result,iVar14,iVar22,iVar17);
                      if (bVar13) {
                        facy_4 = local_b48.p
                                 [(long)pp_Var58 +
                                  ((((long)local_c60 - (long)local_b48.begin.z) * local_b48.kstride
                                   + ((long)local_c78 - (long)local_b48.begin.y) * local_b48.jstride
                                   ) - (long)local_b48.begin.x)] -
                                 (double)local_968.p
                                         [(long)pp_Var58 +
                                          ((((long)local_c60 - (long)local_968.begin.z) *
                                            local_968.kstride +
                                           ((long)local_c78 - (long)local_968.begin.y) *
                                           local_968.jstride) - (long)local_968.begin.x)];
                      }
                      else {
                        iVar36 = iVar14 + -1;
                        bVar13 = Box::contains(&bx_2,iVar36,iVar24,iVar51);
                        facy_4 = 0.0;
                        if (bVar13) {
                          pRVar21 = mlndlap_Ax_fine_contrib<2>::anon_class_8_1_ba1d7831::operator()
                                              ((anon_class_8_1_ba1d7831 *)&local_9d8,iVar36,iVar24,
                                               iVar51);
                          lVar37 = (long)local_be8.begin.x;
                          lVar53 = CONCAT44(local_be8.p._4_4_,(int)local_be8.p);
                          lVar54 = CONCAT44(local_be8.jstride._4_4_,(int)local_be8.jstride);
                          lVar32 = lVar53 + (iVar22 - local_be8.begin.y) * lVar54 * 8 +
                                   (long)(~local_be8.begin.x + iVar14) * 8;
                          lVar39 = lVar53 + (iVar24 - local_be8.begin.y) * lVar54 * 8 +
                                   (long)(~local_be8.begin.x + iVar14) * 8;
                          lVar19 = CONCAT44(local_be8.kstride._4_4_,(int)local_be8.kstride);
                          lVar55 = (iVar17 - local_be8.begin.z) * lVar19;
                          dVar80 = *(double *)(lVar32 + lVar55 * 8);
                          dVar81 = *(double *)(lVar39 + lVar55 * 8);
                          lVar62 = (iVar51 - local_be8.begin.z) * lVar19;
                          dVar82 = *(double *)(lVar32 + lVar62 * 8);
                          lVar55 = ((long)local_c60 - (long)local_be8.begin.z) * lVar19 * 8;
                          dVar83 = *(double *)(lVar39 + lVar62 * 8);
                          lVar62 = ((long)local_c78 - (long)local_be8.begin.y) * lVar54 * 8;
                          dVar84 = *(double *)
                                    (lVar55 + lVar62 + lVar37 * -8 + lVar53 + (long)pp_Var58 * 8);
                          lVar32 = (lVar20 - local_be8.begin.y) * lVar54 * 8;
                          dVar68 = *(double *)
                                    (lVar55 + lVar32 + lVar37 * -8 + lVar53 + (long)pp_Var58 * 8);
                          lVar39 = (lVar18 - local_be8.begin.z) * lVar19 * 8;
                          dVar69 = *(double *)
                                    (lVar62 + lVar39 + lVar37 * -8 + lVar53 + (long)pp_Var58 * 8);
                          dVar70 = *(double *)
                                    (lVar39 + lVar32 + lVar37 * -8 + lVar53 + (long)pp_Var58 * 8);
                          facy_4 = (((dVar83 - dVar81) +
                                    (dVar70 - dVar68) + (dVar70 - dVar68) +
                                    (dVar69 - dVar84) * 4.0 + (dVar82 - dVar80) + (dVar82 - dVar80))
                                    * dVar93 +
                                   ((dVar83 - dVar70) +
                                   (dVar82 - dVar69) + (dVar82 - dVar69) +
                                   (dVar80 - dVar84) * 4.0 + (dVar81 - dVar68) + (dVar81 - dVar68))
                                   * dVar91 +
                                   ((dVar83 - dVar82) +
                                   (dVar70 - dVar69) + (dVar70 - dVar69) +
                                   (dVar68 - dVar84) * 4.0 + (dVar81 - dVar80) + (dVar81 - dVar80))
                                   * dVar92) * *pRVar21 + 0.0;
                        }
                        bVar13 = Box::contains(&bx_2,iVar14,iVar24,iVar51);
                        if (bVar13) {
                          pRVar21 = mlndlap_Ax_fine_contrib<2>::anon_class_8_1_ba1d7831::operator()
                                              ((anon_class_8_1_ba1d7831 *)&local_9d8,iVar14,iVar24,
                                               iVar51);
                          lVar37 = (long)local_be8.begin.x;
                          lVar39 = (long)((iVar14 - local_be8.begin.x) + 1);
                          lVar53 = CONCAT44(local_be8.p._4_4_,(int)local_be8.p);
                          lVar54 = CONCAT44(local_be8.jstride._4_4_,(int)local_be8.jstride);
                          lVar32 = lVar53 + (iVar22 - local_be8.begin.y) * lVar54 * 8 + lVar39 * 8;
                          lVar39 = lVar53 + (iVar24 - local_be8.begin.y) * lVar54 * 8 + lVar39 * 8;
                          lVar19 = CONCAT44(local_be8.kstride._4_4_,(int)local_be8.kstride);
                          lVar55 = (iVar17 - local_be8.begin.z) * lVar19;
                          dVar80 = *(double *)(lVar32 + lVar55 * 8);
                          dVar81 = *(double *)(lVar39 + lVar55 * 8);
                          lVar62 = (iVar51 - local_be8.begin.z) * lVar19;
                          dVar82 = *(double *)(lVar32 + lVar62 * 8);
                          lVar55 = ((long)local_c60 - (long)local_be8.begin.z) * lVar19 * 8;
                          dVar83 = *(double *)(lVar39 + lVar62 * 8);
                          lVar62 = ((long)local_c78 - (long)local_be8.begin.y) * lVar54 * 8;
                          dVar84 = *(double *)
                                    (lVar55 + lVar62 + lVar37 * -8 + lVar53 + (long)pp_Var58 * 8);
                          lVar32 = (lVar20 - local_be8.begin.y) * lVar54 * 8;
                          dVar68 = *(double *)
                                    (lVar55 + lVar32 + lVar37 * -8 + lVar53 + (long)pp_Var58 * 8);
                          lVar39 = (lVar18 - local_be8.begin.z) * lVar19 * 8;
                          dVar69 = *(double *)
                                    (lVar62 + lVar39 + lVar37 * -8 + lVar53 + (long)pp_Var58 * 8);
                          dVar70 = *(double *)
                                    (lVar39 + lVar32 + lVar37 * -8 + lVar53 + (long)pp_Var58 * 8);
                          facy_4 = facy_4 + (((dVar83 - dVar81) +
                                             (dVar70 - dVar68) + (dVar70 - dVar68) +
                                             (dVar69 - dVar84) * 4.0 +
                                             (dVar82 - dVar80) + (dVar82 - dVar80)) * dVar93 +
                                            ((dVar83 - dVar70) +
                                            (dVar82 - dVar69) + (dVar82 - dVar69) +
                                            (dVar80 - dVar84) * 4.0 +
                                            (dVar81 - dVar68) + (dVar81 - dVar68)) * dVar91 +
                                            ((dVar83 - dVar82) +
                                            (dVar70 - dVar69) + (dVar70 - dVar69) +
                                            (dVar68 - dVar84) * 4.0 +
                                            (dVar81 - dVar80) + (dVar81 - dVar80)) * dVar92) *
                                            *pRVar21;
                        }
                        bVar13 = Box::contains(&bx_2,iVar36,iVar22,iVar51);
                        if (bVar13) {
                          pRVar21 = mlndlap_Ax_fine_contrib<2>::anon_class_8_1_ba1d7831::operator()
                                              ((anon_class_8_1_ba1d7831 *)&local_9d8,iVar36,iVar22,
                                               iVar51);
                          lVar37 = (long)local_be8.begin.x;
                          lVar53 = CONCAT44(local_be8.p._4_4_,(int)local_be8.p);
                          lVar54 = CONCAT44(local_be8.jstride._4_4_,(int)local_be8.jstride);
                          lVar32 = lVar53 + (iVar22 - local_be8.begin.y) * lVar54 * 8 +
                                   (long)(~local_be8.begin.x + iVar14) * 8;
                          lVar39 = lVar53 + (iVar16 - local_be8.begin.y) * lVar54 * 8 +
                                   (long)(~local_be8.begin.x + iVar14) * 8;
                          lVar19 = CONCAT44(local_be8.kstride._4_4_,(int)local_be8.kstride);
                          lVar55 = (iVar17 - local_be8.begin.z) * lVar19;
                          dVar80 = *(double *)(lVar32 + lVar55 * 8);
                          dVar81 = *(double *)(lVar39 + lVar55 * 8);
                          lVar62 = (iVar51 - local_be8.begin.z) * lVar19;
                          dVar82 = *(double *)(lVar32 + lVar62 * 8);
                          lVar55 = ((long)local_c60 - (long)local_be8.begin.z) * lVar19 * 8;
                          dVar83 = *(double *)(lVar39 + lVar62 * 8);
                          lVar62 = ((long)local_c78 - (long)local_be8.begin.y) * lVar54 * 8;
                          dVar84 = *(double *)
                                    (lVar55 + lVar62 + lVar37 * -8 + lVar53 + (long)pp_Var58 * 8);
                          lVar32 = (long)((int)local_c48 - local_be8.begin.y) * lVar54 * 8;
                          dVar68 = *(double *)
                                    (lVar55 + lVar32 + lVar37 * -8 + lVar53 + (long)pp_Var58 * 8);
                          lVar39 = (lVar18 - local_be8.begin.z) * lVar19 * 8;
                          dVar69 = *(double *)
                                    (lVar62 + lVar39 + lVar37 * -8 + lVar53 + (long)pp_Var58 * 8);
                          dVar70 = *(double *)
                                    (lVar39 + lVar32 + lVar37 * -8 + lVar53 + (long)pp_Var58 * 8);
                          facy_4 = facy_4 + (((dVar83 - dVar81) +
                                             (dVar70 - dVar68) + (dVar70 - dVar68) +
                                             (dVar69 - dVar84) * 4.0 +
                                             (dVar82 - dVar80) + (dVar82 - dVar80)) * dVar93 +
                                            ((dVar83 - dVar70) +
                                            (dVar82 - dVar69) + (dVar82 - dVar69) +
                                            (dVar80 - dVar84) * 4.0 +
                                            (dVar81 - dVar68) + (dVar81 - dVar68)) * dVar91 +
                                            ((dVar83 - dVar82) +
                                            (dVar70 - dVar69) + (dVar70 - dVar69) +
                                            (dVar68 - dVar84) * 4.0 +
                                            (dVar81 - dVar80) + (dVar81 - dVar80)) * dVar92) *
                                            *pRVar21;
                        }
                        bVar13 = Box::contains(&bx_2,iVar14,iVar22,iVar51);
                        if (bVar13) {
                          pRVar21 = mlndlap_Ax_fine_contrib<2>::anon_class_8_1_ba1d7831::operator()
                                              ((anon_class_8_1_ba1d7831 *)&local_9d8,iVar14,iVar22,
                                               iVar51);
                          lVar37 = (long)local_be8.begin.x;
                          lVar39 = (long)((iVar14 - local_be8.begin.x) + 1);
                          lVar53 = CONCAT44(local_be8.p._4_4_,(int)local_be8.p);
                          lVar54 = CONCAT44(local_be8.jstride._4_4_,(int)local_be8.jstride);
                          lVar32 = lVar53 + (iVar22 - local_be8.begin.y) * lVar54 * 8 + lVar39 * 8;
                          lVar39 = lVar53 + (iVar16 - local_be8.begin.y) * lVar54 * 8 + lVar39 * 8;
                          lVar19 = CONCAT44(local_be8.kstride._4_4_,(int)local_be8.kstride);
                          lVar55 = (iVar17 - local_be8.begin.z) * lVar19;
                          dVar80 = *(double *)(lVar32 + lVar55 * 8);
                          dVar81 = *(double *)(lVar39 + lVar55 * 8);
                          lVar62 = (iVar51 - local_be8.begin.z) * lVar19;
                          dVar82 = *(double *)(lVar32 + lVar62 * 8);
                          lVar55 = ((long)local_c60 - (long)local_be8.begin.z) * lVar19 * 8;
                          dVar83 = *(double *)(lVar39 + lVar62 * 8);
                          lVar62 = ((long)local_c78 - (long)local_be8.begin.y) * lVar54 * 8;
                          dVar84 = *(double *)
                                    (lVar55 + lVar62 + lVar37 * -8 + lVar53 + (long)pp_Var58 * 8);
                          lVar32 = (long)((int)local_c48 - local_be8.begin.y) * lVar54 * 8;
                          dVar68 = *(double *)
                                    (lVar55 + lVar32 + lVar37 * -8 + lVar53 + (long)pp_Var58 * 8);
                          lVar39 = (lVar18 - local_be8.begin.z) * lVar19 * 8;
                          dVar69 = *(double *)
                                    (lVar62 + lVar39 + lVar37 * -8 + lVar53 + (long)pp_Var58 * 8);
                          dVar70 = *(double *)
                                    (lVar39 + lVar32 + lVar37 * -8 + lVar53 + (long)pp_Var58 * 8);
                          facy_4 = facy_4 + (((dVar83 - dVar81) +
                                             (dVar70 - dVar68) + (dVar70 - dVar68) +
                                             (dVar69 - dVar84) * 4.0 +
                                             (dVar82 - dVar80) + (dVar82 - dVar80)) * dVar93 +
                                            ((dVar83 - dVar70) +
                                            (dVar82 - dVar69) + (dVar82 - dVar69) +
                                            (dVar80 - dVar84) * 4.0 +
                                            (dVar81 - dVar68) + (dVar81 - dVar68)) * dVar91 +
                                            ((dVar83 - dVar82) +
                                            (dVar70 - dVar69) + (dVar70 - dVar69) +
                                            (dVar68 - dVar84) * 4.0 +
                                            (dVar81 - dVar80) + (dVar81 - dVar80)) * dVar92) *
                                            *pRVar21;
                        }
                        bVar13 = Box::contains(&bx_2,iVar36,iVar24,iVar17);
                        if (bVar13) {
                          pRVar21 = mlndlap_Ax_fine_contrib<2>::anon_class_8_1_ba1d7831::operator()
                                              ((anon_class_8_1_ba1d7831 *)&local_9d8,iVar36,iVar24,
                                               iVar17);
                          lVar37 = (long)local_be8.begin.x;
                          lVar53 = CONCAT44(local_be8.p._4_4_,(int)local_be8.p);
                          lVar54 = CONCAT44(local_be8.jstride._4_4_,(int)local_be8.jstride);
                          lVar32 = lVar53 + (iVar22 - local_be8.begin.y) * lVar54 * 8 +
                                   (long)(~local_be8.begin.x + iVar14) * 8;
                          lVar39 = lVar53 + (iVar24 - local_be8.begin.y) * lVar54 * 8 +
                                   (long)(~local_be8.begin.x + iVar14) * 8;
                          lVar19 = CONCAT44(local_be8.kstride._4_4_,(int)local_be8.kstride);
                          lVar55 = (iVar17 - local_be8.begin.z) * lVar19;
                          dVar80 = *(double *)(lVar32 + lVar55 * 8);
                          dVar81 = *(double *)(lVar39 + lVar55 * 8);
                          lVar62 = (iVar15 - local_be8.begin.z) * lVar19;
                          dVar82 = *(double *)(lVar32 + lVar62 * 8);
                          lVar55 = ((long)local_c60 - (long)local_be8.begin.z) * lVar19 * 8;
                          dVar83 = *(double *)(lVar39 + lVar62 * 8);
                          lVar62 = ((long)local_c78 - (long)local_be8.begin.y) * lVar54 * 8;
                          dVar84 = *(double *)
                                    (lVar55 + lVar62 + lVar37 * -8 + lVar53 + (long)pp_Var58 * 8);
                          lVar32 = (lVar20 - local_be8.begin.y) * lVar54 * 8;
                          dVar68 = *(double *)
                                    (lVar55 + lVar32 + lVar37 * -8 + lVar53 + (long)pp_Var58 * 8);
                          lVar39 = (long)(iVar61 - local_be8.begin.z) * lVar19 * 8;
                          dVar69 = *(double *)
                                    (lVar62 + lVar39 + lVar37 * -8 + lVar53 + (long)pp_Var58 * 8);
                          dVar70 = *(double *)
                                    (lVar39 + lVar32 + lVar37 * -8 + lVar53 + (long)pp_Var58 * 8);
                          facy_4 = facy_4 + (((dVar83 - dVar81) +
                                             (dVar70 - dVar68) + (dVar70 - dVar68) +
                                             (dVar69 - dVar84) * 4.0 +
                                             (dVar82 - dVar80) + (dVar82 - dVar80)) * dVar93 +
                                            ((dVar83 - dVar70) +
                                            (dVar82 - dVar69) + (dVar82 - dVar69) +
                                            (dVar80 - dVar84) * 4.0 +
                                            (dVar81 - dVar68) + (dVar81 - dVar68)) * dVar91 +
                                            ((dVar83 - dVar82) +
                                            (dVar70 - dVar69) + (dVar70 - dVar69) +
                                            (dVar68 - dVar84) * 4.0 +
                                            (dVar81 - dVar80) + (dVar81 - dVar80)) * dVar92) *
                                            *pRVar21;
                        }
                        bVar13 = Box::contains(&bx_2,iVar14,iVar24,iVar17);
                        if (bVar13) {
                          pRVar21 = mlndlap_Ax_fine_contrib<2>::anon_class_8_1_ba1d7831::operator()
                                              ((anon_class_8_1_ba1d7831 *)&local_9d8,iVar14,iVar24,
                                               iVar17);
                          lVar37 = (long)local_be8.begin.x;
                          lVar39 = (long)((iVar14 - local_be8.begin.x) + 1);
                          lVar53 = CONCAT44(local_be8.p._4_4_,(int)local_be8.p);
                          lVar54 = CONCAT44(local_be8.jstride._4_4_,(int)local_be8.jstride);
                          lVar32 = lVar53 + (iVar22 - local_be8.begin.y) * lVar54 * 8 + lVar39 * 8;
                          lVar39 = lVar53 + (iVar24 - local_be8.begin.y) * lVar54 * 8 + lVar39 * 8;
                          lVar19 = CONCAT44(local_be8.kstride._4_4_,(int)local_be8.kstride);
                          lVar55 = (iVar17 - local_be8.begin.z) * lVar19;
                          dVar80 = *(double *)(lVar32 + lVar55 * 8);
                          dVar81 = *(double *)(lVar39 + lVar55 * 8);
                          lVar62 = (iVar15 - local_be8.begin.z) * lVar19;
                          dVar82 = *(double *)(lVar32 + lVar62 * 8);
                          lVar55 = ((long)local_c60 - (long)local_be8.begin.z) * lVar19 * 8;
                          dVar83 = *(double *)(lVar39 + lVar62 * 8);
                          lVar62 = ((long)local_c78 - (long)local_be8.begin.y) * lVar54 * 8;
                          dVar84 = *(double *)
                                    (lVar55 + lVar62 + lVar37 * -8 + lVar53 + (long)pp_Var58 * 8);
                          lVar32 = (lVar20 - local_be8.begin.y) * lVar54 * 8;
                          dVar68 = *(double *)
                                    (lVar55 + lVar32 + lVar37 * -8 + lVar53 + (long)pp_Var58 * 8);
                          lVar39 = (long)(iVar61 - local_be8.begin.z) * lVar19 * 8;
                          dVar69 = *(double *)
                                    (lVar62 + lVar39 + lVar37 * -8 + lVar53 + (long)pp_Var58 * 8);
                          dVar70 = *(double *)
                                    (lVar39 + lVar32 + lVar37 * -8 + lVar53 + (long)pp_Var58 * 8);
                          facy_4 = facy_4 + (((dVar83 - dVar81) +
                                             (dVar70 - dVar68) + (dVar70 - dVar68) +
                                             (dVar69 - dVar84) * 4.0 +
                                             (dVar82 - dVar80) + (dVar82 - dVar80)) * dVar93 +
                                            ((dVar83 - dVar70) +
                                            (dVar82 - dVar69) + (dVar82 - dVar69) +
                                            (dVar80 - dVar84) * 4.0 +
                                            (dVar81 - dVar68) + (dVar81 - dVar68)) * dVar91 +
                                            ((dVar83 - dVar82) +
                                            (dVar70 - dVar69) + (dVar70 - dVar69) +
                                            (dVar68 - dVar84) * 4.0 +
                                            (dVar81 - dVar80) + (dVar81 - dVar80)) * dVar92) *
                                            *pRVar21;
                        }
                        bVar13 = Box::contains(&bx_2,iVar36,iVar22,iVar17);
                        if (bVar13) {
                          pRVar21 = mlndlap_Ax_fine_contrib<2>::anon_class_8_1_ba1d7831::operator()
                                              ((anon_class_8_1_ba1d7831 *)&local_9d8,iVar36,iVar22,
                                               iVar17);
                          lVar37 = (long)local_be8.begin.x;
                          lVar53 = CONCAT44(local_be8.p._4_4_,(int)local_be8.p);
                          lVar54 = CONCAT44(local_be8.jstride._4_4_,(int)local_be8.jstride);
                          lVar32 = lVar53 + (iVar22 - local_be8.begin.y) * lVar54 * 8 +
                                   (long)(~local_be8.begin.x + iVar14) * 8;
                          lVar39 = lVar53 + (iVar16 - local_be8.begin.y) * lVar54 * 8 +
                                   (long)(~local_be8.begin.x + iVar14) * 8;
                          lVar19 = CONCAT44(local_be8.kstride._4_4_,(int)local_be8.kstride);
                          lVar55 = (iVar17 - local_be8.begin.z) * lVar19;
                          dVar80 = *(double *)(lVar32 + lVar55 * 8);
                          dVar81 = *(double *)(lVar39 + lVar55 * 8);
                          lVar62 = (iVar15 - local_be8.begin.z) * lVar19;
                          dVar82 = *(double *)(lVar32 + lVar62 * 8);
                          lVar55 = ((long)local_c60 - (long)local_be8.begin.z) * lVar19 * 8;
                          dVar83 = *(double *)(lVar39 + lVar62 * 8);
                          lVar62 = ((long)local_c78 - (long)local_be8.begin.y) * lVar54 * 8;
                          dVar84 = *(double *)
                                    (lVar55 + lVar62 + lVar37 * -8 + lVar53 + (long)pp_Var58 * 8);
                          lVar32 = (long)((int)local_c48 - local_be8.begin.y) * lVar54 * 8;
                          dVar68 = *(double *)
                                    (lVar55 + lVar32 + lVar37 * -8 + lVar53 + (long)pp_Var58 * 8);
                          lVar39 = (long)(iVar61 - local_be8.begin.z) * lVar19 * 8;
                          dVar69 = *(double *)
                                    (lVar62 + lVar39 + lVar37 * -8 + lVar53 + (long)pp_Var58 * 8);
                          dVar70 = *(double *)
                                    (lVar39 + lVar32 + lVar37 * -8 + lVar53 + (long)pp_Var58 * 8);
                          facy_4 = facy_4 + (((dVar83 - dVar81) +
                                             (dVar70 - dVar68) + (dVar70 - dVar68) +
                                             (dVar69 - dVar84) * 4.0 +
                                             (dVar82 - dVar80) + (dVar82 - dVar80)) * dVar93 +
                                            ((dVar83 - dVar70) +
                                            (dVar82 - dVar69) + (dVar82 - dVar69) +
                                            (dVar80 - dVar84) * 4.0 +
                                            (dVar81 - dVar68) + (dVar81 - dVar68)) * dVar91 +
                                            ((dVar83 - dVar82) +
                                            (dVar70 - dVar69) + (dVar70 - dVar69) +
                                            (dVar68 - dVar84) * 4.0 +
                                            (dVar81 - dVar80) + (dVar81 - dVar80)) * dVar92) *
                                            *pRVar21;
                        }
                        bVar13 = Box::contains(&bx_2,iVar14,iVar22,iVar17);
                        if (bVar13) {
                          pRVar21 = mlndlap_Ax_fine_contrib<2>::anon_class_8_1_ba1d7831::operator()
                                              ((anon_class_8_1_ba1d7831 *)&local_9d8,iVar14,iVar22,
                                               iVar17);
                          lVar37 = (long)local_be8.begin.x;
                          lVar39 = (long)((iVar14 - local_be8.begin.x) + 1);
                          lVar53 = CONCAT44(local_be8.p._4_4_,(int)local_be8.p);
                          lVar54 = CONCAT44(local_be8.jstride._4_4_,(int)local_be8.jstride);
                          lVar32 = lVar53 + (iVar22 - local_be8.begin.y) * lVar54 * 8 + lVar39 * 8;
                          lVar39 = lVar53 + (iVar16 - local_be8.begin.y) * lVar54 * 8 + lVar39 * 8;
                          lVar19 = CONCAT44(local_be8.kstride._4_4_,(int)local_be8.kstride);
                          lVar55 = (iVar17 - local_be8.begin.z) * lVar19;
                          dVar80 = *(double *)(lVar32 + lVar55 * 8);
                          dVar81 = *(double *)(lVar39 + lVar55 * 8);
                          lVar62 = (iVar15 - local_be8.begin.z) * lVar19;
                          dVar82 = *(double *)(lVar32 + lVar62 * 8);
                          lVar55 = ((long)local_c60 - (long)local_be8.begin.z) * lVar19 * 8;
                          dVar83 = *(double *)(lVar39 + lVar62 * 8);
                          lVar62 = ((long)local_c78 - (long)local_be8.begin.y) * lVar54 * 8;
                          dVar84 = *(double *)
                                    (lVar55 + lVar62 + lVar37 * -8 + lVar53 + (long)pp_Var58 * 8);
                          lVar32 = (long)((int)local_c48 - local_be8.begin.y) * lVar54 * 8;
                          dVar68 = *(double *)
                                    (lVar55 + lVar32 + lVar37 * -8 + lVar53 + (long)pp_Var58 * 8);
                          lVar39 = (long)(iVar61 - local_be8.begin.z) * lVar19 * 8;
                          dVar69 = *(double *)
                                    (lVar62 + lVar39 + lVar37 * -8 + lVar53 + (long)pp_Var58 * 8);
                          dVar70 = *(double *)
                                    (lVar39 + lVar32 + lVar37 * -8 + lVar53 + (long)pp_Var58 * 8);
                          facy_4 = facy_4 + (((dVar83 - dVar81) +
                                             (dVar70 - dVar68) + (dVar70 - dVar68) +
                                             (dVar69 - dVar84) * 4.0 +
                                             (dVar82 - dVar80) + (dVar82 - dVar80)) * dVar93 +
                                            ((dVar83 - dVar70) +
                                            (dVar82 - dVar69) + (dVar82 - dVar69) +
                                            (dVar80 - dVar84) * 4.0 +
                                            (dVar81 - dVar68) + (dVar81 - dVar68)) * dVar91 +
                                            ((dVar83 - dVar82) +
                                            (dVar70 - dVar69) + (dVar70 - dVar69) +
                                            (dVar68 - dVar84) * 4.0 +
                                            (dVar81 - dVar80) + (dVar81 - dVar80)) * dVar92) *
                                            *pRVar21;
                        }
                      }
                      dVar79 = dVar79 + (double)((iVar26 + 2) * local_af8._0_4_) * facy_4;
                      pp_Var58 = (_func_int **)((long)pp_Var58 + 1);
                      iVar23 = iVar23 + -1;
                    }
                    iVar24 = local_ac8._0_4_ + 1;
                    local_c78 = (double *)((long)local_c78 + 1);
                    local_c48 = (ulong)((int)local_c48 + 1);
                    iVar22 = iVar16;
                  }
                  iVar51 = local_b88._0_4_ + 1;
                  local_c60 = (double *)((long)local_c60 + 1);
                  iVar17 = iVar15;
                }
                dVar79 = dVar79 * 0.015625;
                uVar28 = (ulong)local_a50 & 0xffffffff;
                puVar46 = local_a08;
                puVar47 = local_9b8;
                pdVar66 = local_b58;
                lVar18 = local_a98;
                iVar22 = (int)local_b60;
                iVar24 = (int)local_b68;
                iVar17 = (int)local_b00;
              }
              *(double *)
               (((long)local_a40 - (long)mfi_2.beginIndex) *
                CONCAT44(mfi_2.fabArray._4_4_,(int)mfi_2.fabArray) * 8 +
                CONCAT44(mfi_2.m_fa._M_t.
                         super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                         .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_,
                         (int)mfi_2.m_fa._M_t.
                              super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                              .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl) +
                (lVar18 - mfi_2.currentIndex) * 8 +
               ((long)local_a48 - (long)mfi_2.endIndex) *
               CONCAT44(mfi_2.tile_size.vect[1],mfi_2.tile_size.vect[0]) * 8) = dVar79;
              uVar63 = (ulong)(iVar17 + 1);
              iVar24 = iVar24 + 2;
              iVar22 = iVar22 + 2;
            }
            uVar28 = (ulong)((int)uVar28 + 1);
            local_ab8 = (double *)CONCAT44(local_ab8._4_4_,(int)local_ab8 + 2);
          }
          pdVar66 = (double *)(ulong)((int)pdVar66 + 1);
          local_a70 = (double *)CONCAT44(local_a70._4_4_,(int)local_a70 + 2);
        }
      }
      else {
        local_aa0 = CONCAT44(local_aa0._4_4_,(uint)local_560.p * 4);
        local_a20 = (double *)CONCAT44(local_a20._4_4_,(uint)local_560.p * 4 + -3);
        local_a70 = (double *)CONCAT44(local_a70._4_4_,(uint)local_560.jstride * 4 + -3);
        local_aa8 = (double *)CONCAT44(local_aa8._4_4_,local_560.p._4_4_ * 4 + -3);
        while( true ) {
          if ((int)local_9f0 < (int)pdVar66) break;
          local_a68 = (long)(int)local_a70;
          local_a48 = (double *)(long)(int)pdVar66;
          local_ba8 = (long)local_a48 * 4;
          local_a10 = CONCAT44(local_a10._4_4_,(int)local_ba8 + -3);
          local_a18 = (double *)CONCAT44(local_a18._4_4_,(int)local_ba8 + 3);
          local_ab8 = (double *)CONCAT44(local_ab8._4_4_,(int)local_aa8);
          uVar28 = (ulong)puVar47 & 0xffffffff;
          local_b58 = pdVar66;
          while( true ) {
            iVar24 = (int)uVar28;
            if ((int)local_9e8 < iVar24) break;
            local_a58 = (double *)(long)(int)local_ab8;
            local_a40 = (double *)(long)iVar24;
            local_b98 = (double *)((long)local_a40 * 4);
            local_a60 = (double *)CONCAT44(local_a60._4_4_,(int)local_b98 + -3);
            local_ab0 = CONCAT44(local_ab0._4_4_,(int)local_b98 + 3);
            uVar63 = (ulong)puVar46 & 0xffffffff;
            local_a50 = (double *)CONCAT44(local_a50._4_4_,iVar24);
            iVar22 = (int)local_aa0;
            iVar24 = (int)local_a20;
            while( true ) {
              iVar17 = (int)uVar63;
              if (local_a38._0_4_ < iVar17) break;
              local_9d8.smallend.vect._0_8_ = &local_520;
              lVar18 = (long)iVar17;
              if (local_818.p
                  [((long)local_b98 - (long)local_818.begin.y) * local_818.jstride +
                   (lVar18 * 4 - (long)local_818.begin.x) +
                   (local_ba8 - local_818.begin.z) * local_818.kstride] == 0) {
                dVar79 = 0.0;
              }
              else {
                local_b00 = (undefined8 *)CONCAT44(local_b00._4_4_,iVar17);
                local_b68 = (pointer)CONCAT44(local_b68._4_4_,iVar24);
                uVar57 = (uint)(lVar18 * 4) | 3;
                if (result.bigend.vect[0] < (int)uVar57) {
                  uVar57 = result.bigend.vect[0];
                }
                iVar17 = result.smallend.vect[1];
                if (result.smallend.vect[1] < (int)local_a60) {
                  iVar17 = (int)local_a60;
                }
                local_b50 = (double *)CONCAT44(local_b50._4_4_,iVar17);
                iVar17 = result.bigend.vect[1];
                if ((int)local_ab0 <= result.bigend.vect[1]) {
                  iVar17 = (int)local_ab0;
                }
                local_ad8 = (double)CONCAT44(local_ad8._4_4_,iVar17);
                iVar17 = result.smallend.vect[2];
                if (result.smallend.vect[2] < (int)local_a10) {
                  iVar17 = (int)local_a10;
                }
                iVar61 = result.bigend.vect[2];
                if ((int)local_a18 <= result.bigend.vect[2]) {
                  iVar61 = (int)local_a18;
                }
                local_b90 = (double)CONCAT44(local_b90._4_4_,iVar61);
                local_ba0 = (_func_int **)(long)result.smallend.vect[0];
                if ((long)result.smallend.vect[0] <= (long)iVar24) {
                  local_ba0 = (_func_int **)(long)iVar24;
                }
                iVar61 = (int)local_a68;
                if ((int)local_a68 < result.smallend.vect[2]) {
                  iVar61 = result.smallend.vect[2];
                }
                iVar51 = iVar61 + -1;
                iVar15 = (int)local_a58;
                if ((int)local_a58 < result.smallend.vect[1]) {
                  iVar15 = result.smallend.vect[1];
                }
                local_a88 = (double *)CONCAT44(local_a88._4_4_,iVar15 + -1);
                local_c60 = (double *)(long)result.smallend.vect[2];
                if (result.smallend.vect[2] <= local_a68) {
                  local_c60 = (double *)local_a68;
                }
                local_b78 = (double *)(long)result.smallend.vect[1];
                if ((long)result.smallend.vect[1] <= (long)local_a58) {
                  local_b78 = local_a58;
                }
                local_b70 = (double *)(ulong)(iVar15 + 1);
                if (iVar24 < result.smallend.vect[0]) {
                  iVar24 = result.smallend.vect[0];
                }
                local_b60 = (FabArray<amrex::IArrayBox> *)CONCAT44(local_b60._4_4_,iVar22);
                local_b80 = CONCAT44(local_b80._4_4_,iVar22 - iVar24);
                dVar79 = 0.0;
                local_a98 = lVar18;
                while( true ) {
                  iVar61 = iVar61 + 1;
                  if (local_b90._0_4_ < iVar17) break;
                  iVar22 = (int)local_ba8 - iVar17;
                  iVar24 = -iVar22;
                  if (iVar22 < 1) {
                    iVar24 = iVar22;
                  }
                  local_b88 = (double)CONCAT44(local_b88._4_4_,iVar51);
                  lVar18 = (long)iVar51;
                  local_ae8 = (double *)CONCAT44(local_ae8._4_4_,iVar24 + 4);
                  iVar51 = iVar17 + -1;
                  iVar15 = iVar17 + 1;
                  local_c48 = (ulong)local_b70 & 0xffffffff;
                  local_c78 = local_b78;
                  iVar24 = (int)local_a88;
                  iVar22 = (int)local_b50;
                  while (iVar22 <= local_ad8._0_4_) {
                    local_ac8 = (double)CONCAT44(local_ac8._4_4_,iVar24);
                    lVar20 = (long)iVar24;
                    iVar16 = (int)local_b98 - iVar22;
                    iVar24 = -iVar16;
                    if (iVar16 < 1) {
                      iVar24 = iVar16;
                    }
                    local_af8 = (double)CONCAT44(local_af8._4_4_,(iVar24 + 4) * (int)local_ae8);
                    iVar24 = iVar22 + -1;
                    iVar16 = iVar22 + 1;
                    pp_Var58 = local_ba0;
                    iVar23 = (int)local_b80;
                    while( true ) {
                      iVar14 = (int)pp_Var58;
                      if ((int)uVar57 < iVar14) break;
                      iVar26 = -iVar23;
                      if (iVar23 < 1) {
                        iVar26 = iVar23;
                      }
                      bVar13 = Box::strictly_contains(&result,iVar14,iVar22,iVar17);
                      if (bVar13) {
                        facy_4 = local_b48.p
                                 [(long)pp_Var58 +
                                  ((((long)local_c60 - (long)local_b48.begin.z) * local_b48.kstride
                                   + ((long)local_c78 - (long)local_b48.begin.y) * local_b48.jstride
                                   ) - (long)local_b48.begin.x)] -
                                 (double)local_968.p
                                         [(long)pp_Var58 +
                                          ((((long)local_c60 - (long)local_968.begin.z) *
                                            local_968.kstride +
                                           ((long)local_c78 - (long)local_968.begin.y) *
                                           local_968.jstride) - (long)local_968.begin.x)];
                      }
                      else {
                        iVar36 = iVar14 + -1;
                        bVar13 = Box::contains(&bx_2,iVar36,iVar24,iVar51);
                        facy_4 = 0.0;
                        if (bVar13) {
                          pRVar21 = mlndlap_Ax_fine_contrib<4>::anon_class_8_1_ba1d7831::operator()
                                              ((anon_class_8_1_ba1d7831 *)&local_9d8,iVar36,iVar24,
                                               iVar51);
                          lVar37 = (long)local_be8.begin.x;
                          lVar53 = CONCAT44(local_be8.p._4_4_,(int)local_be8.p);
                          lVar54 = CONCAT44(local_be8.jstride._4_4_,(int)local_be8.jstride);
                          lVar32 = lVar53 + (iVar22 - local_be8.begin.y) * lVar54 * 8 +
                                   (long)(~local_be8.begin.x + iVar14) * 8;
                          lVar39 = lVar53 + (iVar24 - local_be8.begin.y) * lVar54 * 8 +
                                   (long)(~local_be8.begin.x + iVar14) * 8;
                          lVar19 = CONCAT44(local_be8.kstride._4_4_,(int)local_be8.kstride);
                          lVar55 = (iVar17 - local_be8.begin.z) * lVar19;
                          dVar80 = *(double *)(lVar32 + lVar55 * 8);
                          dVar81 = *(double *)(lVar39 + lVar55 * 8);
                          lVar62 = (iVar51 - local_be8.begin.z) * lVar19;
                          dVar82 = *(double *)(lVar32 + lVar62 * 8);
                          lVar55 = ((long)local_c60 - (long)local_be8.begin.z) * lVar19 * 8;
                          dVar83 = *(double *)(lVar39 + lVar62 * 8);
                          lVar62 = ((long)local_c78 - (long)local_be8.begin.y) * lVar54 * 8;
                          dVar84 = *(double *)
                                    (lVar55 + lVar62 + lVar37 * -8 + lVar53 + (long)pp_Var58 * 8);
                          lVar32 = (lVar20 - local_be8.begin.y) * lVar54 * 8;
                          dVar68 = *(double *)
                                    (lVar55 + lVar32 + lVar37 * -8 + lVar53 + (long)pp_Var58 * 8);
                          lVar39 = (lVar18 - local_be8.begin.z) * lVar19 * 8;
                          dVar69 = *(double *)
                                    (lVar62 + lVar39 + lVar37 * -8 + lVar53 + (long)pp_Var58 * 8);
                          dVar70 = *(double *)
                                    (lVar39 + lVar32 + lVar37 * -8 + lVar53 + (long)pp_Var58 * 8);
                          facy_4 = (((dVar83 - dVar81) +
                                    (dVar70 - dVar68) + (dVar70 - dVar68) +
                                    (dVar69 - dVar84) * 4.0 + (dVar82 - dVar80) + (dVar82 - dVar80))
                                    * dVar93 +
                                   ((dVar83 - dVar70) +
                                   (dVar82 - dVar69) + (dVar82 - dVar69) +
                                   (dVar80 - dVar84) * 4.0 + (dVar81 - dVar68) + (dVar81 - dVar68))
                                   * dVar91 +
                                   ((dVar83 - dVar82) +
                                   (dVar70 - dVar69) + (dVar70 - dVar69) +
                                   (dVar68 - dVar84) * 4.0 + (dVar81 - dVar80) + (dVar81 - dVar80))
                                   * dVar92) * *pRVar21 + 0.0;
                        }
                        bVar13 = Box::contains(&bx_2,iVar14,iVar24,iVar51);
                        if (bVar13) {
                          pRVar21 = mlndlap_Ax_fine_contrib<4>::anon_class_8_1_ba1d7831::operator()
                                              ((anon_class_8_1_ba1d7831 *)&local_9d8,iVar14,iVar24,
                                               iVar51);
                          lVar37 = (long)local_be8.begin.x;
                          lVar39 = (long)((iVar14 - local_be8.begin.x) + 1);
                          lVar53 = CONCAT44(local_be8.p._4_4_,(int)local_be8.p);
                          lVar54 = CONCAT44(local_be8.jstride._4_4_,(int)local_be8.jstride);
                          lVar32 = lVar53 + (iVar22 - local_be8.begin.y) * lVar54 * 8 + lVar39 * 8;
                          lVar39 = lVar53 + (iVar24 - local_be8.begin.y) * lVar54 * 8 + lVar39 * 8;
                          lVar19 = CONCAT44(local_be8.kstride._4_4_,(int)local_be8.kstride);
                          lVar55 = (iVar17 - local_be8.begin.z) * lVar19;
                          dVar80 = *(double *)(lVar32 + lVar55 * 8);
                          dVar81 = *(double *)(lVar39 + lVar55 * 8);
                          lVar62 = (iVar51 - local_be8.begin.z) * lVar19;
                          dVar82 = *(double *)(lVar32 + lVar62 * 8);
                          lVar55 = ((long)local_c60 - (long)local_be8.begin.z) * lVar19 * 8;
                          dVar83 = *(double *)(lVar39 + lVar62 * 8);
                          lVar62 = ((long)local_c78 - (long)local_be8.begin.y) * lVar54 * 8;
                          dVar84 = *(double *)
                                    (lVar55 + lVar62 + lVar37 * -8 + lVar53 + (long)pp_Var58 * 8);
                          lVar32 = (lVar20 - local_be8.begin.y) * lVar54 * 8;
                          dVar68 = *(double *)
                                    (lVar55 + lVar32 + lVar37 * -8 + lVar53 + (long)pp_Var58 * 8);
                          lVar39 = (lVar18 - local_be8.begin.z) * lVar19 * 8;
                          dVar69 = *(double *)
                                    (lVar62 + lVar39 + lVar37 * -8 + lVar53 + (long)pp_Var58 * 8);
                          dVar70 = *(double *)
                                    (lVar39 + lVar32 + lVar37 * -8 + lVar53 + (long)pp_Var58 * 8);
                          facy_4 = facy_4 + (((dVar83 - dVar81) +
                                             (dVar70 - dVar68) + (dVar70 - dVar68) +
                                             (dVar69 - dVar84) * 4.0 +
                                             (dVar82 - dVar80) + (dVar82 - dVar80)) * dVar93 +
                                            ((dVar83 - dVar70) +
                                            (dVar82 - dVar69) + (dVar82 - dVar69) +
                                            (dVar80 - dVar84) * 4.0 +
                                            (dVar81 - dVar68) + (dVar81 - dVar68)) * dVar91 +
                                            ((dVar83 - dVar82) +
                                            (dVar70 - dVar69) + (dVar70 - dVar69) +
                                            (dVar68 - dVar84) * 4.0 +
                                            (dVar81 - dVar80) + (dVar81 - dVar80)) * dVar92) *
                                            *pRVar21;
                        }
                        bVar13 = Box::contains(&bx_2,iVar36,iVar22,iVar51);
                        if (bVar13) {
                          pRVar21 = mlndlap_Ax_fine_contrib<4>::anon_class_8_1_ba1d7831::operator()
                                              ((anon_class_8_1_ba1d7831 *)&local_9d8,iVar36,iVar22,
                                               iVar51);
                          lVar37 = (long)local_be8.begin.x;
                          lVar53 = CONCAT44(local_be8.p._4_4_,(int)local_be8.p);
                          lVar54 = CONCAT44(local_be8.jstride._4_4_,(int)local_be8.jstride);
                          lVar32 = lVar53 + (iVar22 - local_be8.begin.y) * lVar54 * 8 +
                                   (long)(~local_be8.begin.x + iVar14) * 8;
                          lVar39 = lVar53 + (iVar16 - local_be8.begin.y) * lVar54 * 8 +
                                   (long)(~local_be8.begin.x + iVar14) * 8;
                          lVar19 = CONCAT44(local_be8.kstride._4_4_,(int)local_be8.kstride);
                          lVar55 = (iVar17 - local_be8.begin.z) * lVar19;
                          dVar80 = *(double *)(lVar32 + lVar55 * 8);
                          dVar81 = *(double *)(lVar39 + lVar55 * 8);
                          lVar62 = (iVar51 - local_be8.begin.z) * lVar19;
                          dVar82 = *(double *)(lVar32 + lVar62 * 8);
                          lVar55 = ((long)local_c60 - (long)local_be8.begin.z) * lVar19 * 8;
                          dVar83 = *(double *)(lVar39 + lVar62 * 8);
                          lVar62 = ((long)local_c78 - (long)local_be8.begin.y) * lVar54 * 8;
                          dVar84 = *(double *)
                                    (lVar55 + lVar62 + lVar37 * -8 + lVar53 + (long)pp_Var58 * 8);
                          lVar32 = (long)((int)local_c48 - local_be8.begin.y) * lVar54 * 8;
                          dVar68 = *(double *)
                                    (lVar55 + lVar32 + lVar37 * -8 + lVar53 + (long)pp_Var58 * 8);
                          lVar39 = (lVar18 - local_be8.begin.z) * lVar19 * 8;
                          dVar69 = *(double *)
                                    (lVar62 + lVar39 + lVar37 * -8 + lVar53 + (long)pp_Var58 * 8);
                          dVar70 = *(double *)
                                    (lVar39 + lVar32 + lVar37 * -8 + lVar53 + (long)pp_Var58 * 8);
                          facy_4 = facy_4 + (((dVar83 - dVar81) +
                                             (dVar70 - dVar68) + (dVar70 - dVar68) +
                                             (dVar69 - dVar84) * 4.0 +
                                             (dVar82 - dVar80) + (dVar82 - dVar80)) * dVar93 +
                                            ((dVar83 - dVar70) +
                                            (dVar82 - dVar69) + (dVar82 - dVar69) +
                                            (dVar80 - dVar84) * 4.0 +
                                            (dVar81 - dVar68) + (dVar81 - dVar68)) * dVar91 +
                                            ((dVar83 - dVar82) +
                                            (dVar70 - dVar69) + (dVar70 - dVar69) +
                                            (dVar68 - dVar84) * 4.0 +
                                            (dVar81 - dVar80) + (dVar81 - dVar80)) * dVar92) *
                                            *pRVar21;
                        }
                        bVar13 = Box::contains(&bx_2,iVar14,iVar22,iVar51);
                        if (bVar13) {
                          pRVar21 = mlndlap_Ax_fine_contrib<4>::anon_class_8_1_ba1d7831::operator()
                                              ((anon_class_8_1_ba1d7831 *)&local_9d8,iVar14,iVar22,
                                               iVar51);
                          lVar37 = (long)local_be8.begin.x;
                          lVar39 = (long)((iVar14 - local_be8.begin.x) + 1);
                          lVar53 = CONCAT44(local_be8.p._4_4_,(int)local_be8.p);
                          lVar54 = CONCAT44(local_be8.jstride._4_4_,(int)local_be8.jstride);
                          lVar32 = lVar53 + (iVar22 - local_be8.begin.y) * lVar54 * 8 + lVar39 * 8;
                          lVar39 = lVar53 + (iVar16 - local_be8.begin.y) * lVar54 * 8 + lVar39 * 8;
                          lVar19 = CONCAT44(local_be8.kstride._4_4_,(int)local_be8.kstride);
                          lVar55 = (iVar17 - local_be8.begin.z) * lVar19;
                          dVar80 = *(double *)(lVar32 + lVar55 * 8);
                          dVar81 = *(double *)(lVar39 + lVar55 * 8);
                          lVar62 = (iVar51 - local_be8.begin.z) * lVar19;
                          dVar82 = *(double *)(lVar32 + lVar62 * 8);
                          lVar55 = ((long)local_c60 - (long)local_be8.begin.z) * lVar19 * 8;
                          dVar83 = *(double *)(lVar39 + lVar62 * 8);
                          lVar62 = ((long)local_c78 - (long)local_be8.begin.y) * lVar54 * 8;
                          dVar84 = *(double *)
                                    (lVar55 + lVar62 + lVar37 * -8 + lVar53 + (long)pp_Var58 * 8);
                          lVar32 = (long)((int)local_c48 - local_be8.begin.y) * lVar54 * 8;
                          dVar68 = *(double *)
                                    (lVar55 + lVar32 + lVar37 * -8 + lVar53 + (long)pp_Var58 * 8);
                          lVar39 = (lVar18 - local_be8.begin.z) * lVar19 * 8;
                          dVar69 = *(double *)
                                    (lVar62 + lVar39 + lVar37 * -8 + lVar53 + (long)pp_Var58 * 8);
                          dVar70 = *(double *)
                                    (lVar39 + lVar32 + lVar37 * -8 + lVar53 + (long)pp_Var58 * 8);
                          facy_4 = facy_4 + (((dVar83 - dVar81) +
                                             (dVar70 - dVar68) + (dVar70 - dVar68) +
                                             (dVar69 - dVar84) * 4.0 +
                                             (dVar82 - dVar80) + (dVar82 - dVar80)) * dVar93 +
                                            ((dVar83 - dVar70) +
                                            (dVar82 - dVar69) + (dVar82 - dVar69) +
                                            (dVar80 - dVar84) * 4.0 +
                                            (dVar81 - dVar68) + (dVar81 - dVar68)) * dVar91 +
                                            ((dVar83 - dVar82) +
                                            (dVar70 - dVar69) + (dVar70 - dVar69) +
                                            (dVar68 - dVar84) * 4.0 +
                                            (dVar81 - dVar80) + (dVar81 - dVar80)) * dVar92) *
                                            *pRVar21;
                        }
                        bVar13 = Box::contains(&bx_2,iVar36,iVar24,iVar17);
                        if (bVar13) {
                          pRVar21 = mlndlap_Ax_fine_contrib<4>::anon_class_8_1_ba1d7831::operator()
                                              ((anon_class_8_1_ba1d7831 *)&local_9d8,iVar36,iVar24,
                                               iVar17);
                          lVar37 = (long)local_be8.begin.x;
                          lVar53 = CONCAT44(local_be8.p._4_4_,(int)local_be8.p);
                          lVar54 = CONCAT44(local_be8.jstride._4_4_,(int)local_be8.jstride);
                          lVar32 = lVar53 + (iVar22 - local_be8.begin.y) * lVar54 * 8 +
                                   (long)(~local_be8.begin.x + iVar14) * 8;
                          lVar39 = lVar53 + (iVar24 - local_be8.begin.y) * lVar54 * 8 +
                                   (long)(~local_be8.begin.x + iVar14) * 8;
                          lVar19 = CONCAT44(local_be8.kstride._4_4_,(int)local_be8.kstride);
                          lVar55 = (iVar17 - local_be8.begin.z) * lVar19;
                          dVar80 = *(double *)(lVar32 + lVar55 * 8);
                          dVar81 = *(double *)(lVar39 + lVar55 * 8);
                          lVar62 = (iVar15 - local_be8.begin.z) * lVar19;
                          dVar82 = *(double *)(lVar32 + lVar62 * 8);
                          lVar55 = ((long)local_c60 - (long)local_be8.begin.z) * lVar19 * 8;
                          dVar83 = *(double *)(lVar39 + lVar62 * 8);
                          lVar62 = ((long)local_c78 - (long)local_be8.begin.y) * lVar54 * 8;
                          dVar84 = *(double *)
                                    (lVar55 + lVar62 + lVar37 * -8 + lVar53 + (long)pp_Var58 * 8);
                          lVar32 = (lVar20 - local_be8.begin.y) * lVar54 * 8;
                          dVar68 = *(double *)
                                    (lVar55 + lVar32 + lVar37 * -8 + lVar53 + (long)pp_Var58 * 8);
                          lVar39 = (long)(iVar61 - local_be8.begin.z) * lVar19 * 8;
                          dVar69 = *(double *)
                                    (lVar62 + lVar39 + lVar37 * -8 + lVar53 + (long)pp_Var58 * 8);
                          dVar70 = *(double *)
                                    (lVar39 + lVar32 + lVar37 * -8 + lVar53 + (long)pp_Var58 * 8);
                          facy_4 = facy_4 + (((dVar83 - dVar81) +
                                             (dVar70 - dVar68) + (dVar70 - dVar68) +
                                             (dVar69 - dVar84) * 4.0 +
                                             (dVar82 - dVar80) + (dVar82 - dVar80)) * dVar93 +
                                            ((dVar83 - dVar70) +
                                            (dVar82 - dVar69) + (dVar82 - dVar69) +
                                            (dVar80 - dVar84) * 4.0 +
                                            (dVar81 - dVar68) + (dVar81 - dVar68)) * dVar91 +
                                            ((dVar83 - dVar82) +
                                            (dVar70 - dVar69) + (dVar70 - dVar69) +
                                            (dVar68 - dVar84) * 4.0 +
                                            (dVar81 - dVar80) + (dVar81 - dVar80)) * dVar92) *
                                            *pRVar21;
                        }
                        bVar13 = Box::contains(&bx_2,iVar14,iVar24,iVar17);
                        if (bVar13) {
                          pRVar21 = mlndlap_Ax_fine_contrib<4>::anon_class_8_1_ba1d7831::operator()
                                              ((anon_class_8_1_ba1d7831 *)&local_9d8,iVar14,iVar24,
                                               iVar17);
                          lVar37 = (long)local_be8.begin.x;
                          lVar39 = (long)((iVar14 - local_be8.begin.x) + 1);
                          lVar53 = CONCAT44(local_be8.p._4_4_,(int)local_be8.p);
                          lVar54 = CONCAT44(local_be8.jstride._4_4_,(int)local_be8.jstride);
                          lVar32 = lVar53 + (iVar22 - local_be8.begin.y) * lVar54 * 8 + lVar39 * 8;
                          lVar39 = lVar53 + (iVar24 - local_be8.begin.y) * lVar54 * 8 + lVar39 * 8;
                          lVar19 = CONCAT44(local_be8.kstride._4_4_,(int)local_be8.kstride);
                          lVar55 = (iVar17 - local_be8.begin.z) * lVar19;
                          dVar80 = *(double *)(lVar32 + lVar55 * 8);
                          dVar81 = *(double *)(lVar39 + lVar55 * 8);
                          lVar62 = (iVar15 - local_be8.begin.z) * lVar19;
                          dVar82 = *(double *)(lVar32 + lVar62 * 8);
                          lVar55 = ((long)local_c60 - (long)local_be8.begin.z) * lVar19 * 8;
                          dVar83 = *(double *)(lVar39 + lVar62 * 8);
                          lVar62 = ((long)local_c78 - (long)local_be8.begin.y) * lVar54 * 8;
                          dVar84 = *(double *)
                                    (lVar55 + lVar62 + lVar37 * -8 + lVar53 + (long)pp_Var58 * 8);
                          lVar32 = (lVar20 - local_be8.begin.y) * lVar54 * 8;
                          dVar68 = *(double *)
                                    (lVar55 + lVar32 + lVar37 * -8 + lVar53 + (long)pp_Var58 * 8);
                          lVar39 = (long)(iVar61 - local_be8.begin.z) * lVar19 * 8;
                          dVar69 = *(double *)
                                    (lVar62 + lVar39 + lVar37 * -8 + lVar53 + (long)pp_Var58 * 8);
                          dVar70 = *(double *)
                                    (lVar39 + lVar32 + lVar37 * -8 + lVar53 + (long)pp_Var58 * 8);
                          facy_4 = facy_4 + (((dVar83 - dVar81) +
                                             (dVar70 - dVar68) + (dVar70 - dVar68) +
                                             (dVar69 - dVar84) * 4.0 +
                                             (dVar82 - dVar80) + (dVar82 - dVar80)) * dVar93 +
                                            ((dVar83 - dVar70) +
                                            (dVar82 - dVar69) + (dVar82 - dVar69) +
                                            (dVar80 - dVar84) * 4.0 +
                                            (dVar81 - dVar68) + (dVar81 - dVar68)) * dVar91 +
                                            ((dVar83 - dVar82) +
                                            (dVar70 - dVar69) + (dVar70 - dVar69) +
                                            (dVar68 - dVar84) * 4.0 +
                                            (dVar81 - dVar80) + (dVar81 - dVar80)) * dVar92) *
                                            *pRVar21;
                        }
                        bVar13 = Box::contains(&bx_2,iVar36,iVar22,iVar17);
                        if (bVar13) {
                          pRVar21 = mlndlap_Ax_fine_contrib<4>::anon_class_8_1_ba1d7831::operator()
                                              ((anon_class_8_1_ba1d7831 *)&local_9d8,iVar36,iVar22,
                                               iVar17);
                          lVar37 = (long)local_be8.begin.x;
                          lVar53 = CONCAT44(local_be8.p._4_4_,(int)local_be8.p);
                          lVar54 = CONCAT44(local_be8.jstride._4_4_,(int)local_be8.jstride);
                          lVar32 = lVar53 + (iVar22 - local_be8.begin.y) * lVar54 * 8 +
                                   (long)(~local_be8.begin.x + iVar14) * 8;
                          lVar39 = lVar53 + (iVar16 - local_be8.begin.y) * lVar54 * 8 +
                                   (long)(~local_be8.begin.x + iVar14) * 8;
                          lVar19 = CONCAT44(local_be8.kstride._4_4_,(int)local_be8.kstride);
                          lVar55 = (iVar17 - local_be8.begin.z) * lVar19;
                          dVar80 = *(double *)(lVar32 + lVar55 * 8);
                          dVar81 = *(double *)(lVar39 + lVar55 * 8);
                          lVar62 = (iVar15 - local_be8.begin.z) * lVar19;
                          dVar82 = *(double *)(lVar32 + lVar62 * 8);
                          lVar55 = ((long)local_c60 - (long)local_be8.begin.z) * lVar19 * 8;
                          dVar83 = *(double *)(lVar39 + lVar62 * 8);
                          lVar62 = ((long)local_c78 - (long)local_be8.begin.y) * lVar54 * 8;
                          dVar84 = *(double *)
                                    (lVar55 + lVar62 + lVar37 * -8 + lVar53 + (long)pp_Var58 * 8);
                          lVar32 = (long)((int)local_c48 - local_be8.begin.y) * lVar54 * 8;
                          dVar68 = *(double *)
                                    (lVar55 + lVar32 + lVar37 * -8 + lVar53 + (long)pp_Var58 * 8);
                          lVar39 = (long)(iVar61 - local_be8.begin.z) * lVar19 * 8;
                          dVar69 = *(double *)
                                    (lVar62 + lVar39 + lVar37 * -8 + lVar53 + (long)pp_Var58 * 8);
                          dVar70 = *(double *)
                                    (lVar39 + lVar32 + lVar37 * -8 + lVar53 + (long)pp_Var58 * 8);
                          facy_4 = facy_4 + (((dVar83 - dVar81) +
                                             (dVar70 - dVar68) + (dVar70 - dVar68) +
                                             (dVar69 - dVar84) * 4.0 +
                                             (dVar82 - dVar80) + (dVar82 - dVar80)) * dVar93 +
                                            ((dVar83 - dVar70) +
                                            (dVar82 - dVar69) + (dVar82 - dVar69) +
                                            (dVar80 - dVar84) * 4.0 +
                                            (dVar81 - dVar68) + (dVar81 - dVar68)) * dVar91 +
                                            ((dVar83 - dVar82) +
                                            (dVar70 - dVar69) + (dVar70 - dVar69) +
                                            (dVar68 - dVar84) * 4.0 +
                                            (dVar81 - dVar80) + (dVar81 - dVar80)) * dVar92) *
                                            *pRVar21;
                        }
                        bVar13 = Box::contains(&bx_2,iVar14,iVar22,iVar17);
                        if (bVar13) {
                          pRVar21 = mlndlap_Ax_fine_contrib<4>::anon_class_8_1_ba1d7831::operator()
                                              ((anon_class_8_1_ba1d7831 *)&local_9d8,iVar14,iVar22,
                                               iVar17);
                          lVar37 = (long)local_be8.begin.x;
                          lVar39 = (long)((iVar14 - local_be8.begin.x) + 1);
                          lVar53 = CONCAT44(local_be8.p._4_4_,(int)local_be8.p);
                          lVar54 = CONCAT44(local_be8.jstride._4_4_,(int)local_be8.jstride);
                          lVar32 = lVar53 + (iVar22 - local_be8.begin.y) * lVar54 * 8 + lVar39 * 8;
                          lVar39 = lVar53 + (iVar16 - local_be8.begin.y) * lVar54 * 8 + lVar39 * 8;
                          lVar19 = CONCAT44(local_be8.kstride._4_4_,(int)local_be8.kstride);
                          lVar55 = (iVar17 - local_be8.begin.z) * lVar19;
                          dVar80 = *(double *)(lVar32 + lVar55 * 8);
                          dVar81 = *(double *)(lVar39 + lVar55 * 8);
                          lVar62 = (iVar15 - local_be8.begin.z) * lVar19;
                          dVar82 = *(double *)(lVar32 + lVar62 * 8);
                          lVar55 = ((long)local_c60 - (long)local_be8.begin.z) * lVar19 * 8;
                          dVar83 = *(double *)(lVar39 + lVar62 * 8);
                          lVar62 = ((long)local_c78 - (long)local_be8.begin.y) * lVar54 * 8;
                          dVar84 = *(double *)
                                    (lVar55 + lVar62 + lVar37 * -8 + lVar53 + (long)pp_Var58 * 8);
                          lVar32 = (long)((int)local_c48 - local_be8.begin.y) * lVar54 * 8;
                          dVar68 = *(double *)
                                    (lVar55 + lVar32 + lVar37 * -8 + lVar53 + (long)pp_Var58 * 8);
                          lVar39 = (long)(iVar61 - local_be8.begin.z) * lVar19 * 8;
                          dVar69 = *(double *)
                                    (lVar62 + lVar39 + lVar37 * -8 + lVar53 + (long)pp_Var58 * 8);
                          dVar70 = *(double *)
                                    (lVar39 + lVar32 + lVar37 * -8 + lVar53 + (long)pp_Var58 * 8);
                          facy_4 = facy_4 + (((dVar83 - dVar81) +
                                             (dVar70 - dVar68) + (dVar70 - dVar68) +
                                             (dVar69 - dVar84) * 4.0 +
                                             (dVar82 - dVar80) + (dVar82 - dVar80)) * dVar93 +
                                            ((dVar83 - dVar70) +
                                            (dVar82 - dVar69) + (dVar82 - dVar69) +
                                            (dVar80 - dVar84) * 4.0 +
                                            (dVar81 - dVar68) + (dVar81 - dVar68)) * dVar91 +
                                            ((dVar83 - dVar82) +
                                            (dVar70 - dVar69) + (dVar70 - dVar69) +
                                            (dVar68 - dVar84) * 4.0 +
                                            (dVar81 - dVar80) + (dVar81 - dVar80)) * dVar92) *
                                            *pRVar21;
                        }
                      }
                      dVar79 = dVar79 + (double)((iVar26 + 4) * local_af8._0_4_) * facy_4;
                      pp_Var58 = (_func_int **)((long)pp_Var58 + 1);
                      iVar23 = iVar23 + -1;
                    }
                    iVar24 = local_ac8._0_4_ + 1;
                    local_c78 = (double *)((long)local_c78 + 1);
                    local_c48 = (ulong)((int)local_c48 + 1);
                    iVar22 = iVar16;
                  }
                  iVar51 = local_b88._0_4_ + 1;
                  local_c60 = (double *)((long)local_c60 + 1);
                  iVar17 = iVar15;
                }
                dVar79 = dVar79 * 0.000244140625;
                uVar28 = (ulong)local_a50 & 0xffffffff;
                puVar46 = local_a08;
                puVar47 = local_9b8;
                pdVar66 = local_b58;
                lVar18 = local_a98;
                iVar22 = (int)local_b60;
                iVar24 = (int)local_b68;
                iVar17 = (int)local_b00;
              }
              *(double *)
               (((long)local_a40 - (long)mfi_2.beginIndex) *
                CONCAT44(mfi_2.fabArray._4_4_,(int)mfi_2.fabArray) * 8 +
                CONCAT44(mfi_2.m_fa._M_t.
                         super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                         .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_,
                         (int)mfi_2.m_fa._M_t.
                              super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                              .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl) +
                (lVar18 - mfi_2.currentIndex) * 8 +
               ((long)local_a48 - (long)mfi_2.endIndex) *
               CONCAT44(mfi_2.tile_size.vect[1],mfi_2.tile_size.vect[0]) * 8) = dVar79;
              uVar63 = (ulong)(iVar17 + 1);
              iVar24 = iVar24 + 4;
              iVar22 = iVar22 + 4;
            }
            uVar28 = (ulong)((int)uVar28 + 1);
            local_ab8 = (double *)CONCAT44(local_ab8._4_4_,(int)local_ab8 + 4);
          }
          pdVar66 = (double *)(ulong)((int)pdVar66 + 1);
          local_a70 = (double *)CONCAT44(local_a70._4_4_,(int)local_a70 + 4);
        }
      }
    }
    MFIter::operator++((MFIter *)&fine_contrib_on_crse);
  }
  MFIter::~MFIter((MFIter *)&fine_contrib_on_crse);
  mfi_2.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_ = 0;
  mfi_2.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_4_ = 1;
  mfi_2.fabArray._0_4_ = 0;
  mfi_2.fabArray._4_4_ = 0;
  mfi_2.tile_size.vect[0] = 0;
  mfi_2.tile_size.vect[1] = 0;
  mfi_2.tile_size.vect[2] = 0;
  mfi_2.flags = '\0';
  mfi_2._29_3_ = 0;
  mfi_2.currentIndex = 0;
  mfi_2.beginIndex = 0;
  local_968.p = (double *)&PTR__FabFactory_007d2928;
  MultiFab::MultiFab(&fine_contrib_on_crse,
                     &(crse_sol->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray,
                     &(crse_sol->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.
                      distributionMap,1,0,(MFInfo *)&mfi_2,
                     (FabFactory<amrex::FArrayBox> *)&local_968);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&mfi_2.tile_size);
  FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&fine_contrib_on_crse.super_FabArray<amrex::FArrayBox>,0.0);
  PVar219 = Geometry::periodicity(this_00);
  mfi_2.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_4_ = PVar219.period.vect[0];
  mfi_2.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_ = PVar219.period.vect[1];
  mfi_2.fabArray._0_4_ = PVar219.period.vect[2];
  FabArray<amrex::FArrayBox>::ParallelAdd
            (&fine_contrib_on_crse.super_FabArray<amrex::FArrayBox>,
             &fine_contrib.super_FabArray<amrex::FArrayBox>,(Periodicity *)&mfi_2);
  local_9b8 = (local_9f8->super_MLNodeLinOp).m_cc_fine_mask.
              super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
              .
              super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_b60 = (FabArray<amrex::IArrayBox> *)
              **(undefined8 **)
                &(local_9f8->super_MLNodeLinOp).m_dirichlet_mask.
                 super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                 .
                 super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar67].
                 super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                 .
                 super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
  ;
  local_b68 = (local_9f8->super_MLNodeLinOp).m_nd_fine_mask.
              super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
              .
              super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_a08 = (local_9f8->super_MLNodeLinOp).m_has_fine_bndry.
              super_vector<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>,_std::allocator<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>_>_>
              .
              super__Vector_base<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>,_std::allocator<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_b00 = *(undefined8 **)
               &(local_9f8->m_sigma).
                super_vector<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
                .
                super__Vector_base<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar67].
                super_vector<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
                .
                super__Vector_base<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>,_std::allocator<std::array<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_3UL>_>_>
  ;
  MFIter::MFIter(&mfi_2,(FabArrayBase *)res,&local_344);
  dVar105 = dVar105 * 0.027777777777777776 * dVar105;
  dVar106 = dVar106 * 0.027777777777777776 * dVar106;
  dVar76 = dVar76 * 0.027777777777777776 * dVar76;
  while( true ) {
    if (mfi_2.endIndex <= mfi_2.currentIndex) break;
    iVar24 = mfi_2.currentIndex;
    if (mfi_2.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
      iVar24 = ((mfi_2.local_index_map)->super_vector<int,_std::allocator<int>_>).
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start[mfi_2.currentIndex];
    }
    if (*(int *)(*(long *)((long)local_a08[local_7d8]._M_t.
                                 super___uniq_ptr_impl<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>
                          + 0xf0) + (long)iVar24 * 4) != 0) {
      MFIter::tilebox(&local_9d8,&mfi_2);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((Array4<double> *)&local_968,&res->super_FabArray<amrex::FArrayBox>,&mfi_2);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_b48,&crse_sol->super_FabArray<amrex::FArrayBox>,&mfi_2);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_be8,&crse_rhs->super_FabArray<amrex::FArrayBox>,&mfi_2);
      FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>(&local_818,local_b60,&mfi_2);
      lVar67 = local_7d8;
      FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                ((Array4<const_int> *)&local_520,
                 (FabArray<amrex::IArrayBox> *)
                 local_b68[local_7d8]._M_t.
                 super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,
                 &mfi_2);
      FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                (&local_560,
                 (FabArray<amrex::IArrayBox> *)
                 local_9b8[lVar67]._M_t.
                 super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,
                 &mfi_2);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                ((Array4<const_double> *)&result,
                 &fine_contrib_on_crse.super_FabArray<amrex::FArrayBox>,&mfi_2);
      iVar22 = bx.smallend.vect[2];
      iVar24 = local_9d8.bigend.vect[0];
      if ((FabArray<amrex::FArrayBox> *)*local_b00 == (FabArray<amrex::FArrayBox> *)0x0) {
        dVar91 = local_9f8->m_const_sigma;
        local_b88 = (double)(long)local_9d8.smallend.vect[0];
        local_a88 = (double *)(long)local_9d8.smallend.vect[1];
        local_b80 = CONCAT44(local_b80._4_4_,local_9d8.bigend.vect[1]);
        local_b70 = (double *)CONCAT44(local_b70._4_4_,local_9d8.bigend.vect[2]);
        local_af8 = (double)(bx.smallend.vect._0_8_ & 0xffffffff);
        iVar51 = bx.smallend.vect[1];
        local_ae8 = (double *)(ulong)(uint)bx.bigend.vect[0];
        local_b98 = (double *)CONCAT44(local_b98._4_4_,bx.bigend.vect[1]);
        local_ba0 = (_func_int **)CONCAT44(local_ba0._4_4_,bx.bigend.vect[2]);
        iVar61 = (int)local_8c0;
        iVar15 = local_8c0._4_4_;
        local_b90 = *(double *)
                     (&DAT_0071a420 + (ulong)(((int)local_8d0 - 0x66U & 0xfffffffb) == 0) * 8);
        local_ac8 = (double)CONCAT44(local_ac8._4_4_,local_8b8);
        iVar16 = local_9d8.smallend.vect[2] + -1;
        local_a38 = (double)CONCAT44(local_a38._4_4_,local_9d8.smallend.vect[1] + -1);
        local_b58 = (double *)CONCAT44(local_b58._4_4_,local_9d8.smallend.vect[1] + 1);
        local_ba8 = CONCAT44(local_ba8._4_4_,local_8d0._4_4_);
        local_b78 = (double *)CONCAT44(local_b78._4_4_,local_8c8);
        lVar67 = (long)local_9d8.smallend.vect[2];
        iVar17 = local_9d8.smallend.vect[2];
        while( true ) {
          iVar17 = iVar17 + 1;
          iVar23 = (int)lVar67;
          if ((int)local_b70 < iVar23) break;
          local_b50 = (double *)CONCAT44(local_b50._4_4_,iVar16);
          lVar18 = (long)iVar16;
          iVar16 = iVar23 + -1;
          local_c18 = (ulong)local_b58 & 0xffffffff;
          local_ad8 = (double)CONCAT44(local_ad8._4_4_,local_a38._0_4_);
          pdVar66 = local_a88;
          while( true ) {
            iVar14 = (int)pdVar66;
            if ((int)local_b80 < iVar14) break;
            lVar20 = (long)local_ad8._0_4_;
            iVar26 = iVar14 + -1;
            dVar92 = local_b88;
            while( true ) {
              iVar36 = SUB84(dVar92,0);
              if (iVar24 < iVar36) break;
              if ((local_818.p
                   [((lVar67 - local_818.begin.z) * local_818.kstride +
                    ((long)pdVar66 - (long)local_818.begin.y) * local_818.jstride + (long)dVar92) -
                    (long)local_818.begin.x] == 0) &&
                 (*(int *)((long)local_520.p +
                          (long)dVar92 * 4 +
                          ((long)pdVar66 - (long)local_520.begin.y) * local_520.jstride * 4 +
                          (lVar67 - local_520.begin.z) * local_520.kstride * 4 +
                          (long)local_520.begin.x * -4) == 1)) {
                bx_2.smallend.vect._0_8_ = &local_560;
                bx_2._8_8_ = &local_360;
                iVar48 = iVar36 + -1;
                bVar13 = mlndlap_res_cf_contrib_cs::anon_class_16_2_98e5bd77::operator()
                                   ((anon_class_16_2_98e5bd77 *)&bx_2,iVar48,iVar26,iVar16);
                facx = 0.0;
                if (bVar13) {
                  lVar32 = (long)local_b48.begin.x;
                  lVar54 = (long)(~local_b48.begin.x + iVar36);
                  lVar53 = (iVar14 - local_b48.begin.y) * local_b48.jstride;
                  lVar19 = (iVar26 - local_b48.begin.y) * local_b48.jstride;
                  lVar39 = (iVar23 - local_b48.begin.z) * local_b48.kstride;
                  dVar93 = local_b48.p[lVar53 + lVar54 + lVar39];
                  dVar79 = local_b48.p[lVar19 + lVar54 + lVar39];
                  lVar39 = (iVar16 - local_b48.begin.z) * local_b48.kstride;
                  dVar80 = local_b48.p[lVar53 + lVar54 + lVar39];
                  lVar37 = (lVar67 - local_b48.begin.z) * local_b48.kstride * 8;
                  dVar81 = local_b48.p[lVar19 + lVar54 + lVar39];
                  lVar53 = ((long)pdVar66 - (long)local_b48.begin.y) * local_b48.jstride * 8;
                  dVar82 = *(double *)
                            ((long)local_b48.p + (long)dVar92 * 8 + lVar37 + lVar53 + lVar32 * -8);
                  lVar54 = (lVar20 - local_b48.begin.y) * local_b48.jstride * 8;
                  dVar83 = *(double *)
                            ((long)local_b48.p + (long)dVar92 * 8 + lVar37 + lVar54 + lVar32 * -8);
                  lVar39 = (lVar18 - local_b48.begin.z) * local_b48.kstride * 8;
                  dVar84 = *(double *)
                            ((long)local_b48.p + (long)dVar92 * 8 + lVar53 + lVar39 + lVar32 * -8);
                  dVar68 = *(double *)
                            ((long)local_b48.p + (long)dVar92 * 8 + lVar39 + lVar54 + lVar32 * -8);
                  facx = (((dVar81 - dVar79) +
                          (dVar68 - dVar83) + (dVar68 - dVar83) +
                          (dVar84 - dVar82) * 4.0 + (dVar80 - dVar93) + (dVar80 - dVar93)) * dVar76
                         + ((dVar81 - dVar68) +
                           (dVar80 - dVar84) + (dVar80 - dVar84) +
                           (dVar93 - dVar82) * 4.0 + (dVar79 - dVar83) + (dVar79 - dVar83)) *
                           dVar105 + ((dVar81 - dVar80) +
                                     (dVar68 - dVar84) + (dVar68 - dVar84) +
                                     (dVar83 - dVar82) * 4.0 + (dVar79 - dVar93) + (dVar79 - dVar93)
                                     ) * dVar106) * dVar91 + 0.0;
                }
                bVar13 = mlndlap_res_cf_contrib_cs::anon_class_16_2_98e5bd77::operator()
                                   ((anon_class_16_2_98e5bd77 *)&bx_2,iVar36,iVar26,iVar16);
                if (bVar13) {
                  lVar32 = (long)local_b48.begin.x;
                  lVar54 = (long)((iVar36 - local_b48.begin.x) + 1);
                  lVar53 = (iVar14 - local_b48.begin.y) * local_b48.jstride;
                  lVar19 = (iVar26 - local_b48.begin.y) * local_b48.jstride;
                  lVar39 = (iVar23 - local_b48.begin.z) * local_b48.kstride;
                  dVar93 = local_b48.p[lVar53 + lVar54 + lVar39];
                  dVar79 = local_b48.p[lVar19 + lVar54 + lVar39];
                  lVar39 = (iVar16 - local_b48.begin.z) * local_b48.kstride;
                  dVar80 = local_b48.p[lVar53 + lVar54 + lVar39];
                  lVar37 = (lVar67 - local_b48.begin.z) * local_b48.kstride * 8;
                  dVar81 = local_b48.p[lVar19 + lVar54 + lVar39];
                  lVar53 = ((long)pdVar66 - (long)local_b48.begin.y) * local_b48.jstride * 8;
                  dVar82 = *(double *)
                            ((long)local_b48.p + (long)dVar92 * 8 + lVar37 + lVar53 + lVar32 * -8);
                  lVar54 = (lVar20 - local_b48.begin.y) * local_b48.jstride * 8;
                  dVar83 = *(double *)
                            ((long)local_b48.p + (long)dVar92 * 8 + lVar37 + lVar54 + lVar32 * -8);
                  lVar39 = (lVar18 - local_b48.begin.z) * local_b48.kstride * 8;
                  dVar84 = *(double *)
                            ((long)local_b48.p + (long)dVar92 * 8 + lVar53 + lVar39 + lVar32 * -8);
                  dVar68 = *(double *)
                            ((long)local_b48.p + (long)dVar92 * 8 + lVar39 + lVar54 + lVar32 * -8);
                  facx = facx + (((dVar81 - dVar79) +
                                 (dVar68 - dVar83) + (dVar68 - dVar83) +
                                 (dVar84 - dVar82) * 4.0 + (dVar80 - dVar93) + (dVar80 - dVar93)) *
                                 dVar76 + ((dVar81 - dVar68) +
                                          (dVar80 - dVar84) + (dVar80 - dVar84) +
                                          (dVar93 - dVar82) * 4.0 +
                                          (dVar79 - dVar83) + (dVar79 - dVar83)) * dVar105 +
                                          ((dVar81 - dVar80) +
                                          (dVar68 - dVar84) + (dVar68 - dVar84) +
                                          (dVar83 - dVar82) * 4.0 +
                                          (dVar79 - dVar93) + (dVar79 - dVar93)) * dVar106) * dVar91
                  ;
                }
                bVar13 = mlndlap_res_cf_contrib_cs::anon_class_16_2_98e5bd77::operator()
                                   ((anon_class_16_2_98e5bd77 *)&bx_2,iVar48,iVar14,iVar16);
                iVar35 = (int)(double *)((long)pdVar66 + 1U);
                if (bVar13) {
                  lVar32 = (long)local_b48.begin.x;
                  lVar19 = (long)(~local_b48.begin.x + iVar36);
                  lVar53 = (iVar14 - local_b48.begin.y) * local_b48.jstride;
                  lVar37 = (iVar35 - local_b48.begin.y) * local_b48.jstride;
                  lVar39 = (iVar23 - local_b48.begin.z) * local_b48.kstride;
                  dVar93 = local_b48.p[lVar53 + lVar19 + lVar39];
                  dVar79 = local_b48.p[lVar37 + lVar19 + lVar39];
                  lVar39 = (iVar16 - local_b48.begin.z) * local_b48.kstride;
                  dVar80 = local_b48.p[lVar53 + lVar19 + lVar39];
                  lVar54 = (lVar67 - local_b48.begin.z) * local_b48.kstride * 8;
                  dVar81 = local_b48.p[lVar37 + lVar19 + lVar39];
                  lVar53 = ((long)pdVar66 - (long)local_b48.begin.y) * local_b48.jstride * 8;
                  dVar82 = *(double *)
                            ((long)local_b48.p + (long)dVar92 * 8 + lVar54 + lVar53 + lVar32 * -8);
                  lVar39 = (long)((int)local_c18 - local_b48.begin.y) * local_b48.jstride * 8;
                  dVar83 = *(double *)
                            ((long)local_b48.p + (long)dVar92 * 8 + lVar54 + lVar39 + lVar32 * -8);
                  lVar54 = (lVar18 - local_b48.begin.z) * local_b48.kstride * 8;
                  dVar84 = *(double *)
                            ((long)local_b48.p + (long)dVar92 * 8 + lVar53 + lVar54 + lVar32 * -8);
                  dVar68 = *(double *)
                            ((long)local_b48.p + (long)dVar92 * 8 + lVar54 + lVar39 + lVar32 * -8);
                  facx = facx + (((dVar81 - dVar79) +
                                 (dVar68 - dVar83) + (dVar68 - dVar83) +
                                 (dVar84 - dVar82) * 4.0 + (dVar80 - dVar93) + (dVar80 - dVar93)) *
                                 dVar76 + ((dVar81 - dVar68) +
                                          (dVar80 - dVar84) + (dVar80 - dVar84) +
                                          (dVar93 - dVar82) * 4.0 +
                                          (dVar79 - dVar83) + (dVar79 - dVar83)) * dVar105 +
                                          ((dVar81 - dVar80) +
                                          (dVar68 - dVar84) + (dVar68 - dVar84) +
                                          (dVar83 - dVar82) * 4.0 +
                                          (dVar79 - dVar93) + (dVar79 - dVar93)) * dVar106) * dVar91
                  ;
                }
                bVar13 = mlndlap_res_cf_contrib_cs::anon_class_16_2_98e5bd77::operator()
                                   ((anon_class_16_2_98e5bd77 *)&bx_2,iVar36,iVar14,iVar16);
                if (bVar13) {
                  lVar32 = (long)local_b48.begin.x;
                  lVar19 = (long)((iVar36 - local_b48.begin.x) + 1);
                  lVar53 = (iVar14 - local_b48.begin.y) * local_b48.jstride;
                  lVar37 = (iVar35 - local_b48.begin.y) * local_b48.jstride;
                  lVar39 = (iVar23 - local_b48.begin.z) * local_b48.kstride;
                  dVar93 = local_b48.p[lVar53 + lVar19 + lVar39];
                  dVar79 = local_b48.p[lVar37 + lVar19 + lVar39];
                  lVar39 = (iVar16 - local_b48.begin.z) * local_b48.kstride;
                  dVar80 = local_b48.p[lVar53 + lVar19 + lVar39];
                  lVar54 = (lVar67 - local_b48.begin.z) * local_b48.kstride * 8;
                  dVar81 = local_b48.p[lVar37 + lVar19 + lVar39];
                  lVar53 = ((long)pdVar66 - (long)local_b48.begin.y) * local_b48.jstride * 8;
                  dVar82 = *(double *)
                            ((long)local_b48.p + (long)dVar92 * 8 + lVar54 + lVar53 + lVar32 * -8);
                  lVar39 = (long)((int)local_c18 - local_b48.begin.y) * local_b48.jstride * 8;
                  dVar83 = *(double *)
                            ((long)local_b48.p + (long)dVar92 * 8 + lVar54 + lVar39 + lVar32 * -8);
                  lVar54 = (lVar18 - local_b48.begin.z) * local_b48.kstride * 8;
                  dVar84 = *(double *)
                            ((long)local_b48.p + (long)dVar92 * 8 + lVar53 + lVar54 + lVar32 * -8);
                  dVar68 = *(double *)
                            ((long)local_b48.p + (long)dVar92 * 8 + lVar54 + lVar39 + lVar32 * -8);
                  facx = facx + (((dVar81 - dVar79) +
                                 (dVar68 - dVar83) + (dVar68 - dVar83) +
                                 (dVar84 - dVar82) * 4.0 + (dVar80 - dVar93) + (dVar80 - dVar93)) *
                                 dVar76 + ((dVar81 - dVar68) +
                                          (dVar80 - dVar84) + (dVar80 - dVar84) +
                                          (dVar93 - dVar82) * 4.0 +
                                          (dVar79 - dVar83) + (dVar79 - dVar83)) * dVar105 +
                                          ((dVar81 - dVar80) +
                                          (dVar68 - dVar84) + (dVar68 - dVar84) +
                                          (dVar83 - dVar82) * 4.0 +
                                          (dVar79 - dVar93) + (dVar79 - dVar93)) * dVar106) * dVar91
                  ;
                }
                bVar13 = mlndlap_res_cf_contrib_cs::anon_class_16_2_98e5bd77::operator()
                                   ((anon_class_16_2_98e5bd77 *)&bx_2,iVar48,iVar26,iVar23);
                iVar33 = (int)(lVar67 + 1);
                if (bVar13) {
                  lVar32 = (long)local_b48.begin.x;
                  lVar54 = (long)(~local_b48.begin.x + iVar36);
                  lVar53 = (iVar14 - local_b48.begin.y) * local_b48.jstride;
                  lVar19 = (iVar26 - local_b48.begin.y) * local_b48.jstride;
                  lVar39 = (iVar23 - local_b48.begin.z) * local_b48.kstride;
                  dVar93 = local_b48.p[lVar53 + lVar54 + lVar39];
                  dVar79 = local_b48.p[lVar19 + lVar54 + lVar39];
                  lVar39 = (iVar33 - local_b48.begin.z) * local_b48.kstride;
                  dVar80 = local_b48.p[lVar53 + lVar54 + lVar39];
                  lVar37 = (lVar67 - local_b48.begin.z) * local_b48.kstride * 8;
                  dVar81 = local_b48.p[lVar19 + lVar54 + lVar39];
                  lVar53 = ((long)pdVar66 - (long)local_b48.begin.y) * local_b48.jstride * 8;
                  dVar82 = *(double *)
                            ((long)local_b48.p + (long)dVar92 * 8 + lVar37 + lVar53 + lVar32 * -8);
                  lVar54 = (lVar20 - local_b48.begin.y) * local_b48.jstride * 8;
                  dVar83 = *(double *)
                            ((long)local_b48.p + (long)dVar92 * 8 + lVar37 + lVar54 + lVar32 * -8);
                  lVar39 = (long)(iVar17 - local_b48.begin.z) * local_b48.kstride * 8;
                  dVar84 = *(double *)
                            ((long)local_b48.p + (long)dVar92 * 8 + lVar53 + lVar39 + lVar32 * -8);
                  dVar68 = *(double *)
                            ((long)local_b48.p + (long)dVar92 * 8 + lVar39 + lVar54 + lVar32 * -8);
                  facx = facx + (((dVar81 - dVar79) +
                                 (dVar68 - dVar83) + (dVar68 - dVar83) +
                                 (dVar84 - dVar82) * 4.0 + (dVar80 - dVar93) + (dVar80 - dVar93)) *
                                 dVar76 + ((dVar81 - dVar68) +
                                          (dVar80 - dVar84) + (dVar80 - dVar84) +
                                          (dVar93 - dVar82) * 4.0 +
                                          (dVar79 - dVar83) + (dVar79 - dVar83)) * dVar105 +
                                          ((dVar81 - dVar80) +
                                          (dVar68 - dVar84) + (dVar68 - dVar84) +
                                          (dVar83 - dVar82) * 4.0 +
                                          (dVar79 - dVar93) + (dVar79 - dVar93)) * dVar106) * dVar91
                  ;
                }
                bVar13 = mlndlap_res_cf_contrib_cs::anon_class_16_2_98e5bd77::operator()
                                   ((anon_class_16_2_98e5bd77 *)&bx_2,iVar36,iVar26,iVar23);
                if (bVar13) {
                  lVar32 = (long)local_b48.begin.x;
                  lVar54 = (long)((iVar36 - local_b48.begin.x) + 1);
                  lVar53 = (iVar14 - local_b48.begin.y) * local_b48.jstride;
                  lVar19 = (iVar26 - local_b48.begin.y) * local_b48.jstride;
                  lVar39 = (iVar23 - local_b48.begin.z) * local_b48.kstride;
                  dVar93 = local_b48.p[lVar53 + lVar54 + lVar39];
                  dVar79 = local_b48.p[lVar19 + lVar54 + lVar39];
                  lVar39 = (iVar33 - local_b48.begin.z) * local_b48.kstride;
                  dVar80 = local_b48.p[lVar53 + lVar54 + lVar39];
                  lVar37 = (lVar67 - local_b48.begin.z) * local_b48.kstride * 8;
                  dVar81 = local_b48.p[lVar19 + lVar54 + lVar39];
                  lVar53 = ((long)pdVar66 - (long)local_b48.begin.y) * local_b48.jstride * 8;
                  dVar82 = *(double *)
                            ((long)local_b48.p + (long)dVar92 * 8 + lVar37 + lVar53 + lVar32 * -8);
                  lVar54 = (lVar20 - local_b48.begin.y) * local_b48.jstride * 8;
                  dVar83 = *(double *)
                            ((long)local_b48.p + (long)dVar92 * 8 + lVar37 + lVar54 + lVar32 * -8);
                  lVar39 = (long)(iVar17 - local_b48.begin.z) * local_b48.kstride * 8;
                  dVar84 = *(double *)
                            ((long)local_b48.p + (long)dVar92 * 8 + lVar53 + lVar39 + lVar32 * -8);
                  dVar68 = *(double *)
                            ((long)local_b48.p + (long)dVar92 * 8 + lVar39 + lVar54 + lVar32 * -8);
                  facx = facx + (((dVar81 - dVar79) +
                                 (dVar68 - dVar83) + (dVar68 - dVar83) +
                                 (dVar84 - dVar82) * 4.0 + (dVar80 - dVar93) + (dVar80 - dVar93)) *
                                 dVar76 + ((dVar81 - dVar68) +
                                          (dVar80 - dVar84) + (dVar80 - dVar84) +
                                          (dVar93 - dVar82) * 4.0 +
                                          (dVar79 - dVar83) + (dVar79 - dVar83)) * dVar105 +
                                          ((dVar81 - dVar80) +
                                          (dVar68 - dVar84) + (dVar68 - dVar84) +
                                          (dVar83 - dVar82) * 4.0 +
                                          (dVar79 - dVar93) + (dVar79 - dVar93)) * dVar106) * dVar91
                  ;
                }
                bVar13 = mlndlap_res_cf_contrib_cs::anon_class_16_2_98e5bd77::operator()
                                   ((anon_class_16_2_98e5bd77 *)&bx_2,iVar48,iVar14,iVar23);
                if (bVar13) {
                  lVar32 = (long)local_b48.begin.x;
                  lVar54 = (long)(~local_b48.begin.x + iVar36);
                  lVar53 = (iVar14 - local_b48.begin.y) * local_b48.jstride;
                  lVar19 = (iVar35 - local_b48.begin.y) * local_b48.jstride;
                  lVar39 = (iVar23 - local_b48.begin.z) * local_b48.kstride;
                  dVar93 = local_b48.p[lVar53 + lVar54 + lVar39];
                  dVar79 = local_b48.p[lVar19 + lVar54 + lVar39];
                  lVar39 = (iVar33 - local_b48.begin.z) * local_b48.kstride;
                  dVar80 = local_b48.p[lVar53 + lVar54 + lVar39];
                  lVar53 = (lVar67 - local_b48.begin.z) * local_b48.kstride * 8;
                  dVar81 = local_b48.p[lVar19 + lVar54 + lVar39];
                  lVar54 = ((long)pdVar66 - (long)local_b48.begin.y) * local_b48.jstride * 8;
                  dVar82 = *(double *)
                            ((long)local_b48.p + (long)dVar92 * 8 + lVar53 + lVar54 + lVar32 * -8);
                  lVar39 = (long)((int)local_c18 - local_b48.begin.y) * local_b48.jstride * 8;
                  dVar83 = *(double *)
                            ((long)local_b48.p + (long)dVar92 * 8 + lVar53 + lVar39 + lVar32 * -8);
                  lVar53 = (long)(iVar17 - local_b48.begin.z) * local_b48.kstride * 8;
                  dVar84 = *(double *)
                            ((long)local_b48.p + (long)dVar92 * 8 + lVar54 + lVar53 + lVar32 * -8);
                  dVar68 = *(double *)
                            ((long)local_b48.p + (long)dVar92 * 8 + lVar53 + lVar39 + lVar32 * -8);
                  facx = facx + (((dVar81 - dVar79) +
                                 (dVar68 - dVar83) + (dVar68 - dVar83) +
                                 (dVar84 - dVar82) * 4.0 + (dVar80 - dVar93) + (dVar80 - dVar93)) *
                                 dVar76 + ((dVar81 - dVar68) +
                                          (dVar80 - dVar84) + (dVar80 - dVar84) +
                                          (dVar93 - dVar82) * 4.0 +
                                          (dVar79 - dVar83) + (dVar79 - dVar83)) * dVar105 +
                                          ((dVar81 - dVar80) +
                                          (dVar68 - dVar84) + (dVar68 - dVar84) +
                                          (dVar83 - dVar82) * 4.0 +
                                          (dVar79 - dVar93) + (dVar79 - dVar93)) * dVar106) * dVar91
                  ;
                }
                bVar13 = mlndlap_res_cf_contrib_cs::anon_class_16_2_98e5bd77::operator()
                                   ((anon_class_16_2_98e5bd77 *)&bx_2,iVar36,iVar14,iVar23);
                if (bVar13) {
                  lVar32 = (long)local_b48.begin.x;
                  lVar54 = (long)((iVar36 - local_b48.begin.x) + 1);
                  lVar53 = (iVar14 - local_b48.begin.y) * local_b48.jstride;
                  lVar19 = (iVar35 - local_b48.begin.y) * local_b48.jstride;
                  lVar39 = (iVar23 - local_b48.begin.z) * local_b48.kstride;
                  dVar93 = local_b48.p[lVar53 + lVar54 + lVar39];
                  dVar79 = local_b48.p[lVar19 + lVar54 + lVar39];
                  lVar39 = (iVar33 - local_b48.begin.z) * local_b48.kstride;
                  dVar80 = local_b48.p[lVar53 + lVar54 + lVar39];
                  lVar53 = (lVar67 - local_b48.begin.z) * local_b48.kstride * 8;
                  dVar81 = local_b48.p[lVar19 + lVar54 + lVar39];
                  lVar54 = ((long)pdVar66 - (long)local_b48.begin.y) * local_b48.jstride * 8;
                  dVar82 = *(double *)
                            ((long)local_b48.p + (long)dVar92 * 8 + lVar53 + lVar54 + lVar32 * -8);
                  lVar39 = (long)((int)local_c18 - local_b48.begin.y) * local_b48.jstride * 8;
                  dVar83 = *(double *)
                            ((long)local_b48.p + (long)dVar92 * 8 + lVar53 + lVar39 + lVar32 * -8);
                  lVar53 = (long)(iVar17 - local_b48.begin.z) * local_b48.kstride * 8;
                  dVar84 = *(double *)
                            ((long)local_b48.p + (long)dVar92 * 8 + lVar54 + lVar53 + lVar32 * -8);
                  dVar68 = *(double *)
                            ((long)local_b48.p + (long)dVar92 * 8 + lVar53 + lVar39 + lVar32 * -8);
                  facx = facx + (((dVar81 - dVar79) +
                                 (dVar68 - dVar83) + (dVar68 - dVar83) +
                                 (dVar84 - dVar82) * 4.0 + (dVar80 - dVar93) + (dVar80 - dVar93)) *
                                 dVar76 + ((dVar81 - dVar68) +
                                          (dVar80 - dVar84) + (dVar80 - dVar84) +
                                          (dVar93 - dVar82) * 4.0 +
                                          (dVar79 - dVar83) + (dVar79 - dVar83)) * dVar105 +
                                          ((dVar81 - dVar80) +
                                          (dVar68 - dVar84) + (dVar68 - dVar84) +
                                          (dVar83 - dVar82) * 4.0 +
                                          (dVar79 - dVar93) + (dVar79 - dVar93)) * dVar106) * dVar91
                  ;
                }
                dVar93 = 1.0;
                if ((local_a8c & 1) != 0) {
                  if ((local_af8._0_4_ != iVar36) ||
                     ((dVar93 = 2.0, iVar61 != 0x66 && (dVar93 = 2.0, iVar61 != 0x6a)))) {
                    dVar93 = 1.0;
                    if ((int)local_ae8 == iVar36) {
                      dVar93 = local_b90;
                    }
                  }
                  if (((iVar51 == iVar14) && ((iVar15 == 0x6a || (iVar15 == 0x66)))) ||
                     (((int)local_b98 == iVar14 &&
                      (((int)local_ba8 == 0x6a || ((int)local_ba8 == 0x66)))))) {
                    dVar93 = dVar93 + dVar93;
                  }
                  if (((iVar22 == iVar23) &&
                      ((local_ac8._0_4_ == 0x6a || (local_ac8._0_4_ == 0x66)))) ||
                     (((int)local_ba0 == iVar23 &&
                      (((int)local_b78 == 0x6a || ((int)local_b78 == 0x66)))))) {
                    dVar93 = dVar93 + dVar93;
                  }
                }
                local_968.p
                [((lVar67 - local_968.begin.z) * local_968.kstride +
                 ((long)pdVar66 - (long)local_968.begin.y) * local_968.jstride + (long)dVar92) -
                 (long)local_968.begin.x] =
                     (double)(*(double *)
                               (((long)pdVar66 - (long)local_be8.begin.y) *
                                CONCAT44(local_be8.jstride._4_4_,(int)local_be8.jstride) * 8 +
                                (lVar67 - local_be8.begin.z) *
                                CONCAT44(local_be8.kstride._4_4_,(int)local_be8.kstride) * 8 +
                                (long)local_be8.begin.x * -8 +
                                CONCAT44(local_be8.p._4_4_,(int)local_be8.p) + (long)dVar92 * 8) -
                             (facx + *(double *)
                                      (((long)pdVar66 - (long)local_984) *
                                       CONCAT44(result.bigend.vect[0],result.smallend.vect[2]) * 8 +
                                       (lVar67 - local_980) *
                                       CONCAT44(result.bigend.vect[2],result.bigend.vect[1]) * 8 +
                                       (long)local_988 * -8 + result.smallend.vect._0_8_ +
                                      (long)dVar92 * 8)) * dVar93);
              }
              dVar92 = (double)((long)dVar92 + 1);
            }
            local_ad8 = (double)CONCAT44(local_ad8._4_4_,local_ad8._0_4_ + 1);
            local_c18 = (ulong)((int)local_c18 + 1);
            pdVar66 = (double *)((long)pdVar66 + 1U);
          }
          iVar16 = (int)local_b50 + 1;
          lVar67 = lVar67 + 1;
        }
      }
      else {
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((Array4<const_double> *)&bx_2,(FabArray<amrex::FArrayBox> *)*local_b00,&mfi_2);
        iVar51 = bx.smallend.vect[2];
        iVar22 = local_9d8.bigend.vect[0];
        local_b88 = (double)(long)local_9d8.smallend.vect[0];
        local_a88 = (double *)(long)local_9d8.smallend.vect[1];
        local_b80 = CONCAT44(local_b80._4_4_,local_9d8.bigend.vect[1]);
        local_b70 = (double *)CONCAT44(local_b70._4_4_,local_9d8.bigend.vect[2]);
        local_af8 = (double)(bx.smallend.vect._0_8_ & 0xffffffff);
        iVar15 = bx.smallend.vect[1];
        local_ae8 = (double *)(ulong)(uint)bx.bigend.vect[0];
        local_b98 = (double *)CONCAT44(local_b98._4_4_,bx.bigend.vect[1]);
        local_ba0 = (_func_int **)CONCAT44(local_ba0._4_4_,bx.bigend.vect[2]);
        iVar17 = (int)local_8c0;
        iVar61 = local_8c0._4_4_;
        local_b90 = *(double *)
                     (&DAT_0071a420 + (ulong)(((int)local_8d0 - 0x66U & 0xfffffffb) == 0) * 8);
        local_ac8 = (double)CONCAT44(local_ac8._4_4_,local_8b8);
        iVar16 = local_9d8.smallend.vect[2] + -1;
        local_a38 = (double)CONCAT44(local_a38._4_4_,local_9d8.smallend.vect[1] + -1);
        local_b58 = (double *)CONCAT44(local_b58._4_4_,local_9d8.smallend.vect[1] + 1);
        local_ba8 = CONCAT44(local_ba8._4_4_,local_8d0._4_4_);
        local_b78 = (double *)CONCAT44(local_b78._4_4_,local_8c8);
        lVar67 = (long)local_9d8.smallend.vect[2];
        iVar24 = local_9d8.smallend.vect[2];
        while( true ) {
          iVar24 = iVar24 + 1;
          iVar23 = (int)lVar67;
          if ((int)local_b70 < iVar23) break;
          local_b50 = (double *)CONCAT44(local_b50._4_4_,iVar16);
          lVar18 = (long)iVar16;
          iVar14 = iVar23 + -1;
          local_bf8 = (ulong)local_b58 & 0xffffffff;
          pdVar66 = local_a88;
          iVar16 = local_a38._0_4_;
          while( true ) {
            iVar26 = (int)pdVar66;
            if ((int)local_b80 < iVar26) break;
            local_ad8 = (double)CONCAT44(local_ad8._4_4_,iVar16);
            lVar20 = (long)iVar16;
            iVar16 = iVar26 + -1;
            dVar91 = local_b88;
            while( true ) {
              iVar36 = SUB84(dVar91,0);
              if (iVar22 < iVar36) break;
              if ((local_818.p
                   [((lVar67 - local_818.begin.z) * local_818.kstride +
                    ((long)pdVar66 - (long)local_818.begin.y) * local_818.jstride + (long)dVar91) -
                    (long)local_818.begin.x] == 0) &&
                 (*(int *)((long)local_520.p +
                          (long)dVar91 * 4 +
                          ((long)pdVar66 - (long)local_520.begin.y) * local_520.jstride * 4 +
                          (lVar67 - local_520.begin.z) * local_520.kstride * 4 +
                          (long)local_520.begin.x * -4) == 1)) {
                local_848.ccmsk = &local_560;
                local_848.ccdom_p = &local_360;
                local_9e0.sig = (Array4<const_double> *)&bx_2;
                iVar48 = iVar36 + -1;
                bVar13 = mlndlap_res_cf_contrib::anon_class_16_2_98e5bd77::operator()
                                   (&local_848,iVar48,iVar16,iVar14);
                facx = 0.0;
                if (bVar13) {
                  pRVar21 = mlndlap_res_cf_contrib::anon_class_8_1_ba1d7831::operator()
                                      (&local_9e0,iVar48,iVar16,iVar14);
                  lVar32 = (long)local_b48.begin.x;
                  lVar54 = (long)(~local_b48.begin.x + iVar36);
                  lVar53 = (iVar26 - local_b48.begin.y) * local_b48.jstride;
                  lVar39 = (iVar16 - local_b48.begin.y) * local_b48.jstride;
                  lVar19 = (iVar23 - local_b48.begin.z) * local_b48.kstride;
                  dVar92 = local_b48.p[lVar53 + lVar54 + lVar19];
                  dVar93 = local_b48.p[lVar39 + lVar54 + lVar19];
                  lVar19 = (iVar14 - local_b48.begin.z) * local_b48.kstride;
                  dVar79 = local_b48.p[lVar53 + lVar54 + lVar19];
                  lVar53 = (lVar67 - local_b48.begin.z) * local_b48.kstride * 8;
                  dVar80 = local_b48.p[lVar39 + lVar54 + lVar19];
                  lVar54 = ((long)pdVar66 - (long)local_b48.begin.y) * local_b48.jstride * 8;
                  dVar81 = *(double *)
                            ((long)local_b48.p + (long)dVar91 * 8 + lVar53 + lVar54 + lVar32 * -8);
                  lVar39 = (lVar20 - local_b48.begin.y) * local_b48.jstride * 8;
                  dVar82 = *(double *)
                            ((long)local_b48.p + (long)dVar91 * 8 + lVar53 + lVar39 + lVar32 * -8);
                  lVar53 = (lVar18 - local_b48.begin.z) * local_b48.kstride * 8;
                  dVar83 = *(double *)
                            ((long)local_b48.p + (long)dVar91 * 8 + lVar54 + lVar53 + lVar32 * -8);
                  dVar84 = *(double *)
                            ((long)local_b48.p + (long)dVar91 * 8 + lVar53 + lVar39 + lVar32 * -8);
                  facx = (((dVar80 - dVar93) +
                          (dVar84 - dVar82) + (dVar84 - dVar82) +
                          (dVar83 - dVar81) * 4.0 + (dVar79 - dVar92) + (dVar79 - dVar92)) * dVar76
                         + ((dVar80 - dVar84) +
                           (dVar79 - dVar83) + (dVar79 - dVar83) +
                           (dVar92 - dVar81) * 4.0 + (dVar93 - dVar82) + (dVar93 - dVar82)) *
                           dVar105 + ((dVar80 - dVar79) +
                                     (dVar84 - dVar83) + (dVar84 - dVar83) +
                                     (dVar82 - dVar81) * 4.0 + (dVar93 - dVar92) + (dVar93 - dVar92)
                                     ) * dVar106) * *pRVar21 + 0.0;
                }
                bVar13 = mlndlap_res_cf_contrib::anon_class_16_2_98e5bd77::operator()
                                   (&local_848,iVar36,iVar16,iVar14);
                if (bVar13) {
                  pRVar21 = mlndlap_res_cf_contrib::anon_class_8_1_ba1d7831::operator()
                                      (&local_9e0,iVar36,iVar16,iVar14);
                  lVar32 = (long)local_b48.begin.x;
                  lVar54 = (long)((iVar36 - local_b48.begin.x) + 1);
                  lVar53 = (iVar26 - local_b48.begin.y) * local_b48.jstride;
                  lVar39 = (iVar16 - local_b48.begin.y) * local_b48.jstride;
                  lVar19 = (iVar23 - local_b48.begin.z) * local_b48.kstride;
                  dVar92 = local_b48.p[lVar53 + lVar54 + lVar19];
                  dVar93 = local_b48.p[lVar39 + lVar54 + lVar19];
                  lVar19 = (iVar14 - local_b48.begin.z) * local_b48.kstride;
                  dVar79 = local_b48.p[lVar53 + lVar54 + lVar19];
                  lVar53 = (lVar67 - local_b48.begin.z) * local_b48.kstride * 8;
                  dVar80 = local_b48.p[lVar39 + lVar54 + lVar19];
                  lVar54 = ((long)pdVar66 - (long)local_b48.begin.y) * local_b48.jstride * 8;
                  dVar81 = *(double *)
                            ((long)local_b48.p + (long)dVar91 * 8 + lVar53 + lVar54 + lVar32 * -8);
                  lVar39 = (lVar20 - local_b48.begin.y) * local_b48.jstride * 8;
                  dVar82 = *(double *)
                            ((long)local_b48.p + (long)dVar91 * 8 + lVar53 + lVar39 + lVar32 * -8);
                  lVar53 = (lVar18 - local_b48.begin.z) * local_b48.kstride * 8;
                  dVar83 = *(double *)
                            ((long)local_b48.p + (long)dVar91 * 8 + lVar54 + lVar53 + lVar32 * -8);
                  dVar84 = *(double *)
                            ((long)local_b48.p + (long)dVar91 * 8 + lVar53 + lVar39 + lVar32 * -8);
                  facx = facx + (((dVar80 - dVar93) +
                                 (dVar84 - dVar82) + (dVar84 - dVar82) +
                                 (dVar83 - dVar81) * 4.0 + (dVar79 - dVar92) + (dVar79 - dVar92)) *
                                 dVar76 + ((dVar80 - dVar84) +
                                          (dVar79 - dVar83) + (dVar79 - dVar83) +
                                          (dVar92 - dVar81) * 4.0 +
                                          (dVar93 - dVar82) + (dVar93 - dVar82)) * dVar105 +
                                          ((dVar80 - dVar79) +
                                          (dVar84 - dVar83) + (dVar84 - dVar83) +
                                          (dVar82 - dVar81) * 4.0 +
                                          (dVar93 - dVar92) + (dVar93 - dVar92)) * dVar106) *
                                *pRVar21;
                }
                bVar13 = mlndlap_res_cf_contrib::anon_class_16_2_98e5bd77::operator()
                                   (&local_848,iVar48,iVar26,iVar14);
                iVar35 = (int)(double *)((long)pdVar66 + 1U);
                if (bVar13) {
                  pRVar21 = mlndlap_res_cf_contrib::anon_class_8_1_ba1d7831::operator()
                                      (&local_9e0,iVar48,iVar26,iVar14);
                  lVar32 = (long)local_b48.begin.x;
                  lVar54 = (long)(~local_b48.begin.x + iVar36);
                  lVar53 = (iVar26 - local_b48.begin.y) * local_b48.jstride;
                  lVar39 = (iVar35 - local_b48.begin.y) * local_b48.jstride;
                  lVar19 = (iVar23 - local_b48.begin.z) * local_b48.kstride;
                  dVar92 = local_b48.p[lVar53 + lVar54 + lVar19];
                  dVar93 = local_b48.p[lVar39 + lVar54 + lVar19];
                  lVar19 = (iVar14 - local_b48.begin.z) * local_b48.kstride;
                  dVar79 = local_b48.p[lVar53 + lVar54 + lVar19];
                  lVar53 = (lVar67 - local_b48.begin.z) * local_b48.kstride * 8;
                  dVar80 = local_b48.p[lVar39 + lVar54 + lVar19];
                  lVar54 = ((long)pdVar66 - (long)local_b48.begin.y) * local_b48.jstride * 8;
                  dVar81 = *(double *)
                            ((long)local_b48.p + (long)dVar91 * 8 + lVar53 + lVar54 + lVar32 * -8);
                  lVar39 = (long)((int)local_bf8 - local_b48.begin.y) * local_b48.jstride * 8;
                  dVar82 = *(double *)
                            ((long)local_b48.p + (long)dVar91 * 8 + lVar53 + lVar39 + lVar32 * -8);
                  lVar53 = (lVar18 - local_b48.begin.z) * local_b48.kstride * 8;
                  dVar83 = *(double *)
                            ((long)local_b48.p + (long)dVar91 * 8 + lVar54 + lVar53 + lVar32 * -8);
                  dVar84 = *(double *)
                            ((long)local_b48.p + (long)dVar91 * 8 + lVar53 + lVar39 + lVar32 * -8);
                  facx = facx + (((dVar80 - dVar93) +
                                 (dVar84 - dVar82) + (dVar84 - dVar82) +
                                 (dVar83 - dVar81) * 4.0 + (dVar79 - dVar92) + (dVar79 - dVar92)) *
                                 dVar76 + ((dVar80 - dVar84) +
                                          (dVar79 - dVar83) + (dVar79 - dVar83) +
                                          (dVar92 - dVar81) * 4.0 +
                                          (dVar93 - dVar82) + (dVar93 - dVar82)) * dVar105 +
                                          ((dVar80 - dVar79) +
                                          (dVar84 - dVar83) + (dVar84 - dVar83) +
                                          (dVar82 - dVar81) * 4.0 +
                                          (dVar93 - dVar92) + (dVar93 - dVar92)) * dVar106) *
                                *pRVar21;
                }
                bVar13 = mlndlap_res_cf_contrib::anon_class_16_2_98e5bd77::operator()
                                   (&local_848,iVar36,iVar26,iVar14);
                if (bVar13) {
                  pRVar21 = mlndlap_res_cf_contrib::anon_class_8_1_ba1d7831::operator()
                                      (&local_9e0,iVar36,iVar26,iVar14);
                  lVar32 = (long)local_b48.begin.x;
                  lVar54 = (long)((iVar36 - local_b48.begin.x) + 1);
                  lVar53 = (iVar26 - local_b48.begin.y) * local_b48.jstride;
                  lVar39 = (iVar35 - local_b48.begin.y) * local_b48.jstride;
                  lVar19 = (iVar23 - local_b48.begin.z) * local_b48.kstride;
                  dVar92 = local_b48.p[lVar53 + lVar54 + lVar19];
                  dVar93 = local_b48.p[lVar39 + lVar54 + lVar19];
                  lVar19 = (iVar14 - local_b48.begin.z) * local_b48.kstride;
                  dVar79 = local_b48.p[lVar53 + lVar54 + lVar19];
                  lVar53 = (lVar67 - local_b48.begin.z) * local_b48.kstride * 8;
                  dVar80 = local_b48.p[lVar39 + lVar54 + lVar19];
                  lVar54 = ((long)pdVar66 - (long)local_b48.begin.y) * local_b48.jstride * 8;
                  dVar81 = *(double *)
                            ((long)local_b48.p + (long)dVar91 * 8 + lVar53 + lVar54 + lVar32 * -8);
                  lVar39 = (long)((int)local_bf8 - local_b48.begin.y) * local_b48.jstride * 8;
                  dVar82 = *(double *)
                            ((long)local_b48.p + (long)dVar91 * 8 + lVar53 + lVar39 + lVar32 * -8);
                  lVar53 = (lVar18 - local_b48.begin.z) * local_b48.kstride * 8;
                  dVar83 = *(double *)
                            ((long)local_b48.p + (long)dVar91 * 8 + lVar54 + lVar53 + lVar32 * -8);
                  dVar84 = *(double *)
                            ((long)local_b48.p + (long)dVar91 * 8 + lVar53 + lVar39 + lVar32 * -8);
                  facx = facx + (((dVar80 - dVar93) +
                                 (dVar84 - dVar82) + (dVar84 - dVar82) +
                                 (dVar83 - dVar81) * 4.0 + (dVar79 - dVar92) + (dVar79 - dVar92)) *
                                 dVar76 + ((dVar80 - dVar84) +
                                          (dVar79 - dVar83) + (dVar79 - dVar83) +
                                          (dVar92 - dVar81) * 4.0 +
                                          (dVar93 - dVar82) + (dVar93 - dVar82)) * dVar105 +
                                          ((dVar80 - dVar79) +
                                          (dVar84 - dVar83) + (dVar84 - dVar83) +
                                          (dVar82 - dVar81) * 4.0 +
                                          (dVar93 - dVar92) + (dVar93 - dVar92)) * dVar106) *
                                *pRVar21;
                }
                bVar13 = mlndlap_res_cf_contrib::anon_class_16_2_98e5bd77::operator()
                                   (&local_848,iVar48,iVar16,iVar23);
                iVar33 = (int)(lVar67 + 1);
                if (bVar13) {
                  pRVar21 = mlndlap_res_cf_contrib::anon_class_8_1_ba1d7831::operator()
                                      (&local_9e0,iVar48,iVar16,iVar23);
                  lVar32 = (long)local_b48.begin.x;
                  lVar54 = (long)(~local_b48.begin.x + iVar36);
                  lVar53 = (iVar26 - local_b48.begin.y) * local_b48.jstride;
                  lVar39 = (iVar16 - local_b48.begin.y) * local_b48.jstride;
                  lVar19 = (iVar23 - local_b48.begin.z) * local_b48.kstride;
                  dVar92 = local_b48.p[lVar53 + lVar54 + lVar19];
                  dVar93 = local_b48.p[lVar39 + lVar54 + lVar19];
                  lVar19 = (iVar33 - local_b48.begin.z) * local_b48.kstride;
                  dVar79 = local_b48.p[lVar53 + lVar54 + lVar19];
                  lVar53 = (lVar67 - local_b48.begin.z) * local_b48.kstride * 8;
                  dVar80 = local_b48.p[lVar39 + lVar54 + lVar19];
                  lVar54 = ((long)pdVar66 - (long)local_b48.begin.y) * local_b48.jstride * 8;
                  dVar81 = *(double *)
                            ((long)local_b48.p + (long)dVar91 * 8 + lVar53 + lVar54 + lVar32 * -8);
                  lVar39 = (lVar20 - local_b48.begin.y) * local_b48.jstride * 8;
                  dVar82 = *(double *)
                            ((long)local_b48.p + (long)dVar91 * 8 + lVar53 + lVar39 + lVar32 * -8);
                  lVar53 = (long)(iVar24 - local_b48.begin.z) * local_b48.kstride * 8;
                  dVar83 = *(double *)
                            ((long)local_b48.p + (long)dVar91 * 8 + lVar54 + lVar53 + lVar32 * -8);
                  dVar84 = *(double *)
                            ((long)local_b48.p + (long)dVar91 * 8 + lVar53 + lVar39 + lVar32 * -8);
                  facx = facx + (((dVar80 - dVar93) +
                                 (dVar84 - dVar82) + (dVar84 - dVar82) +
                                 (dVar83 - dVar81) * 4.0 + (dVar79 - dVar92) + (dVar79 - dVar92)) *
                                 dVar76 + ((dVar80 - dVar84) +
                                          (dVar79 - dVar83) + (dVar79 - dVar83) +
                                          (dVar92 - dVar81) * 4.0 +
                                          (dVar93 - dVar82) + (dVar93 - dVar82)) * dVar105 +
                                          ((dVar80 - dVar79) +
                                          (dVar84 - dVar83) + (dVar84 - dVar83) +
                                          (dVar82 - dVar81) * 4.0 +
                                          (dVar93 - dVar92) + (dVar93 - dVar92)) * dVar106) *
                                *pRVar21;
                }
                bVar13 = mlndlap_res_cf_contrib::anon_class_16_2_98e5bd77::operator()
                                   (&local_848,iVar36,iVar16,iVar23);
                if (bVar13) {
                  pRVar21 = mlndlap_res_cf_contrib::anon_class_8_1_ba1d7831::operator()
                                      (&local_9e0,iVar36,iVar16,iVar23);
                  lVar32 = (long)local_b48.begin.x;
                  lVar54 = (long)((iVar36 - local_b48.begin.x) + 1);
                  lVar53 = (iVar26 - local_b48.begin.y) * local_b48.jstride;
                  lVar39 = (iVar16 - local_b48.begin.y) * local_b48.jstride;
                  lVar19 = (iVar23 - local_b48.begin.z) * local_b48.kstride;
                  dVar92 = local_b48.p[lVar53 + lVar54 + lVar19];
                  dVar93 = local_b48.p[lVar39 + lVar54 + lVar19];
                  lVar19 = (iVar33 - local_b48.begin.z) * local_b48.kstride;
                  dVar79 = local_b48.p[lVar53 + lVar54 + lVar19];
                  lVar53 = (lVar67 - local_b48.begin.z) * local_b48.kstride * 8;
                  dVar80 = local_b48.p[lVar39 + lVar54 + lVar19];
                  lVar54 = ((long)pdVar66 - (long)local_b48.begin.y) * local_b48.jstride * 8;
                  dVar81 = *(double *)
                            ((long)local_b48.p + (long)dVar91 * 8 + lVar53 + lVar54 + lVar32 * -8);
                  lVar39 = (lVar20 - local_b48.begin.y) * local_b48.jstride * 8;
                  dVar82 = *(double *)
                            ((long)local_b48.p + (long)dVar91 * 8 + lVar53 + lVar39 + lVar32 * -8);
                  lVar53 = (long)(iVar24 - local_b48.begin.z) * local_b48.kstride * 8;
                  dVar83 = *(double *)
                            ((long)local_b48.p + (long)dVar91 * 8 + lVar54 + lVar53 + lVar32 * -8);
                  dVar84 = *(double *)
                            ((long)local_b48.p + (long)dVar91 * 8 + lVar53 + lVar39 + lVar32 * -8);
                  facx = facx + (((dVar80 - dVar93) +
                                 (dVar84 - dVar82) + (dVar84 - dVar82) +
                                 (dVar83 - dVar81) * 4.0 + (dVar79 - dVar92) + (dVar79 - dVar92)) *
                                 dVar76 + ((dVar80 - dVar84) +
                                          (dVar79 - dVar83) + (dVar79 - dVar83) +
                                          (dVar92 - dVar81) * 4.0 +
                                          (dVar93 - dVar82) + (dVar93 - dVar82)) * dVar105 +
                                          ((dVar80 - dVar79) +
                                          (dVar84 - dVar83) + (dVar84 - dVar83) +
                                          (dVar82 - dVar81) * 4.0 +
                                          (dVar93 - dVar92) + (dVar93 - dVar92)) * dVar106) *
                                *pRVar21;
                }
                bVar13 = mlndlap_res_cf_contrib::anon_class_16_2_98e5bd77::operator()
                                   (&local_848,iVar48,iVar26,iVar23);
                if (bVar13) {
                  pRVar21 = mlndlap_res_cf_contrib::anon_class_8_1_ba1d7831::operator()
                                      (&local_9e0,iVar48,iVar26,iVar23);
                  lVar32 = (long)local_b48.begin.x;
                  lVar54 = (long)(~local_b48.begin.x + iVar36);
                  lVar53 = (iVar26 - local_b48.begin.y) * local_b48.jstride;
                  lVar39 = (iVar35 - local_b48.begin.y) * local_b48.jstride;
                  lVar19 = (iVar23 - local_b48.begin.z) * local_b48.kstride;
                  dVar92 = local_b48.p[lVar53 + lVar54 + lVar19];
                  dVar93 = local_b48.p[lVar39 + lVar54 + lVar19];
                  lVar19 = (iVar33 - local_b48.begin.z) * local_b48.kstride;
                  dVar79 = local_b48.p[lVar53 + lVar54 + lVar19];
                  lVar53 = (lVar67 - local_b48.begin.z) * local_b48.kstride * 8;
                  dVar80 = local_b48.p[lVar39 + lVar54 + lVar19];
                  lVar54 = ((long)pdVar66 - (long)local_b48.begin.y) * local_b48.jstride * 8;
                  dVar81 = *(double *)
                            ((long)local_b48.p + (long)dVar91 * 8 + lVar53 + lVar54 + lVar32 * -8);
                  lVar39 = (long)((int)local_bf8 - local_b48.begin.y) * local_b48.jstride * 8;
                  dVar82 = *(double *)
                            ((long)local_b48.p + (long)dVar91 * 8 + lVar53 + lVar39 + lVar32 * -8);
                  lVar53 = (long)(iVar24 - local_b48.begin.z) * local_b48.kstride * 8;
                  dVar83 = *(double *)
                            ((long)local_b48.p + (long)dVar91 * 8 + lVar54 + lVar53 + lVar32 * -8);
                  dVar84 = *(double *)
                            ((long)local_b48.p + (long)dVar91 * 8 + lVar53 + lVar39 + lVar32 * -8);
                  facx = facx + (((dVar80 - dVar93) +
                                 (dVar84 - dVar82) + (dVar84 - dVar82) +
                                 (dVar83 - dVar81) * 4.0 + (dVar79 - dVar92) + (dVar79 - dVar92)) *
                                 dVar76 + ((dVar80 - dVar84) +
                                          (dVar79 - dVar83) + (dVar79 - dVar83) +
                                          (dVar92 - dVar81) * 4.0 +
                                          (dVar93 - dVar82) + (dVar93 - dVar82)) * dVar105 +
                                          ((dVar80 - dVar79) +
                                          (dVar84 - dVar83) + (dVar84 - dVar83) +
                                          (dVar82 - dVar81) * 4.0 +
                                          (dVar93 - dVar92) + (dVar93 - dVar92)) * dVar106) *
                                *pRVar21;
                }
                bVar13 = mlndlap_res_cf_contrib::anon_class_16_2_98e5bd77::operator()
                                   (&local_848,iVar36,iVar26,iVar23);
                if (bVar13) {
                  pRVar21 = mlndlap_res_cf_contrib::anon_class_8_1_ba1d7831::operator()
                                      (&local_9e0,iVar36,iVar26,iVar23);
                  lVar32 = (long)local_b48.begin.x;
                  lVar54 = (long)((iVar36 - local_b48.begin.x) + 1);
                  lVar53 = (iVar26 - local_b48.begin.y) * local_b48.jstride;
                  lVar39 = (iVar35 - local_b48.begin.y) * local_b48.jstride;
                  lVar19 = (iVar23 - local_b48.begin.z) * local_b48.kstride;
                  dVar92 = local_b48.p[lVar53 + lVar54 + lVar19];
                  dVar93 = local_b48.p[lVar39 + lVar54 + lVar19];
                  lVar19 = (iVar33 - local_b48.begin.z) * local_b48.kstride;
                  dVar79 = local_b48.p[lVar53 + lVar54 + lVar19];
                  lVar53 = (lVar67 - local_b48.begin.z) * local_b48.kstride * 8;
                  dVar80 = local_b48.p[lVar39 + lVar54 + lVar19];
                  lVar54 = ((long)pdVar66 - (long)local_b48.begin.y) * local_b48.jstride * 8;
                  dVar81 = *(double *)
                            ((long)local_b48.p + (long)dVar91 * 8 + lVar53 + lVar54 + lVar32 * -8);
                  lVar39 = (long)((int)local_bf8 - local_b48.begin.y) * local_b48.jstride * 8;
                  dVar82 = *(double *)
                            ((long)local_b48.p + (long)dVar91 * 8 + lVar53 + lVar39 + lVar32 * -8);
                  lVar53 = (long)(iVar24 - local_b48.begin.z) * local_b48.kstride * 8;
                  dVar83 = *(double *)
                            ((long)local_b48.p + (long)dVar91 * 8 + lVar54 + lVar53 + lVar32 * -8);
                  dVar84 = *(double *)
                            ((long)local_b48.p + (long)dVar91 * 8 + lVar53 + lVar39 + lVar32 * -8);
                  facx = facx + (((dVar80 - dVar93) +
                                 (dVar84 - dVar82) + (dVar84 - dVar82) +
                                 (dVar83 - dVar81) * 4.0 + (dVar79 - dVar92) + (dVar79 - dVar92)) *
                                 dVar76 + ((dVar80 - dVar84) +
                                          (dVar79 - dVar83) + (dVar79 - dVar83) +
                                          (dVar92 - dVar81) * 4.0 +
                                          (dVar93 - dVar82) + (dVar93 - dVar82)) * dVar105 +
                                          ((dVar80 - dVar79) +
                                          (dVar84 - dVar83) + (dVar84 - dVar83) +
                                          (dVar82 - dVar81) * 4.0 +
                                          (dVar93 - dVar92) + (dVar93 - dVar92)) * dVar106) *
                                *pRVar21;
                }
                dVar92 = 1.0;
                if ((local_a8c & 1) != 0) {
                  if ((local_af8._0_4_ != iVar36) ||
                     ((dVar92 = 2.0, iVar17 != 0x66 && (dVar92 = 2.0, iVar17 != 0x6a)))) {
                    dVar92 = 1.0;
                    if ((int)local_ae8 == iVar36) {
                      dVar92 = local_b90;
                    }
                  }
                  if (((iVar15 == iVar26) && ((iVar61 == 0x6a || (iVar61 == 0x66)))) ||
                     (((int)local_b98 == iVar26 &&
                      (((int)local_ba8 == 0x6a || ((int)local_ba8 == 0x66)))))) {
                    dVar92 = dVar92 + dVar92;
                  }
                  if (((iVar51 == iVar23) &&
                      ((local_ac8._0_4_ == 0x6a || (local_ac8._0_4_ == 0x66)))) ||
                     (((int)local_ba0 == iVar23 &&
                      (((int)local_b78 == 0x6a || ((int)local_b78 == 0x66)))))) {
                    dVar92 = dVar92 + dVar92;
                  }
                }
                local_968.p
                [((lVar67 - local_968.begin.z) * local_968.kstride +
                 ((long)pdVar66 - (long)local_968.begin.y) * local_968.jstride + (long)dVar91) -
                 (long)local_968.begin.x] =
                     (double)(*(double *)
                               (((long)pdVar66 - (long)local_be8.begin.y) *
                                CONCAT44(local_be8.jstride._4_4_,(int)local_be8.jstride) * 8 +
                                (lVar67 - local_be8.begin.z) *
                                CONCAT44(local_be8.kstride._4_4_,(int)local_be8.kstride) * 8 +
                                (long)local_be8.begin.x * -8 +
                                CONCAT44(local_be8.p._4_4_,(int)local_be8.p) + (long)dVar91 * 8) -
                             (facx + *(double *)
                                      (((long)pdVar66 - (long)local_984) *
                                       CONCAT44(result.bigend.vect[0],result.smallend.vect[2]) * 8 +
                                       (lVar67 - local_980) *
                                       CONCAT44(result.bigend.vect[2],result.bigend.vect[1]) * 8 +
                                       (long)local_988 * -8 + result.smallend.vect._0_8_ +
                                      (long)dVar91 * 8)) * dVar92);
              }
              dVar91 = (double)((long)dVar91 + 1);
            }
            iVar16 = local_ad8._0_4_ + 1;
            local_bf8 = (ulong)((int)local_bf8 + 1);
            pdVar66 = (double *)((long)pdVar66 + 1U);
          }
          iVar16 = (int)local_b50 + 1;
          lVar67 = lVar67 + 1;
        }
      }
    }
    MFIter::operator++(&mfi_2);
  }
  MFIter::~MFIter(&mfi_2);
  EB_set_covered(res,0.0);
  MultiFab::~MultiFab(&fine_contrib_on_crse);
  MultiFab::~MultiFab(&fine_contrib);
  if (local_8e8 != (_func_int **)0x0) {
    (**(code **)(*local_8e8 + 8))();
  }
  MultiFab::~MultiFab(&fine_res_for_coarse);
  return;
}

Assistant:

void
MLNodeLaplacian::reflux (int crse_amrlev,
                         MultiFab& res, const MultiFab& crse_sol, const MultiFab& crse_rhs,
                         MultiFab& a_fine_res, MultiFab& fine_sol, const MultiFab& fine_rhs) const
{
#if (AMREX_SPACEDIM == 1)
    amrex::ignore_unused(crse_amrlev,res,crse_sol,crse_rhs,a_fine_res,fine_sol,fine_rhs);
#else
    //
    //  Note that the residue we copmute on a coarse/fine node is not a
    //  composite divergence.  It has been restricted so that it is suitable
    //  as RHS for our geometric mulitgrid solver with a MG hirerachy
    //  including multiple AMR levels.
    //

    BL_PROFILE("MLNodeLaplacian::reflux()");

    const int amrrr = AMRRefRatio(crse_amrlev);
    AMREX_ALWAYS_ASSERT(amrrr == 2 || m_coarsening_strategy == CoarseningStrategy::Sigma);

    const Geometry& cgeom = m_geom[crse_amrlev  ][0];
    const Geometry& fgeom = m_geom[crse_amrlev+1][0];
    const auto cdxinv = cgeom.InvCellSizeArray();
    const auto fdxinv = fgeom.InvCellSizeArray();
    const Box& c_cc_domain = cgeom.Domain();
    const Box& c_cc_domain_p = cgeom.growPeriodicDomain(1);
    const Box& c_nd_domain = amrex::surroundingNodes(c_cc_domain);
    const Box& f_nd_domain = amrex::surroundingNodes(fgeom.Domain());

    const auto lobc = LoBC();
    const auto hibc = HiBC();

    bool neumann_doubling = false;
    if (m_coarsening_strategy == CoarseningStrategy::Sigma) {
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
            neumann_doubling = neumann_doubling || (lobc[idim] == LinOpBCType::inflow  ||
                                                    lobc[idim] == LinOpBCType::Neumann ||
                                                    hibc[idim] == LinOpBCType::inflow  ||
                                                    hibc[idim] == LinOpBCType::Neumann);
        }
    }

#if (AMREX_SPACEDIM == 2)
    bool is_rz = m_is_rz;
#endif

    const BoxArray& fba = fine_sol.boxArray();
    const DistributionMapping& fdm = fine_sol.DistributionMap();

    const iMultiFab& fdmsk = *m_dirichlet_mask[crse_amrlev+1][0];
    const auto& stencil    =  m_nosigma_stencil[crse_amrlev+1];

    MultiFab fine_res_for_coarse(amrex::coarsen(fba, amrrr), fdm, 1, 0);

    std::unique_ptr<MultiFab> tmp_fine_res;
    if (amrrr == 4 && !a_fine_res.nGrowVect().allGE(IntVect(3))) {
        tmp_fine_res = std::make_unique<MultiFab>(a_fine_res.boxArray(),
                                                  a_fine_res.DistributionMap(), 1, 3);
        MultiFab::Copy(*tmp_fine_res, a_fine_res, 0, 0, 1, 0);
    }
    MultiFab& fine_res = (tmp_fine_res) ? *tmp_fine_res :  a_fine_res;

    fine_res.FillBoundary(fgeom.periodicity());

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(fine_res_for_coarse, TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();
        Array4<Real> const& cfab = fine_res_for_coarse.array(mfi);
        Array4<Real const> const& ffab = fine_res.const_array(mfi);
        Array4<int const> const& mfab = fdmsk.const_array(mfi);
        if (m_coarsening_strategy == CoarseningStrategy::Sigma) {
            if (amrrr == 2) {
                AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bx, i, j, k,
                {
                    mlndlap_restriction<2>(i,j,k,cfab,ffab,mfab,f_nd_domain,lobc,hibc);
                });
            } else {
                AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bx, i, j, k,
                {
                    mlndlap_restriction<4>(i,j,k,cfab,ffab,mfab,f_nd_domain,lobc,hibc);
                });
            }
        } else {
            Array4<Real const> const& stfab = stencil->const_array(mfi);
            AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bx, i, j, k,
            {
                mlndlap_restriction_rap(i,j,k,cfab,ffab,stfab,mfab);
            });
        }
    }
    res.ParallelCopy(fine_res_for_coarse, cgeom.periodicity());

    MultiFab fine_contrib(amrex::coarsen(fba, amrrr), fdm, 1, 0);

    const auto& fsigma = m_sigma[crse_amrlev+1][0][0];

    MFItInfo mfi_info;
    if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(fine_contrib,mfi_info); mfi.isValid(); ++mfi)
    {
        const Box& cbx = mfi.tilebox();
        const Box& fvbx = amrex::refine(mfi.validbox(),amrrr);
        const Box& cc_fvbx = amrex::enclosedCells(fvbx);

        Array4<Real> const& farr = fine_contrib.array(mfi);
        Array4<Real const> const& resarr = fine_res.const_array(mfi);
        Array4<Real const> const& rhsarr = fine_rhs.const_array(mfi);
        Array4<Real const> const& solarr = fine_sol.const_array(mfi);
        Array4<int const> const& marr = fdmsk.const_array(mfi);

        if (fsigma) {
            Array4<Real const> const& sigarr = fsigma->const_array(mfi);
#if (AMREX_SPACEDIM == 2)
            if (amrrr == 2) {
                AMREX_HOST_DEVICE_FOR_3D(cbx, i, j, k,
                {
                    mlndlap_Ax_fine_contrib<2>(i,j,k,fvbx,cc_fvbx,farr,resarr,rhsarr,solarr,
                                               sigarr,marr,is_rz,fdxinv);
                });
            } else {
                AMREX_HOST_DEVICE_FOR_3D(cbx, i, j, k,
                {
                    mlndlap_Ax_fine_contrib<4>(i,j,k,fvbx,cc_fvbx,farr,resarr,rhsarr,solarr,
                                               sigarr,marr,is_rz,fdxinv);
                });
            }
#elif (AMREX_SPACEDIM == 3)
            if (amrrr == 2) {
                AMREX_HOST_DEVICE_FOR_3D(cbx, i, j, k,
                {
                    mlndlap_Ax_fine_contrib<2>(i,j,k,fvbx,cc_fvbx,farr,resarr,rhsarr,solarr,
                                               sigarr,marr,fdxinv);
                });
            } else {
                AMREX_HOST_DEVICE_FOR_3D(cbx, i, j, k,
                {
                    mlndlap_Ax_fine_contrib<4>(i,j,k,fvbx,cc_fvbx,farr,resarr,rhsarr,solarr,
                                               sigarr,marr,fdxinv);
                });
            }
#endif
        } else {
            Real const_sigma = m_const_sigma;
#if (AMREX_SPACEDIM == 1)
            amrex::ignore_unused(const_sigma);
#elif (AMREX_SPACEDIM == 2)
            if (amrrr == 2) {
                AMREX_HOST_DEVICE_FOR_3D(cbx, i, j, k,
                {
                    mlndlap_Ax_fine_contrib_cs<2>(i,j,k,fvbx,cc_fvbx,farr,resarr,rhsarr,solarr,
                                                  const_sigma,marr,is_rz,fdxinv);
                });
            } else {
                AMREX_HOST_DEVICE_FOR_3D(cbx, i, j, k,
                {
                    mlndlap_Ax_fine_contrib_cs<4>(i,j,k,fvbx,cc_fvbx,farr,resarr,rhsarr,solarr,
                                                  const_sigma,marr,is_rz,fdxinv);
                });
            }
#elif (AMREX_SPACEDIM == 3)
            if (amrrr == 2) {
                AMREX_HOST_DEVICE_FOR_3D(cbx, i, j, k,
                {
                    mlndlap_Ax_fine_contrib_cs<2>(i,j,k,fvbx,cc_fvbx,farr,resarr,rhsarr,solarr,
                                                  const_sigma,marr,fdxinv);
                });
            } else {
                AMREX_HOST_DEVICE_FOR_3D(cbx, i, j, k,
                {
                    mlndlap_Ax_fine_contrib_cs<4>(i,j,k,fvbx,cc_fvbx,farr,resarr,rhsarr,solarr,
                                                  const_sigma,marr,fdxinv);
                });
            }
#endif
        }
    }

    MultiFab fine_contrib_on_crse(crse_sol.boxArray(), crse_sol.DistributionMap(), 1, 0);
    fine_contrib_on_crse.setVal(0.0);
    fine_contrib_on_crse.ParallelAdd(fine_contrib, cgeom.periodicity());

    const iMultiFab& cdmsk = *m_dirichlet_mask[crse_amrlev][0];
    const auto& nd_mask     = m_nd_fine_mask[crse_amrlev];
    const auto& cc_mask     = m_cc_fine_mask[crse_amrlev];
    const auto& has_fine_bndry = m_has_fine_bndry[crse_amrlev];

    const auto& csigma = m_sigma[crse_amrlev][0][0];

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(res,mfi_info); mfi.isValid(); ++mfi)
    {
        if ((*has_fine_bndry)[mfi])
        {
            const Box& bx = mfi.tilebox();
            Array4<Real> const& resarr = res.array(mfi);
            Array4<Real const> const& csolarr = crse_sol.const_array(mfi);
            Array4<Real const> const& crhsarr = crse_rhs.const_array(mfi);
            Array4<int const> const& cdmskarr = cdmsk.const_array(mfi);
            Array4<int const> const& ndmskarr = nd_mask->const_array(mfi);
            Array4<int const> const& ccmskarr = cc_mask->const_array(mfi);
            Array4<Real const> const& fcocarr = fine_contrib_on_crse.const_array(mfi);

            if (csigma) {
                Array4<Real const> const& csigarr = csigma->const_array(mfi);
#if (AMREX_SPACEDIM == 2)
                AMREX_HOST_DEVICE_FOR_3D(bx, i, j, k,
                {
                    mlndlap_res_cf_contrib(i,j,k,resarr,csolarr,crhsarr,csigarr,
                                           cdmskarr,ndmskarr,ccmskarr,fcocarr,
                                           cdxinv,c_cc_domain_p,c_nd_domain,
                                           is_rz,
                                           lobc,hibc, neumann_doubling);
                });
#elif (AMREX_SPACEDIM == 3)
                AMREX_HOST_DEVICE_FOR_3D(bx, i, j, k,
                {
                    mlndlap_res_cf_contrib(i,j,k,resarr,csolarr,crhsarr,csigarr,
                                           cdmskarr,ndmskarr,ccmskarr,fcocarr,
                                           cdxinv,c_cc_domain_p,c_nd_domain,
                                           lobc,hibc, neumann_doubling);
                });
#endif
            } else {
                Real const_sigma = m_const_sigma;
#if (AMREX_SPACEDIM == 1)
                amrex::ignore_unused(const_sigma);
#elif (AMREX_SPACEDIM == 2)
                AMREX_HOST_DEVICE_FOR_3D(bx, i, j, k,
                {
                    mlndlap_res_cf_contrib_cs(i,j,k,resarr,csolarr,crhsarr,const_sigma,
                                              cdmskarr,ndmskarr,ccmskarr,fcocarr,
                                              cdxinv,c_cc_domain_p,c_nd_domain,
                                              is_rz,
                                              lobc,hibc, neumann_doubling);
                });
#elif (AMREX_SPACEDIM == 3)
                AMREX_HOST_DEVICE_FOR_3D(bx, i, j, k,
                {
                    mlndlap_res_cf_contrib_cs(i,j,k,resarr,csolarr,crhsarr,const_sigma,
                                              cdmskarr,ndmskarr,ccmskarr,fcocarr,
                                              cdxinv,c_cc_domain_p,c_nd_domain,
                                              lobc,hibc, neumann_doubling);
                });
#endif
            }
        }
    }
#ifdef AMREX_USE_EB
    // Make sure to zero out the residual on any nodes completely surrounded by covered cells
    amrex::EB_set_covered(res,0.0);
#endif
#endif
}